

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Primitive PVar23;
  Geometry *pGVar24;
  __int_type_conflict _Var25;
  long lVar26;
  long lVar27;
  RTCFilterFunctionN p_Var28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  uint uVar93;
  ulong uVar94;
  undefined1 (*pauVar95) [32];
  uint uVar96;
  ulong uVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  uint uVar101;
  uint uVar102;
  float fVar103;
  float fVar133;
  float fVar135;
  __m128 a;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar104;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar105;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar137;
  undefined1 auVar122 [32];
  float fVar134;
  float fVar136;
  float fVar138;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar108 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar116 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar142;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar174;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar173;
  float fVar175;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  float fVar195;
  undefined1 auVar184 [32];
  undefined1 auVar176 [16];
  undefined1 auVar185 [32];
  undefined1 auVar177 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar179 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar196;
  float fVar224;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [28];
  float fVar222;
  float fVar223;
  float fVar225;
  float fVar226;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar227;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar228;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [28];
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar251;
  float fVar268;
  float fVar270;
  undefined1 auVar252 [16];
  float fVar272;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar274;
  float fVar276;
  float fVar278;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar269;
  float fVar271;
  float fVar273;
  float fVar275;
  float fVar277;
  float fVar279;
  undefined1 auVar261 [32];
  float fVar280;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar284 [16];
  float fVar302;
  undefined1 auVar288 [32];
  float fVar297;
  float fVar300;
  float fVar303;
  float fVar306;
  float fVar309;
  float fVar312;
  undefined1 auVar289 [32];
  float fVar298;
  float fVar301;
  float fVar304;
  float fVar307;
  float fVar310;
  float fVar313;
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar294 [32];
  float fVar296;
  float fVar299;
  float fVar305;
  float fVar308;
  float fVar311;
  undefined1 auVar287 [32];
  undefined1 auVar295 [64];
  float fVar314;
  float fVar315;
  undefined1 auVar316 [16];
  float fVar392;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  float fVar325;
  float fVar327;
  float fVar334;
  float fVar337;
  float fVar340;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar330;
  undefined1 auVar322 [32];
  float fVar326;
  float fVar328;
  float fVar331;
  float fVar332;
  float fVar335;
  float fVar338;
  float fVar341;
  float fVar343;
  undefined1 auVar323 [32];
  float fVar329;
  float fVar333;
  float fVar336;
  float fVar339;
  float fVar342;
  undefined1 auVar324 [32];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  float fVar354;
  undefined1 auVar352 [32];
  undefined1 auVar353 [64];
  undefined1 auVar355 [16];
  float fVar362;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar364 [16];
  float fVar363;
  float fVar375;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  float fVar376;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar385 [64];
  float fVar393;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float in_register_0000151c;
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  float fVar405;
  undefined1 auVar398 [64];
  float fVar406;
  undefined1 auVar407 [16];
  float fVar416;
  float fVar417;
  float fVar419;
  float fVar420;
  float fVar421;
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  float fVar422;
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  float fVar418;
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  float in_register_0000159c;
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [16];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  float in_register_000015dc;
  undefined1 auVar433 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  float local_bc0;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 (*local_950) [16];
  ulong local_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [8];
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  Primitive *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  RTCHitN local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  uint local_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  undefined1 auStack_620 [16];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar23 = prim[1];
  uVar94 = (ulong)(byte)PVar23;
  lVar98 = uVar94 * 0x25;
  auVar316 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar316 = vinsertps_avx(auVar316,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar146 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar146 = vinsertps_avx(auVar146,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar316 = vsubps_avx(auVar316,*(undefined1 (*) [16])(prim + lVar98 + 6));
  fVar196 = *(float *)(prim + lVar98 + 0x12);
  auVar143._0_4_ = fVar196 * auVar316._0_4_;
  auVar143._4_4_ = fVar196 * auVar316._4_4_;
  auVar143._8_4_ = fVar196 * auVar316._8_4_;
  auVar143._12_4_ = fVar196 * auVar316._12_4_;
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 4 + 6)));
  auVar252._0_4_ = fVar196 * auVar146._0_4_;
  auVar252._4_4_ = fVar196 * auVar146._4_4_;
  auVar252._8_4_ = fVar196 * auVar146._8_4_;
  auVar252._12_4_ = fVar196 * auVar146._12_4_;
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 4 + 10)));
  auVar117._16_16_ = auVar146;
  auVar117._0_16_ = auVar316;
  auVar117 = vcvtdq2ps_avx(auVar117);
  lVar26 = uVar94 * 5;
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar26 + 6)));
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar26 + 10)));
  auVar183._16_16_ = auVar146;
  auVar183._0_16_ = auVar316;
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 6 + 6)));
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 6 + 10)));
  auVar171 = vcvtdq2ps_avx(auVar183);
  auVar214._16_16_ = auVar146;
  auVar214._0_16_ = auVar316;
  auVar383 = vcvtdq2ps_avx(auVar214);
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0xf + 6)));
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0xf + 10)));
  auVar215._16_16_ = auVar146;
  auVar215._0_16_ = auVar316;
  auVar29 = vcvtdq2ps_avx(auVar215);
  lVar99 = (ulong)(byte)PVar23 * 0x10;
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + 6)));
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + 10)));
  auVar287._16_16_ = auVar146;
  auVar287._0_16_ = auVar316;
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + uVar94 + 6)));
  auVar187 = vcvtdq2ps_avx(auVar287);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + uVar94 + 10)));
  auVar317._16_16_ = auVar146;
  auVar317._0_16_ = auVar316;
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1a + 6)));
  auVar30 = vcvtdq2ps_avx(auVar317);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1a + 10)));
  auVar318._16_16_ = auVar146;
  auVar318._0_16_ = auVar316;
  auVar415 = vcvtdq2ps_avx(auVar318);
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1b + 6)));
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1b + 10)));
  auVar356._16_16_ = auVar146;
  auVar356._0_16_ = auVar316;
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1c + 6)));
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1c + 10)));
  auVar31 = vcvtdq2ps_avx(auVar356);
  auVar365._16_16_ = auVar146;
  auVar365._0_16_ = auVar316;
  auVar32 = vcvtdq2ps_avx(auVar365);
  auVar316 = vshufps_avx(auVar252,auVar252,0);
  auVar146 = vshufps_avx(auVar252,auVar252,0x55);
  auVar41 = vshufps_avx(auVar252,auVar252,0xaa);
  fVar196 = auVar41._0_4_;
  fVar280 = auVar41._4_4_;
  fVar222 = auVar41._8_4_;
  fVar105 = auVar41._12_4_;
  fVar195 = auVar146._0_4_;
  fVar223 = auVar146._4_4_;
  fVar224 = auVar146._8_4_;
  fVar104 = auVar146._12_4_;
  fVar225 = auVar316._0_4_;
  fVar226 = auVar316._4_4_;
  fVar227 = auVar316._8_4_;
  fVar228 = auVar316._12_4_;
  auVar394._0_4_ = fVar225 * auVar117._0_4_ + fVar195 * auVar171._0_4_ + fVar196 * auVar383._0_4_;
  auVar394._4_4_ = fVar226 * auVar117._4_4_ + fVar223 * auVar171._4_4_ + fVar280 * auVar383._4_4_;
  auVar394._8_4_ = fVar227 * auVar117._8_4_ + fVar224 * auVar171._8_4_ + fVar222 * auVar383._8_4_;
  auVar394._12_4_ =
       fVar228 * auVar117._12_4_ + fVar104 * auVar171._12_4_ + fVar105 * auVar383._12_4_;
  auVar394._16_4_ =
       fVar225 * auVar117._16_4_ + fVar195 * auVar171._16_4_ + fVar196 * auVar383._16_4_;
  auVar394._20_4_ =
       fVar226 * auVar117._20_4_ + fVar223 * auVar171._20_4_ + fVar280 * auVar383._20_4_;
  auVar394._24_4_ =
       fVar227 * auVar117._24_4_ + fVar224 * auVar171._24_4_ + fVar222 * auVar383._24_4_;
  auVar394._28_4_ = fVar104 + in_register_000015dc + in_register_0000151c;
  auVar377._0_4_ = fVar225 * auVar29._0_4_ + fVar195 * auVar187._0_4_ + auVar30._0_4_ * fVar196;
  auVar377._4_4_ = fVar226 * auVar29._4_4_ + fVar223 * auVar187._4_4_ + auVar30._4_4_ * fVar280;
  auVar377._8_4_ = fVar227 * auVar29._8_4_ + fVar224 * auVar187._8_4_ + auVar30._8_4_ * fVar222;
  auVar377._12_4_ = fVar228 * auVar29._12_4_ + fVar104 * auVar187._12_4_ + auVar30._12_4_ * fVar105;
  auVar377._16_4_ = fVar225 * auVar29._16_4_ + fVar195 * auVar187._16_4_ + auVar30._16_4_ * fVar196;
  auVar377._20_4_ = fVar226 * auVar29._20_4_ + fVar223 * auVar187._20_4_ + auVar30._20_4_ * fVar280;
  auVar377._24_4_ = fVar227 * auVar29._24_4_ + fVar224 * auVar187._24_4_ + auVar30._24_4_ * fVar222;
  auVar377._28_4_ = fVar104 + in_register_000015dc + in_register_0000159c;
  auVar259._0_4_ = fVar225 * auVar415._0_4_ + fVar195 * auVar31._0_4_ + auVar32._0_4_ * fVar196;
  auVar259._4_4_ = fVar226 * auVar415._4_4_ + fVar223 * auVar31._4_4_ + auVar32._4_4_ * fVar280;
  auVar259._8_4_ = fVar227 * auVar415._8_4_ + fVar224 * auVar31._8_4_ + auVar32._8_4_ * fVar222;
  auVar259._12_4_ = fVar228 * auVar415._12_4_ + fVar104 * auVar31._12_4_ + auVar32._12_4_ * fVar105;
  auVar259._16_4_ = fVar225 * auVar415._16_4_ + fVar195 * auVar31._16_4_ + auVar32._16_4_ * fVar196;
  auVar259._20_4_ = fVar226 * auVar415._20_4_ + fVar223 * auVar31._20_4_ + auVar32._20_4_ * fVar280;
  auVar259._24_4_ = fVar227 * auVar415._24_4_ + fVar224 * auVar31._24_4_ + auVar32._24_4_ * fVar222;
  auVar259._28_4_ = fVar228 + fVar104 + fVar105;
  auVar316 = vshufps_avx(auVar143,auVar143,0);
  auVar146 = vshufps_avx(auVar143,auVar143,0x55);
  auVar41 = vshufps_avx(auVar143,auVar143,0xaa);
  fVar196 = auVar41._0_4_;
  fVar280 = auVar41._4_4_;
  fVar222 = auVar41._8_4_;
  fVar105 = auVar41._12_4_;
  fVar226 = auVar146._0_4_;
  fVar227 = auVar146._4_4_;
  fVar228 = auVar146._8_4_;
  fVar245 = auVar146._12_4_;
  fVar195 = auVar171._28_4_ + auVar383._28_4_;
  fVar223 = auVar316._0_4_;
  fVar224 = auVar316._4_4_;
  fVar104 = auVar316._8_4_;
  fVar225 = auVar316._12_4_;
  auVar160._0_4_ = fVar223 * auVar117._0_4_ + fVar226 * auVar171._0_4_ + fVar196 * auVar383._0_4_;
  auVar160._4_4_ = fVar224 * auVar117._4_4_ + fVar227 * auVar171._4_4_ + fVar280 * auVar383._4_4_;
  auVar160._8_4_ = fVar104 * auVar117._8_4_ + fVar228 * auVar171._8_4_ + fVar222 * auVar383._8_4_;
  auVar160._12_4_ =
       fVar225 * auVar117._12_4_ + fVar245 * auVar171._12_4_ + fVar105 * auVar383._12_4_;
  auVar160._16_4_ =
       fVar223 * auVar117._16_4_ + fVar226 * auVar171._16_4_ + fVar196 * auVar383._16_4_;
  auVar160._20_4_ =
       fVar224 * auVar117._20_4_ + fVar227 * auVar171._20_4_ + fVar280 * auVar383._20_4_;
  auVar160._24_4_ =
       fVar104 * auVar117._24_4_ + fVar228 * auVar171._24_4_ + fVar222 * auVar383._24_4_;
  auVar160._28_4_ = auVar117._28_4_ + fVar195;
  auVar118._0_4_ = fVar223 * auVar29._0_4_ + auVar30._0_4_ * fVar196 + fVar226 * auVar187._0_4_;
  auVar118._4_4_ = fVar224 * auVar29._4_4_ + auVar30._4_4_ * fVar280 + fVar227 * auVar187._4_4_;
  auVar118._8_4_ = fVar104 * auVar29._8_4_ + auVar30._8_4_ * fVar222 + fVar228 * auVar187._8_4_;
  auVar118._12_4_ = fVar225 * auVar29._12_4_ + auVar30._12_4_ * fVar105 + fVar245 * auVar187._12_4_;
  auVar118._16_4_ = fVar223 * auVar29._16_4_ + auVar30._16_4_ * fVar196 + fVar226 * auVar187._16_4_;
  auVar118._20_4_ = fVar224 * auVar29._20_4_ + auVar30._20_4_ * fVar280 + fVar227 * auVar187._20_4_;
  auVar118._24_4_ = fVar104 * auVar29._24_4_ + auVar30._24_4_ * fVar222 + fVar228 * auVar187._24_4_;
  auVar118._28_4_ = auVar117._28_4_ + auVar30._28_4_ + auVar383._28_4_;
  auVar319._8_4_ = 0x7fffffff;
  auVar319._0_8_ = 0x7fffffff7fffffff;
  auVar319._12_4_ = 0x7fffffff;
  auVar319._16_4_ = 0x7fffffff;
  auVar319._20_4_ = 0x7fffffff;
  auVar319._24_4_ = 0x7fffffff;
  auVar319._28_4_ = 0x7fffffff;
  auVar346._8_4_ = 0x219392ef;
  auVar346._0_8_ = 0x219392ef219392ef;
  auVar346._12_4_ = 0x219392ef;
  auVar346._16_4_ = 0x219392ef;
  auVar346._20_4_ = 0x219392ef;
  auVar346._24_4_ = 0x219392ef;
  auVar346._28_4_ = 0x219392ef;
  auVar117 = vandps_avx(auVar394,auVar319);
  auVar117 = vcmpps_avx(auVar117,auVar346,1);
  auVar171 = vblendvps_avx(auVar394,auVar346,auVar117);
  auVar117 = vandps_avx(auVar377,auVar319);
  auVar117 = vcmpps_avx(auVar117,auVar346,1);
  auVar383 = vblendvps_avx(auVar377,auVar346,auVar117);
  auVar117 = vandps_avx(auVar259,auVar319);
  auVar117 = vcmpps_avx(auVar117,auVar346,1);
  auVar117 = vblendvps_avx(auVar259,auVar346,auVar117);
  auVar184._0_4_ = fVar223 * auVar415._0_4_ + fVar226 * auVar31._0_4_ + auVar32._0_4_ * fVar196;
  auVar184._4_4_ = fVar224 * auVar415._4_4_ + fVar227 * auVar31._4_4_ + auVar32._4_4_ * fVar280;
  auVar184._8_4_ = fVar104 * auVar415._8_4_ + fVar228 * auVar31._8_4_ + auVar32._8_4_ * fVar222;
  auVar184._12_4_ = fVar225 * auVar415._12_4_ + fVar245 * auVar31._12_4_ + auVar32._12_4_ * fVar105;
  auVar184._16_4_ = fVar223 * auVar415._16_4_ + fVar226 * auVar31._16_4_ + auVar32._16_4_ * fVar196;
  auVar184._20_4_ = fVar224 * auVar415._20_4_ + fVar227 * auVar31._20_4_ + auVar32._20_4_ * fVar280;
  auVar184._24_4_ = fVar104 * auVar415._24_4_ + fVar228 * auVar31._24_4_ + auVar32._24_4_ * fVar222;
  auVar184._28_4_ = fVar195 + auVar187._28_4_ + fVar105;
  auVar29 = vrcpps_avx(auVar171);
  fVar196 = auVar29._0_4_;
  fVar222 = auVar29._4_4_;
  auVar187._4_4_ = auVar171._4_4_ * fVar222;
  auVar187._0_4_ = auVar171._0_4_ * fVar196;
  fVar195 = auVar29._8_4_;
  auVar187._8_4_ = auVar171._8_4_ * fVar195;
  fVar224 = auVar29._12_4_;
  auVar187._12_4_ = auVar171._12_4_ * fVar224;
  fVar225 = auVar29._16_4_;
  auVar187._16_4_ = auVar171._16_4_ * fVar225;
  fVar226 = auVar29._20_4_;
  auVar187._20_4_ = auVar171._20_4_ * fVar226;
  fVar227 = auVar29._24_4_;
  auVar187._24_4_ = auVar171._24_4_ * fVar227;
  auVar187._28_4_ = auVar171._28_4_;
  auVar347._8_4_ = 0x3f800000;
  auVar347._0_8_ = 0x3f8000003f800000;
  auVar347._12_4_ = 0x3f800000;
  auVar347._16_4_ = 0x3f800000;
  auVar347._20_4_ = 0x3f800000;
  auVar347._24_4_ = 0x3f800000;
  auVar347._28_4_ = 0x3f800000;
  auVar30 = vsubps_avx(auVar347,auVar187);
  auVar187 = vrcpps_avx(auVar383);
  fVar196 = fVar196 + fVar196 * auVar30._0_4_;
  fVar222 = fVar222 + fVar222 * auVar30._4_4_;
  fVar195 = fVar195 + fVar195 * auVar30._8_4_;
  fVar224 = fVar224 + fVar224 * auVar30._12_4_;
  fVar225 = fVar225 + fVar225 * auVar30._16_4_;
  fVar226 = fVar226 + fVar226 * auVar30._20_4_;
  fVar227 = fVar227 + fVar227 * auVar30._24_4_;
  fVar228 = auVar187._0_4_;
  fVar245 = auVar187._4_4_;
  auVar171._4_4_ = fVar245 * auVar383._4_4_;
  auVar171._0_4_ = fVar228 * auVar383._0_4_;
  fVar246 = auVar187._8_4_;
  auVar171._8_4_ = fVar246 * auVar383._8_4_;
  fVar247 = auVar187._12_4_;
  auVar171._12_4_ = fVar247 * auVar383._12_4_;
  fVar248 = auVar187._16_4_;
  auVar171._16_4_ = fVar248 * auVar383._16_4_;
  fVar249 = auVar187._20_4_;
  auVar171._20_4_ = fVar249 * auVar383._20_4_;
  fVar250 = auVar187._24_4_;
  auVar171._24_4_ = fVar250 * auVar383._24_4_;
  auVar171._28_4_ = auVar383._28_4_;
  auVar383 = vsubps_avx(auVar347,auVar171);
  fVar228 = fVar228 + fVar228 * auVar383._0_4_;
  fVar245 = fVar245 + fVar245 * auVar383._4_4_;
  fVar246 = fVar246 + fVar246 * auVar383._8_4_;
  fVar247 = fVar247 + fVar247 * auVar383._12_4_;
  fVar248 = fVar248 + fVar248 * auVar383._16_4_;
  fVar249 = fVar249 + fVar249 * auVar383._20_4_;
  fVar250 = fVar250 + fVar250 * auVar383._24_4_;
  auVar171 = vrcpps_avx(auVar117);
  fVar251 = auVar171._0_4_;
  fVar268 = auVar171._4_4_;
  auVar415._4_4_ = fVar268 * auVar117._4_4_;
  auVar415._0_4_ = fVar251 * auVar117._0_4_;
  fVar270 = auVar171._8_4_;
  auVar415._8_4_ = fVar270 * auVar117._8_4_;
  fVar272 = auVar171._12_4_;
  auVar415._12_4_ = fVar272 * auVar117._12_4_;
  fVar274 = auVar171._16_4_;
  auVar415._16_4_ = fVar274 * auVar117._16_4_;
  fVar276 = auVar171._20_4_;
  auVar415._20_4_ = fVar276 * auVar117._20_4_;
  fVar278 = auVar171._24_4_;
  auVar415._24_4_ = fVar278 * auVar117._24_4_;
  auVar415._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar347,auVar415);
  fVar251 = fVar251 + fVar251 * auVar117._0_4_;
  fVar268 = fVar268 + fVar268 * auVar117._4_4_;
  fVar270 = fVar270 + fVar270 * auVar117._8_4_;
  fVar272 = fVar272 + fVar272 * auVar117._12_4_;
  fVar274 = fVar274 + fVar274 * auVar117._16_4_;
  fVar276 = fVar276 + fVar276 * auVar117._20_4_;
  fVar278 = fVar278 + fVar278 * auVar117._24_4_;
  auVar316 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar98 + 0x16)) *
                           *(float *)(prim + lVar98 + 0x1a)));
  auVar42 = vshufps_avx(auVar316,auVar316,0);
  auVar316._8_8_ = 0;
  auVar316._0_8_ = *(ulong *)(prim + uVar94 * 7 + 6);
  auVar316 = vpmovsxwd_avx(auVar316);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar94 * 7 + 0xe);
  auVar146 = vpmovsxwd_avx(auVar146);
  auVar320._16_16_ = auVar146;
  auVar320._0_16_ = auVar316;
  auVar117 = vcvtdq2ps_avx(auVar320);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar94 * 0xb + 6);
  auVar316 = vpmovsxwd_avx(auVar41);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar94 * 0xb + 0xe);
  auVar146 = vpmovsxwd_avx(auVar10);
  auVar348._16_16_ = auVar146;
  auVar348._0_16_ = auVar316;
  auVar171 = vcvtdq2ps_avx(auVar348);
  auVar171 = vsubps_avx(auVar171,auVar117);
  fVar280 = auVar42._0_4_;
  fVar105 = auVar42._4_4_;
  fVar223 = auVar42._8_4_;
  fVar104 = auVar42._12_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar94 * 9 + 6);
  auVar316 = vpmovsxwd_avx(auVar42);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar94 * 9 + 0xe);
  auVar146 = vpmovsxwd_avx(auVar11);
  auVar321._0_4_ = auVar171._0_4_ * fVar280 + auVar117._0_4_;
  auVar321._4_4_ = auVar171._4_4_ * fVar105 + auVar117._4_4_;
  auVar321._8_4_ = auVar171._8_4_ * fVar223 + auVar117._8_4_;
  auVar321._12_4_ = auVar171._12_4_ * fVar104 + auVar117._12_4_;
  auVar321._16_4_ = auVar171._16_4_ * fVar280 + auVar117._16_4_;
  auVar321._20_4_ = auVar171._20_4_ * fVar105 + auVar117._20_4_;
  auVar321._24_4_ = auVar171._24_4_ * fVar223 + auVar117._24_4_;
  auVar321._28_4_ = auVar171._28_4_ + auVar117._28_4_;
  auVar349._16_16_ = auVar146;
  auVar349._0_16_ = auVar316;
  auVar117 = vcvtdq2ps_avx(auVar349);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar94 * 0xd + 6);
  auVar316 = vpmovsxwd_avx(auVar12);
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *(ulong *)(prim + uVar94 * 0xd + 0xe);
  auVar146 = vpmovsxwd_avx(auVar254);
  auVar357._16_16_ = auVar146;
  auVar357._0_16_ = auVar316;
  auVar171 = vcvtdq2ps_avx(auVar357);
  auVar171 = vsubps_avx(auVar171,auVar117);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar94 * 0x12 + 6);
  auVar316 = vpmovsxwd_avx(auVar147);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar94 * 0x12 + 0xe);
  auVar146 = vpmovsxwd_avx(auVar205);
  auVar350._0_4_ = auVar117._0_4_ + auVar171._0_4_ * fVar280;
  auVar350._4_4_ = auVar117._4_4_ + auVar171._4_4_ * fVar105;
  auVar350._8_4_ = auVar117._8_4_ + auVar171._8_4_ * fVar223;
  auVar350._12_4_ = auVar117._12_4_ + auVar171._12_4_ * fVar104;
  auVar350._16_4_ = auVar117._16_4_ + auVar171._16_4_ * fVar280;
  auVar350._20_4_ = auVar117._20_4_ + auVar171._20_4_ * fVar105;
  auVar350._24_4_ = auVar117._24_4_ + auVar171._24_4_ * fVar223;
  auVar350._28_4_ = auVar117._28_4_ + auVar171._28_4_;
  auVar358._16_16_ = auVar146;
  auVar358._0_16_ = auVar316;
  auVar117 = vcvtdq2ps_avx(auVar358);
  uVar97 = (ulong)(uint)((int)lVar26 << 2);
  lVar98 = uVar94 * 2 + uVar97;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar316 = vpmovsxwd_avx(auVar113);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar146 = vpmovsxwd_avx(auVar180);
  auVar366._16_16_ = auVar146;
  auVar366._0_16_ = auVar316;
  auVar171 = vcvtdq2ps_avx(auVar366);
  auVar171 = vsubps_avx(auVar171,auVar117);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + uVar97 + 6);
  auVar316 = vpmovsxwd_avx(auVar208);
  auVar359._0_4_ = auVar117._0_4_ + auVar171._0_4_ * fVar280;
  auVar359._4_4_ = auVar117._4_4_ + auVar171._4_4_ * fVar105;
  auVar359._8_4_ = auVar117._8_4_ + auVar171._8_4_ * fVar223;
  auVar359._12_4_ = auVar117._12_4_ + auVar171._12_4_ * fVar104;
  auVar359._16_4_ = auVar117._16_4_ + auVar171._16_4_ * fVar280;
  auVar359._20_4_ = auVar117._20_4_ + auVar171._20_4_ * fVar105;
  auVar359._24_4_ = auVar117._24_4_ + auVar171._24_4_ * fVar223;
  auVar359._28_4_ = auVar117._28_4_ + auVar171._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar97 + 0xe);
  auVar146 = vpmovsxwd_avx(auVar13);
  auVar367._16_16_ = auVar146;
  auVar367._0_16_ = auVar316;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar94 * 0x18 + 6);
  auVar316 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar94 * 0x18 + 0xe);
  auVar146 = vpmovsxwd_avx(auVar15);
  auVar117 = vcvtdq2ps_avx(auVar367);
  auVar378._16_16_ = auVar146;
  auVar378._0_16_ = auVar316;
  auVar171 = vcvtdq2ps_avx(auVar378);
  auVar171 = vsubps_avx(auVar171,auVar117);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar94 * 0x1d + 6);
  auVar316 = vpmovsxwd_avx(auVar115);
  auVar368._0_4_ = auVar117._0_4_ + auVar171._0_4_ * fVar280;
  auVar368._4_4_ = auVar117._4_4_ + auVar171._4_4_ * fVar105;
  auVar368._8_4_ = auVar117._8_4_ + auVar171._8_4_ * fVar223;
  auVar368._12_4_ = auVar117._12_4_ + auVar171._12_4_ * fVar104;
  auVar368._16_4_ = auVar117._16_4_ + auVar171._16_4_ * fVar280;
  auVar368._20_4_ = auVar117._20_4_ + auVar171._20_4_ * fVar105;
  auVar368._24_4_ = auVar117._24_4_ + auVar171._24_4_ * fVar223;
  auVar368._28_4_ = auVar117._28_4_ + auVar171._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar94 * 0x1d + 0xe);
  auVar146 = vpmovsxwd_avx(auVar16);
  lVar98 = uVar94 + (ulong)(byte)PVar23 * 0x20;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar41 = vpmovsxwd_avx(auVar17);
  auVar379._16_16_ = auVar146;
  auVar379._0_16_ = auVar316;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar316 = vpmovsxwd_avx(auVar18);
  auVar395._16_16_ = auVar316;
  auVar395._0_16_ = auVar41;
  auVar117 = vcvtdq2ps_avx(auVar379);
  auVar171 = vcvtdq2ps_avx(auVar395);
  auVar171 = vsubps_avx(auVar171,auVar117);
  auVar380._0_4_ = auVar117._0_4_ + auVar171._0_4_ * fVar280;
  auVar380._4_4_ = auVar117._4_4_ + auVar171._4_4_ * fVar105;
  auVar380._8_4_ = auVar117._8_4_ + auVar171._8_4_ * fVar223;
  auVar380._12_4_ = auVar117._12_4_ + auVar171._12_4_ * fVar104;
  auVar380._16_4_ = auVar117._16_4_ + auVar171._16_4_ * fVar280;
  auVar380._20_4_ = auVar117._20_4_ + auVar171._20_4_ * fVar105;
  auVar380._24_4_ = auVar117._24_4_ + auVar171._24_4_ * fVar223;
  auVar380._28_4_ = auVar117._28_4_ + auVar171._28_4_;
  lVar98 = (ulong)(byte)PVar23 * 0x20 - uVar94;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar98 + 6);
  auVar316 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar98 + 0xe);
  auVar146 = vpmovsxwd_avx(auVar20);
  auVar396._16_16_ = auVar146;
  auVar396._0_16_ = auVar316;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar94 * 0x23 + 6);
  auVar316 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar94 * 0x23 + 0xe);
  auVar146 = vpmovsxwd_avx(auVar22);
  auVar408._16_16_ = auVar146;
  auVar408._0_16_ = auVar316;
  auVar117 = vcvtdq2ps_avx(auVar396);
  auVar171 = vcvtdq2ps_avx(auVar408);
  auVar171 = vsubps_avx(auVar171,auVar117);
  auVar397._0_4_ = auVar117._0_4_ + auVar171._0_4_ * fVar280;
  auVar397._4_4_ = auVar117._4_4_ + auVar171._4_4_ * fVar105;
  auVar397._8_4_ = auVar117._8_4_ + auVar171._8_4_ * fVar223;
  auVar397._12_4_ = auVar117._12_4_ + auVar171._12_4_ * fVar104;
  auVar397._16_4_ = auVar117._16_4_ + auVar171._16_4_ * fVar280;
  auVar397._20_4_ = auVar117._20_4_ + auVar171._20_4_ * fVar105;
  auVar397._24_4_ = auVar117._24_4_ + auVar171._24_4_ * fVar223;
  auVar397._28_4_ = auVar117._28_4_ + fVar104;
  auVar117 = vsubps_avx(auVar321,auVar160);
  auVar284._0_4_ = fVar196 * auVar117._0_4_;
  auVar284._4_4_ = fVar222 * auVar117._4_4_;
  auVar284._8_4_ = fVar195 * auVar117._8_4_;
  auVar284._12_4_ = fVar224 * auVar117._12_4_;
  auVar31._16_4_ = fVar225 * auVar117._16_4_;
  auVar31._0_16_ = auVar284;
  auVar31._20_4_ = fVar226 * auVar117._20_4_;
  auVar31._24_4_ = fVar227 * auVar117._24_4_;
  auVar31._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar350,auVar160);
  auVar197._0_4_ = fVar196 * auVar117._0_4_;
  auVar197._4_4_ = fVar222 * auVar117._4_4_;
  auVar197._8_4_ = fVar195 * auVar117._8_4_;
  auVar197._12_4_ = fVar224 * auVar117._12_4_;
  auVar32._16_4_ = fVar225 * auVar117._16_4_;
  auVar32._0_16_ = auVar197;
  auVar32._20_4_ = fVar226 * auVar117._20_4_;
  auVar32._24_4_ = fVar227 * auVar117._24_4_;
  auVar32._28_4_ = auVar29._28_4_ + auVar30._28_4_;
  auVar117 = vsubps_avx(auVar359,auVar118);
  auVar144._0_4_ = fVar228 * auVar117._0_4_;
  auVar144._4_4_ = fVar245 * auVar117._4_4_;
  auVar144._8_4_ = fVar246 * auVar117._8_4_;
  auVar144._12_4_ = fVar247 * auVar117._12_4_;
  auVar29._16_4_ = fVar248 * auVar117._16_4_;
  auVar29._0_16_ = auVar144;
  auVar29._20_4_ = fVar249 * auVar117._20_4_;
  auVar29._24_4_ = fVar250 * auVar117._24_4_;
  auVar29._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar368,auVar118);
  auVar229._0_4_ = fVar228 * auVar117._0_4_;
  auVar229._4_4_ = fVar245 * auVar117._4_4_;
  auVar229._8_4_ = fVar246 * auVar117._8_4_;
  auVar229._12_4_ = fVar247 * auVar117._12_4_;
  auVar30._16_4_ = fVar248 * auVar117._16_4_;
  auVar30._0_16_ = auVar229;
  auVar30._20_4_ = fVar249 * auVar117._20_4_;
  auVar30._24_4_ = fVar250 * auVar117._24_4_;
  auVar30._28_4_ = auVar187._28_4_ + auVar383._28_4_;
  auVar117 = vsubps_avx(auVar380,auVar184);
  auVar106._0_4_ = fVar251 * auVar117._0_4_;
  auVar106._4_4_ = fVar268 * auVar117._4_4_;
  auVar106._8_4_ = fVar270 * auVar117._8_4_;
  auVar106._12_4_ = fVar272 * auVar117._12_4_;
  auVar383._16_4_ = fVar274 * auVar117._16_4_;
  auVar383._0_16_ = auVar106;
  auVar383._20_4_ = fVar276 * auVar117._20_4_;
  auVar383._24_4_ = fVar278 * auVar117._24_4_;
  auVar383._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar397,auVar184);
  auVar176._0_4_ = fVar251 * auVar117._0_4_;
  auVar176._4_4_ = fVar268 * auVar117._4_4_;
  auVar176._8_4_ = fVar270 * auVar117._8_4_;
  auVar176._12_4_ = fVar272 * auVar117._12_4_;
  auVar384._16_4_ = fVar274 * auVar117._16_4_;
  auVar384._0_16_ = auVar176;
  auVar384._20_4_ = fVar276 * auVar117._20_4_;
  auVar384._24_4_ = fVar278 * auVar117._24_4_;
  auVar384._28_4_ = auVar117._28_4_;
  auVar316 = vpminsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar146 = vpminsd_avx(auVar284,auVar197);
  auVar351._16_16_ = auVar316;
  auVar351._0_16_ = auVar146;
  auVar316 = vpminsd_avx(auVar29._16_16_,auVar30._16_16_);
  auVar146 = vpminsd_avx(auVar144,auVar229);
  auVar381._16_16_ = auVar316;
  auVar381._0_16_ = auVar146;
  auVar117 = vmaxps_avx(auVar351,auVar381);
  auVar316 = vpminsd_avx(auVar383._16_16_,auVar384._16_16_);
  auVar146 = vpminsd_avx(auVar106,auVar176);
  auVar409._16_16_ = auVar316;
  auVar409._0_16_ = auVar146;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar423._4_4_ = uVar8;
  auVar423._0_4_ = uVar8;
  auVar423._8_4_ = uVar8;
  auVar423._12_4_ = uVar8;
  auVar423._16_4_ = uVar8;
  auVar423._20_4_ = uVar8;
  auVar423._24_4_ = uVar8;
  auVar423._28_4_ = uVar8;
  auVar171 = vmaxps_avx(auVar409,auVar423);
  auVar117 = vmaxps_avx(auVar117,auVar171);
  local_340._4_4_ = auVar117._4_4_ * 0.99999964;
  local_340._0_4_ = auVar117._0_4_ * 0.99999964;
  local_340._8_4_ = auVar117._8_4_ * 0.99999964;
  local_340._12_4_ = auVar117._12_4_ * 0.99999964;
  local_340._16_4_ = auVar117._16_4_ * 0.99999964;
  local_340._20_4_ = auVar117._20_4_ * 0.99999964;
  local_340._24_4_ = auVar117._24_4_ * 0.99999964;
  local_340._28_4_ = auVar117._28_4_;
  auVar316 = vpmaxsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar146 = vpmaxsd_avx(auVar284,auVar197);
  auVar216._16_16_ = auVar316;
  auVar216._0_16_ = auVar146;
  auVar316 = vpmaxsd_avx(auVar29._16_16_,auVar30._16_16_);
  auVar146 = vpmaxsd_avx(auVar144,auVar229);
  auVar161._16_16_ = auVar316;
  auVar161._0_16_ = auVar146;
  auVar117 = vminps_avx(auVar216,auVar161);
  auVar316 = vpmaxsd_avx(auVar383._16_16_,auVar384._16_16_);
  auVar146 = vpmaxsd_avx(auVar106,auVar176);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar185._4_4_ = uVar8;
  auVar185._0_4_ = uVar8;
  auVar185._8_4_ = uVar8;
  auVar185._12_4_ = uVar8;
  auVar185._16_4_ = uVar8;
  auVar185._20_4_ = uVar8;
  auVar185._24_4_ = uVar8;
  auVar185._28_4_ = uVar8;
  auVar119._16_16_ = auVar316;
  auVar119._0_16_ = auVar146;
  auVar171 = vminps_avx(auVar119,auVar185);
  auVar117 = vminps_avx(auVar117,auVar171);
  auVar43._4_4_ = auVar117._4_4_ * 1.0000004;
  auVar43._0_4_ = auVar117._0_4_ * 1.0000004;
  auVar43._8_4_ = auVar117._8_4_ * 1.0000004;
  auVar43._12_4_ = auVar117._12_4_ * 1.0000004;
  auVar43._16_4_ = auVar117._16_4_ * 1.0000004;
  auVar43._20_4_ = auVar117._20_4_ * 1.0000004;
  auVar43._24_4_ = auVar117._24_4_ * 1.0000004;
  auVar43._28_4_ = auVar117._28_4_;
  auVar117 = vcmpps_avx(local_340,auVar43,2);
  auVar316 = vpshufd_avx(ZEXT116((byte)PVar23),0);
  auVar162._16_16_ = auVar316;
  auVar162._0_16_ = auVar316;
  auVar171 = vcvtdq2ps_avx(auVar162);
  auVar171 = vcmpps_avx(_DAT_01faff40,auVar171,1);
  auVar117 = vandps_avx(auVar117,auVar171);
  uVar92 = vmovmskps_avx(auVar117);
  if (uVar92 == 0) {
    return;
  }
  uVar92 = uVar92 & 0xff;
  auVar120._16_16_ = mm_lookupmask_ps._240_16_;
  auVar120._0_16_ = mm_lookupmask_ps._240_16_;
  local_440 = vblendps_avx(auVar120,ZEXT832(0) << 0x20,0x80);
  local_950 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7f0 = prim;
LAB_0110e895:
  local_7e8 = (ulong)uVar92;
  lVar98 = 0;
  if (local_7e8 != 0) {
    for (; (uVar92 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
    }
  }
  uVar92 = *(uint *)(local_7f0 + 2);
  local_948 = (ulong)*(uint *)(local_7f0 + lVar98 * 4 + 6);
  pGVar24 = (context->scene->geometries).items[uVar92].ptr;
  uVar94 = (ulong)*(uint *)(*(long *)&pGVar24->field_0x58 +
                           local_948 *
                           pGVar24[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar196 = (pGVar24->time_range).lower;
  fVar196 = pGVar24->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar196) / ((pGVar24->time_range).upper - fVar196));
  auVar316 = vroundss_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),9);
  auVar316 = vminss_avx(auVar316,ZEXT416((uint)(pGVar24->fnumTimeSegments + -1.0)));
  auVar316 = vmaxss_avx(ZEXT816(0) << 0x20,auVar316);
  fVar196 = fVar196 - auVar316._0_4_;
  _Var25 = pGVar24[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar100 = (long)(int)auVar316._0_4_ * 0x38;
  lVar26 = *(long *)(_Var25 + 0x10 + lVar100);
  lVar99 = *(long *)(_Var25 + 0x38 + lVar100);
  lVar27 = *(long *)(_Var25 + 0x48 + lVar100);
  auVar316 = vshufps_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),0);
  pfVar1 = (float *)(lVar99 + uVar94 * lVar27);
  fVar223 = auVar316._0_4_;
  fVar224 = auVar316._4_4_;
  fVar104 = auVar316._8_4_;
  fVar225 = auVar316._12_4_;
  pfVar2 = (float *)(lVar99 + (uVar94 + 1) * lVar27);
  pfVar3 = (float *)(lVar99 + (uVar94 + 2) * lVar27);
  pfVar4 = (float *)(lVar99 + lVar27 * (uVar94 + 3));
  lVar99 = *(long *)(_Var25 + lVar100);
  auVar316 = vshufps_avx(ZEXT416((uint)(1.0 - fVar196)),ZEXT416((uint)(1.0 - fVar196)),0);
  pfVar5 = (float *)(lVar99 + lVar26 * uVar94);
  fVar280 = auVar316._0_4_;
  fVar222 = auVar316._4_4_;
  fVar105 = auVar316._8_4_;
  fVar195 = auVar316._12_4_;
  pfVar6 = (float *)(lVar99 + lVar26 * (uVar94 + 1));
  pfVar7 = (float *)(lVar99 + lVar26 * (uVar94 + 2));
  auVar177._0_4_ = fVar223 * *pfVar1 + fVar280 * *pfVar5;
  auVar177._4_4_ = fVar224 * pfVar1[1] + fVar222 * pfVar5[1];
  auVar177._8_4_ = fVar104 * pfVar1[2] + fVar105 * pfVar5[2];
  auVar177._12_4_ = fVar225 * pfVar1[3] + fVar195 * pfVar5[3];
  auVar145._0_4_ = fVar280 * *pfVar6 + fVar223 * *pfVar2;
  auVar145._4_4_ = fVar222 * pfVar6[1] + fVar224 * pfVar2[1];
  auVar145._8_4_ = fVar105 * pfVar6[2] + fVar104 * pfVar2[2];
  auVar145._12_4_ = fVar195 * pfVar6[3] + fVar225 * pfVar2[3];
  pfVar1 = (float *)(lVar99 + lVar26 * (uVar94 + 3));
  auVar198._0_4_ = fVar280 * *pfVar7 + fVar223 * *pfVar3;
  auVar198._4_4_ = fVar222 * pfVar7[1] + fVar224 * pfVar3[1];
  auVar198._8_4_ = fVar105 * pfVar7[2] + fVar104 * pfVar3[2];
  auVar198._12_4_ = fVar195 * pfVar7[3] + fVar225 * pfVar3[3];
  auVar316 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar146 = vinsertps_avx(auVar316,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar196 = *(float *)(ray + k * 4 + 0x40);
  auVar364._4_4_ = fVar196;
  auVar364._0_4_ = fVar196;
  auVar364._8_4_ = fVar196;
  auVar364._12_4_ = fVar196;
  fStack_770 = fVar196;
  _local_780 = auVar364;
  fStack_76c = fVar196;
  fStack_768 = fVar196;
  fStack_764 = fVar196;
  auVar253._0_4_ = fVar280 * *pfVar1 + fVar223 * *pfVar4;
  auVar253._4_4_ = fVar222 * pfVar1[1] + fVar224 * pfVar4[1];
  auVar253._8_4_ = fVar105 * pfVar1[2] + fVar104 * pfVar4[2];
  auVar253._12_4_ = fVar195 * pfVar1[3] + fVar225 * pfVar4[3];
  fVar280 = *(float *)(ray + k * 4 + 0x50);
  auVar407._4_4_ = fVar280;
  auVar407._0_4_ = fVar280;
  auVar407._8_4_ = fVar280;
  auVar407._12_4_ = fVar280;
  fStack_8d0 = fVar280;
  _local_8e0 = auVar407;
  fStack_8cc = fVar280;
  fStack_8c8 = fVar280;
  fStack_8c4 = fVar280;
  auVar316 = vunpcklps_avx(auVar364,auVar407);
  fVar222 = *(float *)(ray + k * 4 + 0x60);
  auVar429._4_4_ = fVar222;
  auVar429._0_4_ = fVar222;
  auVar429._8_4_ = fVar222;
  auVar429._12_4_ = fVar222;
  fStack_730 = fVar222;
  _local_740 = auVar429;
  fStack_72c = fVar222;
  fStack_728 = fVar222;
  register0x000015dc = fVar222;
  _local_910 = vinsertps_avx(auVar316,auVar429,0x28);
  auVar107._0_4_ = (auVar177._0_4_ + auVar145._0_4_ + auVar198._0_4_ + auVar253._0_4_) * 0.25;
  auVar107._4_4_ = (auVar177._4_4_ + auVar145._4_4_ + auVar198._4_4_ + auVar253._4_4_) * 0.25;
  auVar107._8_4_ = (auVar177._8_4_ + auVar145._8_4_ + auVar198._8_4_ + auVar253._8_4_) * 0.25;
  auVar107._12_4_ = (auVar177._12_4_ + auVar145._12_4_ + auVar198._12_4_ + auVar253._12_4_) * 0.25;
  auVar316 = vsubps_avx(auVar107,auVar146);
  auVar316 = vdpps_avx(auVar316,_local_910,0x7f);
  local_920 = vdpps_avx(_local_910,_local_910,0x7f);
  auVar41 = vrcpss_avx(local_920,local_920);
  fVar105 = auVar316._0_4_ * auVar41._0_4_ * (2.0 - local_920._0_4_ * auVar41._0_4_);
  auVar41 = vshufps_avx(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105),0);
  auVar230._0_4_ = auVar146._0_4_ + local_910._0_4_ * auVar41._0_4_;
  auVar230._4_4_ = auVar146._4_4_ + local_910._4_4_ * auVar41._4_4_;
  auVar230._8_4_ = auVar146._8_4_ + local_910._8_4_ * auVar41._8_4_;
  auVar230._12_4_ = auVar146._12_4_ + local_910._12_4_ * auVar41._12_4_;
  auVar316 = vblendps_avx(auVar230,_DAT_01f7aa10,8);
  auVar10 = vsubps_avx(auVar177,auVar316);
  auVar42 = vsubps_avx(auVar198,auVar316);
  auVar11 = vsubps_avx(auVar145,auVar316);
  auVar12 = vsubps_avx(auVar253,auVar316);
  auVar316 = vshufps_avx(auVar10,auVar10,0);
  auVar146 = vshufps_avx(auVar10,auVar10,0x55);
  local_980._16_16_ = auVar146;
  local_980._0_16_ = auVar146;
  auVar385 = ZEXT3264(local_980);
  auVar146 = vshufps_avx(auVar10,auVar10,0xaa);
  local_9a0._16_16_ = auVar146;
  local_9a0._0_16_ = auVar146;
  auVar398 = ZEXT3264(local_9a0);
  auVar146 = vshufps_avx(auVar10,auVar10,0xff);
  local_9c0._16_16_ = auVar146;
  local_9c0._0_16_ = auVar146;
  auVar433 = ZEXT3264(local_9c0);
  auVar146 = vshufps_avx(auVar11,auVar11,0);
  auVar260._16_16_ = auVar146;
  auVar260._0_16_ = auVar146;
  auVar146 = vshufps_avx(auVar11,auVar11,0x55);
  register0x00001290 = auVar146;
  _local_1e0 = auVar146;
  auVar146 = vshufps_avx(auVar11,auVar11,0xaa);
  local_a00._16_16_ = auVar146;
  local_a00._0_16_ = auVar146;
  auVar295 = ZEXT3264(local_a00);
  auVar146 = vshufps_avx(auVar11,auVar11,0xff);
  local_a20._16_16_ = auVar146;
  local_a20._0_16_ = auVar146;
  auVar353 = ZEXT3264(local_a20);
  auVar146 = vshufps_avx(auVar42,auVar42,0);
  local_2e0._16_16_ = auVar146;
  local_2e0._0_16_ = auVar146;
  auVar146 = vshufps_avx(auVar42,auVar42,0x55);
  local_300._16_16_ = auVar146;
  local_300._0_16_ = auVar146;
  auVar146 = vshufps_avx(auVar42,auVar42,0xaa);
  register0x00001290 = auVar146;
  _local_200 = auVar146;
  auVar146 = vshufps_avx(auVar42,auVar42,0xff);
  register0x00001290 = auVar146;
  _local_220 = auVar146;
  auVar146 = vshufps_avx(auVar12,auVar12,0);
  register0x00001290 = auVar146;
  _local_240 = auVar146;
  auVar146 = vshufps_avx(auVar12,auVar12,0x55);
  register0x00001290 = auVar146;
  _local_260 = auVar146;
  auVar146 = vshufps_avx(auVar12,auVar12,0xaa);
  register0x00001290 = auVar146;
  _local_280 = auVar146;
  auVar146 = vshufps_avx(auVar12,auVar12,0xff);
  register0x00001290 = auVar146;
  _local_2a0 = auVar146;
  auVar146 = ZEXT416((uint)(fVar196 * fVar196 + fVar280 * fVar280 + fVar222 * fVar222));
  auVar146 = vshufps_avx(auVar146,auVar146,0);
  local_2c0._16_16_ = auVar146;
  local_2c0._0_16_ = auVar146;
  fVar196 = *(float *)(ray + k * 4 + 0x30);
  local_810 = ZEXT416((uint)fVar105);
  auVar146 = vshufps_avx(ZEXT416((uint)(fVar196 - fVar105)),ZEXT416((uint)(fVar196 - fVar105)),0);
  local_320._16_16_ = auVar146;
  local_320._0_16_ = auVar146;
  local_6b0 = vpshufd_avx(ZEXT416(uVar92),0);
  local_6c0 = vpshufd_avx(ZEXT416(*(uint *)(local_7f0 + lVar98 * 4 + 6)),0);
  local_c00 = auVar41._0_8_;
  uStack_bf8 = auVar41._8_8_;
  local_8a0 = local_c00;
  uStack_898 = uStack_bf8;
  uStack_890 = local_c00;
  uStack_888 = uStack_bf8;
  uVar102 = 0;
  uVar101 = 1;
  auVar121._8_4_ = 0x7fffffff;
  auVar121._0_8_ = 0x7fffffff7fffffff;
  auVar121._12_4_ = 0x7fffffff;
  auVar121._16_4_ = 0x7fffffff;
  auVar121._20_4_ = 0x7fffffff;
  auVar121._24_4_ = 0x7fffffff;
  auVar121._28_4_ = 0x7fffffff;
  local_480 = vandps_avx(local_2c0,auVar121);
  auVar146 = vsqrtss_avx(local_920,local_920);
  auVar41 = vsqrtss_avx(local_920,local_920);
  local_4b0 = ZEXT816(0x3f80000000000000);
  local_460 = auVar260;
  do {
    auVar217._8_4_ = 0x3f800000;
    auVar217._0_8_ = 0x3f8000003f800000;
    auVar217._12_4_ = 0x3f800000;
    auVar217._16_4_ = 0x3f800000;
    auVar217._20_4_ = 0x3f800000;
    auVar217._24_4_ = 0x3f800000;
    auVar217._28_4_ = 0x3f800000;
    auVar254 = vmovshdup_avx(local_4b0);
    auVar205 = vsubps_avx(auVar254,local_4b0);
    auVar254 = vshufps_avx(local_4b0,local_4b0,0);
    local_6e0._16_16_ = auVar254;
    local_6e0._0_16_ = auVar254;
    auVar147 = vshufps_avx(auVar205,auVar205,0);
    local_700._16_16_ = auVar147;
    local_700._0_16_ = auVar147;
    fVar142 = auVar147._0_4_;
    fVar173 = auVar147._4_4_;
    fVar174 = auVar147._8_4_;
    fVar175 = auVar147._12_4_;
    fVar103 = auVar254._0_4_;
    auVar163._0_4_ = fVar103 + fVar142 * 0.0;
    fVar133 = auVar254._4_4_;
    auVar163._4_4_ = fVar133 + fVar173 * 0.14285715;
    fVar135 = auVar254._8_4_;
    auVar163._8_4_ = fVar135 + fVar174 * 0.2857143;
    fVar137 = auVar254._12_4_;
    auVar163._12_4_ = fVar137 + fVar175 * 0.42857146;
    auVar163._16_4_ = fVar103 + fVar142 * 0.5714286;
    auVar163._20_4_ = fVar133 + fVar173 * 0.71428573;
    auVar163._24_4_ = fVar135 + fVar174 * 0.8571429;
    auVar163._28_4_ = fVar137 + fVar175;
    auVar117 = vsubps_avx(auVar217,auVar163);
    fVar225 = auVar260._28_4_;
    fVar280 = auVar117._0_4_;
    fVar222 = auVar117._4_4_;
    fVar105 = auVar117._8_4_;
    fVar195 = auVar117._12_4_;
    fVar330 = auVar316._12_4_;
    fVar223 = auVar117._16_4_;
    fVar224 = auVar117._20_4_;
    fVar104 = auVar117._24_4_;
    fVar249 = fVar330 + 1.0;
    fVar354 = fVar225 + fVar249;
    fVar281 = local_2e0._0_4_ * auVar163._0_4_ + auVar260._0_4_ * fVar280;
    fVar296 = local_2e0._4_4_ * auVar163._4_4_ + auVar260._4_4_ * fVar222;
    fVar299 = local_2e0._8_4_ * auVar163._8_4_ + auVar260._8_4_ * fVar105;
    fVar302 = local_2e0._12_4_ * auVar163._12_4_ + auVar260._12_4_ * fVar195;
    fVar305 = local_2e0._16_4_ * auVar163._16_4_ + auVar260._16_4_ * fVar223;
    fVar308 = local_2e0._20_4_ * auVar163._20_4_ + auVar260._20_4_ * fVar224;
    fVar311 = local_2e0._24_4_ * auVar163._24_4_ + auVar260._24_4_ * fVar104;
    fVar226 = local_300._0_4_ * auVar163._0_4_ + (float)local_1e0._0_4_ * fVar280;
    fVar227 = local_300._4_4_ * auVar163._4_4_ + (float)local_1e0._4_4_ * fVar222;
    fVar228 = local_300._8_4_ * auVar163._8_4_ + fStack_1d8 * fVar105;
    fVar245 = local_300._12_4_ * auVar163._12_4_ + fStack_1d4 * fVar195;
    fVar246 = local_300._16_4_ * auVar163._16_4_ + fStack_1d0 * fVar223;
    fVar247 = local_300._20_4_ * auVar163._20_4_ + fStack_1cc * fVar224;
    fVar248 = local_300._24_4_ * auVar163._24_4_ + fStack_1c8 * fVar104;
    fVar250 = (float)local_200._0_4_ * auVar163._0_4_ + auVar295._0_4_ * fVar280;
    fVar251 = (float)local_200._4_4_ * auVar163._4_4_ + auVar295._4_4_ * fVar222;
    fVar268 = fStack_1f8 * auVar163._8_4_ + auVar295._8_4_ * fVar105;
    fVar270 = fStack_1f4 * auVar163._12_4_ + auVar295._12_4_ * fVar195;
    fVar272 = fStack_1f0 * auVar163._16_4_ + auVar295._16_4_ * fVar223;
    fVar274 = fStack_1ec * auVar163._20_4_ + auVar295._20_4_ * fVar224;
    fVar276 = fStack_1e8 * auVar163._24_4_ + auVar295._24_4_ * fVar104;
    fVar278 = (float)local_220._0_4_ * auVar163._0_4_ + auVar353._0_4_ * fVar280;
    fVar269 = (float)local_220._4_4_ * auVar163._4_4_ + auVar353._4_4_ * fVar222;
    fVar271 = fStack_218 * auVar163._8_4_ + auVar353._8_4_ * fVar105;
    fVar273 = fStack_214 * auVar163._12_4_ + auVar353._12_4_ * fVar195;
    fVar275 = fStack_210 * auVar163._16_4_ + auVar353._16_4_ * fVar223;
    fVar277 = fStack_20c * auVar163._20_4_ + auVar353._20_4_ * fVar224;
    fVar279 = fStack_208 * auVar163._24_4_ + auVar353._24_4_ * fVar104;
    fVar392 = auVar385._28_4_;
    fVar422 = fVar392 + local_2e0._28_4_;
    fVar405 = auVar353._28_4_ + fVar392;
    auVar360._0_4_ =
         fVar280 * (auVar260._0_4_ * auVar163._0_4_ + auVar316._0_4_ * fVar280) +
         auVar163._0_4_ * fVar281;
    auVar360._4_4_ =
         fVar222 * (auVar260._4_4_ * auVar163._4_4_ + auVar316._4_4_ * fVar222) +
         auVar163._4_4_ * fVar296;
    auVar360._8_4_ =
         fVar105 * (auVar260._8_4_ * auVar163._8_4_ + auVar316._8_4_ * fVar105) +
         auVar163._8_4_ * fVar299;
    auVar360._12_4_ =
         fVar195 * (auVar260._12_4_ * auVar163._12_4_ + fVar330 * fVar195) +
         auVar163._12_4_ * fVar302;
    auVar360._16_4_ =
         fVar223 * (auVar260._16_4_ * auVar163._16_4_ + auVar316._0_4_ * fVar223) +
         auVar163._16_4_ * fVar305;
    auVar360._20_4_ =
         fVar224 * (auVar260._20_4_ * auVar163._20_4_ + auVar316._4_4_ * fVar224) +
         auVar163._20_4_ * fVar308;
    auVar360._24_4_ =
         fVar104 * (auVar260._24_4_ * auVar163._24_4_ + auVar316._8_4_ * fVar104) +
         auVar163._24_4_ * fVar311;
    auVar360._28_4_ = fStack_1e4 + fVar392;
    auVar369._0_4_ =
         fVar280 * ((float)local_1e0._0_4_ * auVar163._0_4_ + auVar385._0_4_ * fVar280) +
         auVar163._0_4_ * fVar226;
    auVar369._4_4_ =
         fVar222 * ((float)local_1e0._4_4_ * auVar163._4_4_ + auVar385._4_4_ * fVar222) +
         auVar163._4_4_ * fVar227;
    auVar369._8_4_ =
         fVar105 * (fStack_1d8 * auVar163._8_4_ + auVar385._8_4_ * fVar105) +
         auVar163._8_4_ * fVar228;
    auVar369._12_4_ =
         fVar195 * (fStack_1d4 * auVar163._12_4_ + auVar385._12_4_ * fVar195) +
         auVar163._12_4_ * fVar245;
    auVar369._16_4_ =
         fVar223 * (fStack_1d0 * auVar163._16_4_ + auVar385._16_4_ * fVar223) +
         auVar163._16_4_ * fVar246;
    auVar369._20_4_ =
         fVar224 * (fStack_1cc * auVar163._20_4_ + auVar385._20_4_ * fVar224) +
         auVar163._20_4_ * fVar247;
    auVar369._24_4_ =
         fVar104 * (fStack_1c8 * auVar163._24_4_ + auVar385._24_4_ * fVar104) +
         auVar163._24_4_ * fVar248;
    auVar369._28_4_ = fStack_204 + fVar392;
    auVar382._0_4_ =
         (auVar295._0_4_ * auVar163._0_4_ + auVar398._0_4_ * fVar280) * fVar280 +
         auVar163._0_4_ * fVar250;
    auVar382._4_4_ =
         (auVar295._4_4_ * auVar163._4_4_ + auVar398._4_4_ * fVar222) * fVar222 +
         auVar163._4_4_ * fVar251;
    auVar382._8_4_ =
         (auVar295._8_4_ * auVar163._8_4_ + auVar398._8_4_ * fVar105) * fVar105 +
         auVar163._8_4_ * fVar268;
    auVar382._12_4_ =
         (auVar295._12_4_ * auVar163._12_4_ + auVar398._12_4_ * fVar195) * fVar195 +
         auVar163._12_4_ * fVar270;
    auVar382._16_4_ =
         (auVar295._16_4_ * auVar163._16_4_ + auVar398._16_4_ * fVar223) * fVar223 +
         auVar163._16_4_ * fVar272;
    auVar382._20_4_ =
         (auVar295._20_4_ * auVar163._20_4_ + auVar398._20_4_ * fVar224) * fVar224 +
         auVar163._20_4_ * fVar274;
    auVar382._24_4_ =
         (auVar295._24_4_ * auVar163._24_4_ + auVar398._24_4_ * fVar104) * fVar104 +
         auVar163._24_4_ * fVar276;
    auVar382._28_4_ = fVar354 + fVar392;
    auVar322._0_4_ =
         auVar163._0_4_ * fVar278 +
         fVar280 * (auVar353._0_4_ * auVar163._0_4_ + auVar433._0_4_ * fVar280);
    auVar322._4_4_ =
         auVar163._4_4_ * fVar269 +
         fVar222 * (auVar353._4_4_ * auVar163._4_4_ + auVar433._4_4_ * fVar222);
    auVar322._8_4_ =
         auVar163._8_4_ * fVar271 +
         fVar105 * (auVar353._8_4_ * auVar163._8_4_ + auVar433._8_4_ * fVar105);
    auVar322._12_4_ =
         auVar163._12_4_ * fVar273 +
         fVar195 * (auVar353._12_4_ * auVar163._12_4_ + auVar433._12_4_ * fVar195);
    auVar322._16_4_ =
         auVar163._16_4_ * fVar275 +
         fVar223 * (auVar353._16_4_ * auVar163._16_4_ + auVar433._16_4_ * fVar223);
    auVar322._20_4_ =
         auVar163._20_4_ * fVar277 +
         fVar224 * (auVar353._20_4_ * auVar163._20_4_ + auVar433._20_4_ * fVar224);
    auVar322._24_4_ =
         auVar163._24_4_ * fVar279 +
         fVar104 * (auVar353._24_4_ * auVar163._24_4_ + auVar433._24_4_ * fVar104);
    auVar322._28_4_ = fVar354 + fVar330;
    auVar288._0_4_ =
         (auVar163._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar280) * auVar163._0_4_ +
         fVar280 * fVar281;
    auVar288._4_4_ =
         (auVar163._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar222) * auVar163._4_4_ +
         fVar222 * fVar296;
    auVar288._8_4_ =
         (auVar163._8_4_ * fStack_238 + local_2e0._8_4_ * fVar105) * auVar163._8_4_ +
         fVar105 * fVar299;
    auVar288._12_4_ =
         (auVar163._12_4_ * fStack_234 + local_2e0._12_4_ * fVar195) * auVar163._12_4_ +
         fVar195 * fVar302;
    auVar288._16_4_ =
         (auVar163._16_4_ * fStack_230 + local_2e0._16_4_ * fVar223) * auVar163._16_4_ +
         fVar223 * fVar305;
    auVar288._20_4_ =
         (auVar163._20_4_ * fStack_22c + local_2e0._20_4_ * fVar224) * auVar163._20_4_ +
         fVar224 * fVar308;
    auVar288._24_4_ =
         (auVar163._24_4_ * fStack_228 + local_2e0._24_4_ * fVar104) * auVar163._24_4_ +
         fVar104 * fVar311;
    auVar288._28_4_ = fVar354 + fVar249 + auVar295._28_4_;
    auVar218._0_4_ =
         (auVar163._0_4_ * (float)local_260._0_4_ + local_300._0_4_ * fVar280) * auVar163._0_4_ +
         fVar280 * fVar226;
    auVar218._4_4_ =
         (auVar163._4_4_ * (float)local_260._4_4_ + local_300._4_4_ * fVar222) * auVar163._4_4_ +
         fVar222 * fVar227;
    auVar218._8_4_ =
         (auVar163._8_4_ * fStack_258 + local_300._8_4_ * fVar105) * auVar163._8_4_ +
         fVar105 * fVar228;
    auVar218._12_4_ =
         (auVar163._12_4_ * fStack_254 + local_300._12_4_ * fVar195) * auVar163._12_4_ +
         fVar195 * fVar245;
    auVar218._16_4_ =
         (auVar163._16_4_ * fStack_250 + local_300._16_4_ * fVar223) * auVar163._16_4_ +
         fVar223 * fVar246;
    auVar218._20_4_ =
         (auVar163._20_4_ * fStack_24c + local_300._20_4_ * fVar224) * auVar163._20_4_ +
         fVar224 * fVar247;
    auVar218._24_4_ =
         (auVar163._24_4_ * fStack_248 + local_300._24_4_ * fVar104) * auVar163._24_4_ +
         fVar104 * fVar248;
    auVar218._28_4_ = fVar354 + fVar225 + fVar249;
    auVar240._0_4_ =
         (auVar163._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar280) *
         auVar163._0_4_ + fVar280 * fVar250;
    auVar240._4_4_ =
         (auVar163._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar222) *
         auVar163._4_4_ + fVar222 * fVar251;
    auVar240._8_4_ =
         (auVar163._8_4_ * fStack_278 + fStack_1f8 * fVar105) * auVar163._8_4_ + fVar105 * fVar268;
    auVar240._12_4_ =
         (auVar163._12_4_ * fStack_274 + fStack_1f4 * fVar195) * auVar163._12_4_ + fVar195 * fVar270
    ;
    auVar240._16_4_ =
         (auVar163._16_4_ * fStack_270 + fStack_1f0 * fVar223) * auVar163._16_4_ + fVar223 * fVar272
    ;
    auVar240._20_4_ =
         (auVar163._20_4_ * fStack_26c + fStack_1ec * fVar224) * auVar163._20_4_ + fVar224 * fVar274
    ;
    auVar240._24_4_ =
         (auVar163._24_4_ * fStack_268 + fStack_1e8 * fVar104) * auVar163._24_4_ + fVar104 * fVar276
    ;
    auVar240._28_4_ = fVar405 + fVar330 + auVar295._28_4_;
    auVar261._0_4_ =
         (auVar163._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar280) *
         auVar163._0_4_ + fVar280 * fVar278;
    auVar261._4_4_ =
         (auVar163._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar222) *
         auVar163._4_4_ + fVar222 * fVar269;
    auVar261._8_4_ =
         (auVar163._8_4_ * fStack_298 + fStack_218 * fVar105) * auVar163._8_4_ + fVar105 * fVar271;
    auVar261._12_4_ =
         (auVar163._12_4_ * fStack_294 + fStack_214 * fVar195) * auVar163._12_4_ + fVar195 * fVar273
    ;
    auVar261._16_4_ =
         (auVar163._16_4_ * fStack_290 + fStack_210 * fVar223) * auVar163._16_4_ + fVar223 * fVar275
    ;
    auVar261._20_4_ =
         (auVar163._20_4_ * fStack_28c + fStack_20c * fVar224) * auVar163._20_4_ + fVar224 * fVar277
    ;
    auVar261._24_4_ =
         (auVar163._24_4_ * fStack_288 + fStack_208 * fVar104) * auVar163._24_4_ + fVar104 * fVar279
    ;
    auVar261._28_4_ = fVar422 + fVar392 + fVar225;
    auVar410._0_4_ = auVar360._0_4_ * fVar280 + auVar163._0_4_ * auVar288._0_4_;
    auVar410._4_4_ = auVar360._4_4_ * fVar222 + auVar163._4_4_ * auVar288._4_4_;
    auVar410._8_4_ = auVar360._8_4_ * fVar105 + auVar163._8_4_ * auVar288._8_4_;
    auVar410._12_4_ = auVar360._12_4_ * fVar195 + auVar163._12_4_ * auVar288._12_4_;
    auVar410._16_4_ = auVar360._16_4_ * fVar223 + auVar163._16_4_ * auVar288._16_4_;
    auVar410._20_4_ = auVar360._20_4_ * fVar224 + auVar163._20_4_ * auVar288._20_4_;
    auVar410._24_4_ = auVar360._24_4_ * fVar104 + auVar163._24_4_ * auVar288._24_4_;
    auVar410._28_4_ = fVar422 + fVar354;
    auVar424._0_4_ = auVar369._0_4_ * fVar280 + auVar163._0_4_ * auVar218._0_4_;
    auVar424._4_4_ = auVar369._4_4_ * fVar222 + auVar163._4_4_ * auVar218._4_4_;
    auVar424._8_4_ = auVar369._8_4_ * fVar105 + auVar163._8_4_ * auVar218._8_4_;
    auVar424._12_4_ = auVar369._12_4_ * fVar195 + auVar163._12_4_ * auVar218._12_4_;
    auVar424._16_4_ = auVar369._16_4_ * fVar223 + auVar163._16_4_ * auVar218._16_4_;
    auVar424._20_4_ = auVar369._20_4_ * fVar224 + auVar163._20_4_ * auVar218._20_4_;
    auVar424._24_4_ = auVar369._24_4_ * fVar104 + auVar163._24_4_ * auVar218._24_4_;
    auVar424._28_4_ = fVar354 + fVar405;
    local_5c0._0_4_ = auVar382._0_4_ * fVar280 + auVar163._0_4_ * auVar240._0_4_;
    local_5c0._4_4_ = auVar382._4_4_ * fVar222 + auVar163._4_4_ * auVar240._4_4_;
    fStack_5b8 = auVar382._8_4_ * fVar105 + auVar163._8_4_ * auVar240._8_4_;
    fStack_5b4 = auVar382._12_4_ * fVar195 + auVar163._12_4_ * auVar240._12_4_;
    fStack_5b0 = auVar382._16_4_ * fVar223 + auVar163._16_4_ * auVar240._16_4_;
    fStack_5ac = auVar382._20_4_ * fVar224 + auVar163._20_4_ * auVar240._20_4_;
    fStack_5a8 = auVar382._24_4_ * fVar104 + auVar163._24_4_ * auVar240._24_4_;
    fStack_5a4 = fVar405 + fVar354;
    local_bc0 = auVar205._0_4_;
    local_720._0_4_ = fVar280 * auVar322._0_4_ + auVar163._0_4_ * auVar261._0_4_;
    local_720._4_4_ = fVar222 * auVar322._4_4_ + auVar163._4_4_ * auVar261._4_4_;
    local_720._8_4_ = fVar105 * auVar322._8_4_ + auVar163._8_4_ * auVar261._8_4_;
    local_720._12_4_ = fVar195 * auVar322._12_4_ + auVar163._12_4_ * auVar261._12_4_;
    local_720._16_4_ = fVar223 * auVar322._16_4_ + auVar163._16_4_ * auVar261._16_4_;
    local_720._20_4_ = fVar224 * auVar322._20_4_ + auVar163._20_4_ * auVar261._20_4_;
    local_720._24_4_ = fVar104 * auVar322._24_4_ + auVar163._24_4_ * auVar261._24_4_;
    local_720._28_4_ = auVar117._28_4_ + auVar163._28_4_;
    auVar117 = vsubps_avx(auVar288,auVar360);
    auVar171 = vsubps_avx(auVar218,auVar369);
    auVar383 = vsubps_avx(auVar240,auVar382);
    auVar29 = vsubps_avx(auVar261,auVar322);
    auVar254 = vshufps_avx(ZEXT416((uint)(local_bc0 * 0.04761905)),
                           ZEXT416((uint)(local_bc0 * 0.04761905)),0);
    fVar224 = auVar254._0_4_;
    fVar282 = fVar224 * auVar117._0_4_ * 3.0;
    fVar225 = auVar254._4_4_;
    fVar297 = fVar225 * auVar117._4_4_ * 3.0;
    local_940._4_4_ = fVar297;
    local_940._0_4_ = fVar282;
    fVar247 = auVar254._8_4_;
    fVar300 = fVar247 * auVar117._8_4_ * 3.0;
    fStack_938 = fVar300;
    fVar270 = auVar254._12_4_;
    fVar303 = fVar270 * auVar117._12_4_ * 3.0;
    fStack_934 = fVar303;
    fVar306 = fVar224 * auVar117._16_4_ * 3.0;
    unique0x1000be54 = fVar306;
    fVar309 = fVar225 * auVar117._20_4_ * 3.0;
    unique0x1000be58 = fVar309;
    fVar312 = fVar247 * auVar117._24_4_ * 3.0;
    unique0x1000be5c = fVar312;
    unique0x1000be60 = auVar288._28_4_;
    fVar314 = fVar224 * auVar171._0_4_ * 3.0;
    fVar325 = fVar225 * auVar171._4_4_ * 3.0;
    auVar44._4_4_ = fVar325;
    auVar44._0_4_ = fVar314;
    fVar327 = fVar247 * auVar171._8_4_ * 3.0;
    auVar44._8_4_ = fVar327;
    fVar331 = fVar270 * auVar171._12_4_ * 3.0;
    auVar44._12_4_ = fVar331;
    fVar334 = fVar224 * auVar171._16_4_ * 3.0;
    auVar44._16_4_ = fVar334;
    fVar337 = fVar225 * auVar171._20_4_ * 3.0;
    auVar44._20_4_ = fVar337;
    fVar340 = fVar247 * auVar171._24_4_ * 3.0;
    auVar44._24_4_ = fVar340;
    auVar44._28_4_ = auVar322._28_4_;
    fVar393 = fVar224 * auVar383._0_4_ * 3.0;
    fVar399 = fVar225 * auVar383._4_4_ * 3.0;
    auVar45._4_4_ = fVar399;
    auVar45._0_4_ = fVar393;
    fVar400 = fVar247 * auVar383._8_4_ * 3.0;
    auVar45._8_4_ = fVar400;
    fVar401 = fVar270 * auVar383._12_4_ * 3.0;
    auVar45._12_4_ = fVar401;
    fVar402 = fVar224 * auVar383._16_4_ * 3.0;
    auVar45._16_4_ = fVar402;
    fVar403 = fVar225 * auVar383._20_4_ * 3.0;
    auVar45._20_4_ = fVar403;
    fVar404 = fVar247 * auVar383._24_4_ * 3.0;
    auVar45._24_4_ = fVar404;
    auVar45._28_4_ = fVar405;
    fVar104 = fVar224 * auVar29._0_4_ * 3.0;
    fVar246 = fVar225 * auVar29._4_4_ * 3.0;
    auVar46._4_4_ = fVar246;
    auVar46._0_4_ = fVar104;
    fVar248 = fVar247 * auVar29._8_4_ * 3.0;
    auVar46._8_4_ = fVar248;
    fVar272 = fVar270 * auVar29._12_4_ * 3.0;
    auVar46._12_4_ = fVar272;
    fVar224 = fVar224 * auVar29._16_4_ * 3.0;
    auVar46._16_4_ = fVar224;
    fVar225 = fVar225 * auVar29._20_4_ * 3.0;
    auVar46._20_4_ = fVar225;
    fVar247 = fVar247 * auVar29._24_4_ * 3.0;
    auVar46._24_4_ = fVar247;
    auVar46._28_4_ = fVar270;
    auVar117 = vperm2f128_avx(auVar424,auVar424,1);
    auVar117 = vshufps_avx(auVar117,auVar424,0x30);
    auVar29 = vshufps_avx(auVar424,auVar117,0x29);
    auVar117 = vperm2f128_avx(_local_5c0,_local_5c0,1);
    auVar117 = vshufps_avx(auVar117,_local_5c0,0x30);
    local_a40 = vshufps_avx(_local_5c0,auVar117,0x29);
    auVar171 = vsubps_avx(local_720,auVar46);
    auVar117 = vperm2f128_avx(auVar171,auVar171,1);
    auVar117 = vshufps_avx(auVar117,auVar171,0x30);
    auVar187 = vshufps_avx(auVar171,auVar117,0x29);
    local_560 = vsubps_avx(auVar29,auVar424);
    local_540 = vsubps_avx(local_a40,_local_5c0);
    fVar222 = local_560._0_4_;
    fVar226 = local_560._4_4_;
    auVar47._4_4_ = fVar399 * fVar226;
    auVar47._0_4_ = fVar393 * fVar222;
    fVar249 = local_560._8_4_;
    auVar47._8_4_ = fVar400 * fVar249;
    fVar276 = local_560._12_4_;
    auVar47._12_4_ = fVar401 * fVar276;
    fVar279 = local_560._16_4_;
    auVar47._16_4_ = fVar402 * fVar279;
    fVar311 = local_560._20_4_;
    auVar47._20_4_ = fVar403 * fVar311;
    fVar34 = local_560._24_4_;
    auVar47._24_4_ = fVar404 * fVar34;
    auVar47._28_4_ = auVar171._28_4_;
    fVar376 = local_540._0_4_;
    fVar386 = local_540._4_4_;
    auVar48._4_4_ = fVar386 * fVar325;
    auVar48._0_4_ = fVar376 * fVar314;
    fVar387 = local_540._8_4_;
    auVar48._8_4_ = fVar387 * fVar327;
    fVar388 = local_540._12_4_;
    auVar48._12_4_ = fVar388 * fVar331;
    fVar389 = local_540._16_4_;
    auVar48._16_4_ = fVar389 * fVar334;
    fVar390 = local_540._20_4_;
    auVar48._20_4_ = fVar390 * fVar337;
    fVar391 = local_540._24_4_;
    auVar48._24_4_ = fVar391 * fVar340;
    auVar48._28_4_ = auVar117._28_4_;
    auVar415 = vsubps_avx(auVar48,auVar47);
    auVar117 = vperm2f128_avx(auVar410,auVar410,1);
    auVar117 = vshufps_avx(auVar117,auVar410,0x30);
    auVar30 = vshufps_avx(auVar410,auVar117,0x29);
    local_580 = vsubps_avx(auVar30,auVar410);
    auVar49._4_4_ = fVar386 * fVar297;
    auVar49._0_4_ = fVar376 * fVar282;
    auVar49._8_4_ = fVar387 * fVar300;
    auVar49._12_4_ = fVar388 * fVar303;
    auVar49._16_4_ = fVar389 * fVar306;
    auVar49._20_4_ = fVar390 * fVar309;
    auVar49._24_4_ = fVar391 * fVar312;
    auVar49._28_4_ = auVar30._28_4_;
    fVar105 = local_580._0_4_;
    fVar227 = local_580._4_4_;
    auVar50._4_4_ = fVar399 * fVar227;
    auVar50._0_4_ = fVar393 * fVar105;
    fVar250 = local_580._8_4_;
    auVar50._8_4_ = fVar400 * fVar250;
    fVar278 = local_580._12_4_;
    auVar50._12_4_ = fVar401 * fVar278;
    fVar281 = local_580._16_4_;
    auVar50._16_4_ = fVar402 * fVar281;
    fVar330 = local_580._20_4_;
    auVar50._20_4_ = fVar403 * fVar330;
    fVar35 = local_580._24_4_;
    auVar50._24_4_ = fVar404 * fVar35;
    auVar50._28_4_ = local_a40._28_4_;
    auVar31 = vsubps_avx(auVar50,auVar49);
    auVar51._4_4_ = fVar227 * fVar325;
    auVar51._0_4_ = fVar105 * fVar314;
    auVar51._8_4_ = fVar250 * fVar327;
    auVar51._12_4_ = fVar278 * fVar331;
    auVar51._16_4_ = fVar281 * fVar334;
    auVar51._20_4_ = fVar330 * fVar337;
    auVar51._24_4_ = fVar35 * fVar340;
    auVar51._28_4_ = local_a40._28_4_;
    auVar52._4_4_ = fVar297 * fVar226;
    auVar52._0_4_ = fVar282 * fVar222;
    auVar52._8_4_ = fVar300 * fVar249;
    auVar52._12_4_ = fVar303 * fVar276;
    auVar52._16_4_ = fVar306 * fVar279;
    auVar52._20_4_ = fVar309 * fVar311;
    auVar52._24_4_ = fVar312 * fVar34;
    auVar52._28_4_ = auVar369._28_4_;
    auVar32 = vsubps_avx(auVar52,auVar51);
    fVar280 = auVar32._28_4_;
    auVar186._0_4_ = fVar105 * fVar105 + fVar222 * fVar222 + fVar376 * fVar376;
    auVar186._4_4_ = fVar227 * fVar227 + fVar226 * fVar226 + fVar386 * fVar386;
    auVar186._8_4_ = fVar250 * fVar250 + fVar249 * fVar249 + fVar387 * fVar387;
    auVar186._12_4_ = fVar278 * fVar278 + fVar276 * fVar276 + fVar388 * fVar388;
    auVar186._16_4_ = fVar281 * fVar281 + fVar279 * fVar279 + fVar389 * fVar389;
    auVar186._20_4_ = fVar330 * fVar330 + fVar311 * fVar311 + fVar390 * fVar390;
    auVar186._24_4_ = fVar35 * fVar35 + fVar34 * fVar34 + fVar391 * fVar391;
    auVar186._28_4_ = fVar280 + fVar280 + auVar415._28_4_;
    auVar117 = vrcpps_avx(auVar186);
    fVar274 = auVar117._0_4_;
    fVar273 = auVar117._4_4_;
    auVar53._4_4_ = fVar273 * auVar186._4_4_;
    auVar53._0_4_ = fVar274 * auVar186._0_4_;
    fVar275 = auVar117._8_4_;
    auVar53._8_4_ = fVar275 * auVar186._8_4_;
    fVar277 = auVar117._12_4_;
    auVar53._12_4_ = fVar277 * auVar186._12_4_;
    fVar302 = auVar117._16_4_;
    auVar53._16_4_ = fVar302 * auVar186._16_4_;
    fVar305 = auVar117._20_4_;
    auVar53._20_4_ = fVar305 * auVar186._20_4_;
    fVar308 = auVar117._24_4_;
    auVar53._24_4_ = fVar308 * auVar186._24_4_;
    auVar53._28_4_ = auVar369._28_4_;
    auVar411._8_4_ = 0x3f800000;
    auVar411._0_8_ = 0x3f8000003f800000;
    auVar411._12_4_ = 0x3f800000;
    auVar411._16_4_ = 0x3f800000;
    auVar411._20_4_ = 0x3f800000;
    auVar411._24_4_ = 0x3f800000;
    auVar411._28_4_ = 0x3f800000;
    auVar384 = vsubps_avx(auVar411,auVar53);
    fVar274 = auVar384._0_4_ * fVar274 + fVar274;
    fVar273 = auVar384._4_4_ * fVar273 + fVar273;
    fVar275 = auVar384._8_4_ * fVar275 + fVar275;
    fVar277 = auVar384._12_4_ * fVar277 + fVar277;
    fVar302 = auVar384._16_4_ * fVar302 + fVar302;
    fVar305 = auVar384._20_4_ * fVar305 + fVar305;
    fVar308 = auVar384._24_4_ * fVar308 + fVar308;
    auVar171 = vperm2f128_avx(auVar44,auVar44,1);
    auVar171 = vshufps_avx(auVar171,auVar44,0x30);
    auVar171 = vshufps_avx(auVar44,auVar171,0x29);
    auVar383 = vperm2f128_avx(auVar45,auVar45,1);
    auVar383 = vshufps_avx(auVar383,auVar45,0x30);
    local_8c0 = vshufps_avx(auVar45,auVar383,0x29);
    fVar406 = local_8c0._0_4_;
    fVar416 = local_8c0._4_4_;
    auVar54._4_4_ = fVar416 * fVar226;
    auVar54._0_4_ = fVar406 * fVar222;
    fVar417 = local_8c0._8_4_;
    auVar54._8_4_ = fVar417 * fVar249;
    fVar418 = local_8c0._12_4_;
    auVar54._12_4_ = fVar418 * fVar276;
    fVar419 = local_8c0._16_4_;
    auVar54._16_4_ = fVar419 * fVar279;
    fVar420 = local_8c0._20_4_;
    auVar54._20_4_ = fVar420 * fVar311;
    fVar421 = local_8c0._24_4_;
    auVar54._24_4_ = fVar421 * fVar34;
    auVar54._28_4_ = auVar383._28_4_;
    fVar195 = auVar171._0_4_;
    fVar228 = auVar171._4_4_;
    auVar55._4_4_ = fVar386 * fVar228;
    auVar55._0_4_ = fVar376 * fVar195;
    fVar251 = auVar171._8_4_;
    auVar55._8_4_ = fVar387 * fVar251;
    fVar269 = auVar171._12_4_;
    auVar55._12_4_ = fVar388 * fVar269;
    fVar296 = auVar171._16_4_;
    auVar55._16_4_ = fVar389 * fVar296;
    fVar354 = auVar171._20_4_;
    auVar55._20_4_ = fVar390 * fVar354;
    fVar36 = auVar171._24_4_;
    auVar55._24_4_ = fVar391 * fVar36;
    auVar55._28_4_ = fVar405;
    auVar383 = vsubps_avx(auVar55,auVar54);
    auVar171 = vperm2f128_avx(_local_940,_local_940,1);
    auVar171 = vshufps_avx(auVar171,_local_940,0x30);
    local_880 = vshufps_avx(_local_940,auVar171,0x29);
    fVar223 = local_880._0_4_;
    fVar245 = local_880._4_4_;
    auVar56._4_4_ = fVar386 * fVar245;
    auVar56._0_4_ = fVar376 * fVar223;
    fVar268 = local_880._8_4_;
    auVar56._8_4_ = fVar387 * fVar268;
    fVar271 = local_880._12_4_;
    auVar56._12_4_ = fVar388 * fVar271;
    fVar299 = local_880._16_4_;
    auVar56._16_4_ = fVar389 * fVar299;
    fVar392 = local_880._20_4_;
    auVar56._20_4_ = fVar390 * fVar392;
    fVar37 = local_880._24_4_;
    auVar56._24_4_ = fVar391 * fVar37;
    auVar56._28_4_ = auVar171._28_4_;
    auVar57._4_4_ = fVar416 * fVar227;
    auVar57._0_4_ = fVar406 * fVar105;
    auVar57._8_4_ = fVar417 * fVar250;
    auVar57._12_4_ = fVar418 * fVar278;
    auVar57._16_4_ = fVar419 * fVar281;
    auVar57._20_4_ = fVar420 * fVar330;
    uVar96 = local_8c0._28_4_;
    auVar57._24_4_ = fVar421 * fVar35;
    auVar57._28_4_ = uVar96;
    auVar171 = vsubps_avx(auVar57,auVar56);
    auVar58._4_4_ = fVar227 * fVar228;
    auVar58._0_4_ = fVar105 * fVar195;
    auVar58._8_4_ = fVar250 * fVar251;
    auVar58._12_4_ = fVar278 * fVar269;
    auVar58._16_4_ = fVar281 * fVar296;
    auVar58._20_4_ = fVar330 * fVar354;
    auVar58._24_4_ = fVar35 * fVar36;
    auVar58._28_4_ = uVar96;
    auVar59._4_4_ = fVar245 * fVar226;
    auVar59._0_4_ = fVar223 * fVar222;
    auVar59._8_4_ = fVar268 * fVar249;
    auVar59._12_4_ = fVar271 * fVar276;
    auVar59._16_4_ = fVar299 * fVar279;
    auVar59._20_4_ = fVar392 * fVar311;
    auVar59._24_4_ = fVar37 * fVar34;
    auVar59._28_4_ = auVar424._28_4_;
    auVar43 = vsubps_avx(auVar59,auVar58);
    auVar60._4_4_ =
         (auVar415._4_4_ * auVar415._4_4_ +
         auVar31._4_4_ * auVar31._4_4_ + auVar32._4_4_ * auVar32._4_4_) * fVar273;
    auVar60._0_4_ =
         (auVar415._0_4_ * auVar415._0_4_ +
         auVar31._0_4_ * auVar31._0_4_ + auVar32._0_4_ * auVar32._0_4_) * fVar274;
    auVar60._8_4_ =
         (auVar415._8_4_ * auVar415._8_4_ +
         auVar31._8_4_ * auVar31._8_4_ + auVar32._8_4_ * auVar32._8_4_) * fVar275;
    auVar60._12_4_ =
         (auVar415._12_4_ * auVar415._12_4_ +
         auVar31._12_4_ * auVar31._12_4_ + auVar32._12_4_ * auVar32._12_4_) * fVar277;
    auVar60._16_4_ =
         (auVar415._16_4_ * auVar415._16_4_ +
         auVar31._16_4_ * auVar31._16_4_ + auVar32._16_4_ * auVar32._16_4_) * fVar302;
    auVar60._20_4_ =
         (auVar415._20_4_ * auVar415._20_4_ +
         auVar31._20_4_ * auVar31._20_4_ + auVar32._20_4_ * auVar32._20_4_) * fVar305;
    auVar60._24_4_ =
         (auVar415._24_4_ * auVar415._24_4_ +
         auVar31._24_4_ * auVar31._24_4_ + auVar32._24_4_ * auVar32._24_4_) * fVar308;
    auVar60._28_4_ = auVar415._28_4_ + auVar31._28_4_ + fVar280;
    auVar61._4_4_ =
         (auVar383._4_4_ * auVar383._4_4_ +
         auVar171._4_4_ * auVar171._4_4_ + auVar43._4_4_ * auVar43._4_4_) * fVar273;
    auVar61._0_4_ =
         (auVar383._0_4_ * auVar383._0_4_ +
         auVar171._0_4_ * auVar171._0_4_ + auVar43._0_4_ * auVar43._0_4_) * fVar274;
    auVar61._8_4_ =
         (auVar383._8_4_ * auVar383._8_4_ +
         auVar171._8_4_ * auVar171._8_4_ + auVar43._8_4_ * auVar43._8_4_) * fVar275;
    auVar61._12_4_ =
         (auVar383._12_4_ * auVar383._12_4_ +
         auVar171._12_4_ * auVar171._12_4_ + auVar43._12_4_ * auVar43._12_4_) * fVar277;
    auVar61._16_4_ =
         (auVar383._16_4_ * auVar383._16_4_ +
         auVar171._16_4_ * auVar171._16_4_ + auVar43._16_4_ * auVar43._16_4_) * fVar302;
    auVar61._20_4_ =
         (auVar383._20_4_ * auVar383._20_4_ +
         auVar171._20_4_ * auVar171._20_4_ + auVar43._20_4_ * auVar43._20_4_) * fVar305;
    auVar61._24_4_ =
         (auVar383._24_4_ * auVar383._24_4_ +
         auVar171._24_4_ * auVar171._24_4_ + auVar43._24_4_ * auVar43._24_4_) * fVar308;
    auVar61._28_4_ = auVar384._28_4_ + auVar117._28_4_;
    auVar117 = vmaxps_avx(auVar60,auVar61);
    auVar171 = vperm2f128_avx(local_720,local_720,1);
    auVar171 = vshufps_avx(auVar171,local_720,0x30);
    auVar415 = vshufps_avx(local_720,auVar171,0x29);
    auVar122._0_4_ = (float)local_720._0_4_ + fVar104;
    auVar122._4_4_ = local_720._4_4_ + fVar246;
    auVar122._8_4_ = local_720._8_4_ + fVar248;
    auVar122._12_4_ = local_720._12_4_ + fVar272;
    auVar122._16_4_ = local_720._16_4_ + fVar224;
    auVar122._20_4_ = local_720._20_4_ + fVar225;
    auVar122._24_4_ = local_720._24_4_ + fVar247;
    auVar122._28_4_ = local_720._28_4_ + fVar270;
    auVar171 = vmaxps_avx(local_720,auVar122);
    auVar383 = vmaxps_avx(auVar187,auVar415);
    auVar171 = vmaxps_avx(auVar171,auVar383);
    auVar383 = vrsqrtps_avx(auVar186);
    fVar280 = auVar383._0_4_;
    fVar224 = auVar383._4_4_;
    fVar104 = auVar383._8_4_;
    fVar225 = auVar383._12_4_;
    fVar246 = auVar383._16_4_;
    fVar247 = auVar383._20_4_;
    fVar248 = auVar383._24_4_;
    local_380 = fVar280 * 1.5 + fVar280 * fVar280 * fVar280 * auVar186._0_4_ * -0.5;
    fStack_37c = fVar224 * 1.5 + fVar224 * fVar224 * fVar224 * auVar186._4_4_ * -0.5;
    fStack_378 = fVar104 * 1.5 + fVar104 * fVar104 * fVar104 * auVar186._8_4_ * -0.5;
    fStack_374 = fVar225 * 1.5 + fVar225 * fVar225 * fVar225 * auVar186._12_4_ * -0.5;
    fStack_370 = fVar246 * 1.5 + fVar246 * fVar246 * fVar246 * auVar186._16_4_ * -0.5;
    fStack_36c = fVar247 * 1.5 + fVar247 * fVar247 * fVar247 * auVar186._20_4_ * -0.5;
    fStack_368 = fVar248 * 1.5 + fVar248 * fVar248 * fVar248 * auVar186._24_4_ * -0.5;
    auVar31 = vsubps_avx(ZEXT832(0) << 0x20,auVar424);
    auVar32 = vsubps_avx(ZEXT832(0) << 0x20,_local_5c0);
    fVar224 = auVar32._0_4_;
    fVar246 = auVar32._4_4_;
    fVar270 = auVar32._8_4_;
    fVar273 = auVar32._12_4_;
    fVar302 = auVar32._16_4_;
    fVar405 = auVar32._20_4_;
    fVar38 = auVar32._24_4_;
    fVar104 = auVar31._0_4_;
    fVar247 = auVar31._4_4_;
    fVar272 = auVar31._8_4_;
    fVar275 = auVar31._12_4_;
    fVar305 = auVar31._16_4_;
    fVar422 = auVar31._20_4_;
    fVar39 = auVar31._24_4_;
    auVar384 = vsubps_avx(ZEXT832(0) << 0x20,auVar410);
    fVar225 = auVar384._0_4_;
    fVar248 = auVar384._4_4_;
    fVar274 = auVar384._8_4_;
    fVar277 = auVar384._12_4_;
    fVar308 = auVar384._16_4_;
    fVar33 = auVar384._20_4_;
    fVar40 = auVar384._24_4_;
    auVar412._0_4_ =
         (float)local_780._0_4_ * fVar225 +
         (float)local_8e0._0_4_ * fVar104 + (float)local_740._0_4_ * fVar224;
    auVar412._4_4_ =
         (float)local_780._4_4_ * fVar248 +
         (float)local_8e0._4_4_ * fVar247 + (float)local_740._4_4_ * fVar246;
    auVar412._8_4_ = fStack_778 * fVar274 + fStack_8d8 * fVar272 + fStack_738 * fVar270;
    auVar412._12_4_ = fStack_774 * fVar277 + fStack_8d4 * fVar275 + fStack_734 * fVar273;
    auVar412._16_4_ = fStack_770 * fVar308 + fStack_8d0 * fVar305 + fStack_730 * fVar302;
    auVar412._20_4_ = fStack_76c * fVar33 + fStack_8cc * fVar422 + fStack_72c * fVar405;
    auVar412._24_4_ = fStack_768 * fVar40 + fStack_8c8 * fVar39 + fStack_728 * fVar38;
    auVar412._28_4_ = auVar424._28_4_ + auVar43._28_4_ + 1.5;
    auVar425._0_4_ = fVar225 * fVar225 + fVar104 * fVar104 + fVar224 * fVar224;
    auVar425._4_4_ = fVar248 * fVar248 + fVar247 * fVar247 + fVar246 * fVar246;
    auVar425._8_4_ = fVar274 * fVar274 + fVar272 * fVar272 + fVar270 * fVar270;
    auVar425._12_4_ = fVar277 * fVar277 + fVar275 * fVar275 + fVar273 * fVar273;
    auVar425._16_4_ = fVar308 * fVar308 + fVar305 * fVar305 + fVar302 * fVar302;
    auVar425._20_4_ = fVar33 * fVar33 + fVar422 * fVar422 + fVar405 * fVar405;
    auVar425._24_4_ = fVar40 * fVar40 + fVar39 * fVar39 + fVar38 * fVar38;
    auVar425._28_4_ = fStack_5a4 + fStack_5a4 + auVar424._28_4_;
    local_4a0 = (float)local_780._0_4_ * fVar105 * local_380 +
                local_380 * fVar222 * (float)local_8e0._0_4_ +
                (float)local_740._0_4_ * fVar376 * local_380;
    fStack_49c = (float)local_780._4_4_ * fVar227 * fStack_37c +
                 fStack_37c * fVar226 * (float)local_8e0._4_4_ +
                 (float)local_740._4_4_ * fVar386 * fStack_37c;
    fStack_498 = fStack_778 * fVar250 * fStack_378 +
                 fStack_378 * fVar249 * fStack_8d8 + fStack_738 * fVar387 * fStack_378;
    fStack_494 = fStack_774 * fVar278 * fStack_374 +
                 fStack_374 * fVar276 * fStack_8d4 + fStack_734 * fVar388 * fStack_374;
    fStack_490 = fStack_770 * fVar281 * fStack_370 +
                 fStack_370 * fVar279 * fStack_8d0 + fStack_730 * fVar389 * fStack_370;
    fStack_48c = fStack_76c * fVar330 * fStack_36c +
                 fStack_36c * fVar311 * fStack_8cc + fStack_72c * fVar390 * fStack_36c;
    fStack_488 = fStack_768 * fVar35 * fStack_368 +
                 fStack_368 * fVar34 * fStack_8c8 + fStack_728 * fVar391 * fStack_368;
    fVar280 = fStack_764 + fStack_8c4 + 0.0;
    fVar315 = fVar225 * fVar105 * local_380 +
              local_380 * fVar222 * fVar104 + fVar376 * local_380 * fVar224;
    fVar326 = fVar248 * fVar227 * fStack_37c +
              fStack_37c * fVar226 * fVar247 + fVar386 * fStack_37c * fVar246;
    fVar328 = fVar274 * fVar250 * fStack_378 +
              fStack_378 * fVar249 * fVar272 + fVar387 * fStack_378 * fVar270;
    fVar332 = fVar277 * fVar278 * fStack_374 +
              fStack_374 * fVar276 * fVar275 + fVar388 * fStack_374 * fVar273;
    fVar335 = fVar308 * fVar281 * fStack_370 +
              fStack_370 * fVar279 * fVar305 + fVar389 * fStack_370 * fVar302;
    fVar338 = fVar33 * fVar330 * fStack_36c +
              fStack_36c * fVar311 * fVar422 + fVar390 * fStack_36c * fVar405;
    fVar341 = fVar40 * fVar35 * fStack_368 +
              fStack_368 * fVar34 * fVar39 + fVar391 * fStack_368 * fVar38;
    fVar343 = fStack_8c4 + fVar280;
    auVar62._4_4_ = fStack_49c * fVar326;
    auVar62._0_4_ = local_4a0 * fVar315;
    auVar62._8_4_ = fStack_498 * fVar328;
    auVar62._12_4_ = fStack_494 * fVar332;
    auVar62._16_4_ = fStack_490 * fVar335;
    auVar62._20_4_ = fStack_48c * fVar338;
    auVar62._24_4_ = fStack_488 * fVar341;
    auVar62._28_4_ = fVar280;
    auVar43 = vsubps_avx(auVar412,auVar62);
    auVar63._4_4_ = fVar326 * fVar326;
    auVar63._0_4_ = fVar315 * fVar315;
    auVar63._8_4_ = fVar328 * fVar328;
    auVar63._12_4_ = fVar332 * fVar332;
    auVar63._16_4_ = fVar335 * fVar335;
    auVar63._20_4_ = fVar338 * fVar338;
    auVar63._24_4_ = fVar341 * fVar341;
    auVar63._28_4_ = fStack_8c4;
    auVar118 = vsubps_avx(auVar425,auVar63);
    local_520 = vsqrtps_avx(auVar117);
    fVar280 = (local_520._0_4_ + auVar171._0_4_) * 1.0000002;
    fVar134 = (local_520._4_4_ + auVar171._4_4_) * 1.0000002;
    fVar136 = (local_520._8_4_ + auVar171._8_4_) * 1.0000002;
    fVar138 = (local_520._12_4_ + auVar171._12_4_) * 1.0000002;
    fVar139 = (local_520._16_4_ + auVar171._16_4_) * 1.0000002;
    fVar140 = (local_520._20_4_ + auVar171._20_4_) * 1.0000002;
    fVar141 = (local_520._24_4_ + auVar171._24_4_) * 1.0000002;
    auVar64._4_4_ = fVar134 * fVar134;
    auVar64._0_4_ = fVar280 * fVar280;
    auVar64._8_4_ = fVar136 * fVar136;
    auVar64._12_4_ = fVar138 * fVar138;
    auVar64._16_4_ = fVar139 * fVar139;
    auVar64._20_4_ = fVar140 * fVar140;
    auVar64._24_4_ = fVar141 * fVar141;
    auVar64._28_4_ = local_520._28_4_ + auVar171._28_4_;
    fVar363 = auVar43._0_4_ + auVar43._0_4_;
    fVar375 = auVar43._4_4_ + auVar43._4_4_;
    local_900._0_8_ = CONCAT44(fVar375,fVar363);
    local_900._8_4_ = auVar43._8_4_ + auVar43._8_4_;
    local_900._12_4_ = auVar43._12_4_ + auVar43._12_4_;
    local_900._16_4_ = auVar43._16_4_ + auVar43._16_4_;
    local_900._20_4_ = auVar43._20_4_ + auVar43._20_4_;
    local_900._24_4_ = auVar43._24_4_ + auVar43._24_4_;
    local_900._28_4_ = auVar43._28_4_ + auVar43._28_4_;
    auVar171 = vsubps_avx(auVar118,auVar64);
    local_3a0._4_4_ = fStack_49c * fStack_49c;
    local_3a0._0_4_ = local_4a0 * local_4a0;
    local_3a0._8_4_ = fStack_498 * fStack_498;
    local_3a0._12_4_ = fStack_494 * fStack_494;
    local_3a0._16_4_ = fStack_490 * fStack_490;
    local_3a0._20_4_ = fStack_48c * fStack_48c;
    local_3a0._24_4_ = fStack_488 * fStack_488;
    local_3a0._28_4_ = local_540._28_4_;
    auVar43 = vsubps_avx(local_2c0,local_3a0);
    local_5a0._4_4_ = fVar375 * fVar375;
    local_5a0._0_4_ = fVar363 * fVar363;
    fStack_598 = local_900._8_4_ * local_900._8_4_;
    fStack_594 = local_900._12_4_ * local_900._12_4_;
    fStack_590 = local_900._16_4_ * local_900._16_4_;
    fStack_58c = local_900._20_4_ * local_900._20_4_;
    fStack_588 = local_900._24_4_ * local_900._24_4_;
    unique0x100124d4 = 0x3f800002;
    fVar134 = auVar43._0_4_;
    local_500._0_4_ = fVar134 * 4.0;
    fVar136 = auVar43._4_4_;
    local_500._4_4_ = fVar136 * 4.0;
    fVar138 = auVar43._8_4_;
    fStack_4f8 = fVar138 * 4.0;
    fVar139 = auVar43._12_4_;
    fStack_4f4 = fVar139 * 4.0;
    fVar140 = auVar43._16_4_;
    fStack_4f0 = fVar140 * 4.0;
    fVar141 = auVar43._20_4_;
    fStack_4ec = fVar141 * 4.0;
    fVar362 = auVar43._24_4_;
    fStack_4e8 = fVar362 * 4.0;
    uStack_4e4 = 0x40800000;
    auVar65._4_4_ = auVar171._4_4_ * (float)local_500._4_4_;
    auVar65._0_4_ = auVar171._0_4_ * (float)local_500._0_4_;
    auVar65._8_4_ = auVar171._8_4_ * fStack_4f8;
    auVar65._12_4_ = auVar171._12_4_ * fStack_4f4;
    auVar65._16_4_ = auVar171._16_4_ * fStack_4f0;
    auVar65._20_4_ = auVar171._20_4_ * fStack_4ec;
    auVar65._24_4_ = auVar171._24_4_ * fStack_4e8;
    auVar65._28_4_ = 0x40800000;
    auVar119 = vsubps_avx(_local_5a0,auVar65);
    auVar117 = vcmpps_avx(auVar119,ZEXT832(0) << 0x20,5);
    auVar295 = ZEXT3264(auVar117);
    fVar280 = auVar43._28_4_;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0x7f,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0xbf,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
    {
      auVar123._8_4_ = 0x7f800000;
      auVar123._0_8_ = 0x7f8000007f800000;
      auVar123._12_4_ = 0x7f800000;
      auVar123._16_4_ = 0x7f800000;
      auVar123._20_4_ = 0x7f800000;
      auVar123._24_4_ = 0x7f800000;
      auVar123._28_4_ = 0x7f800000;
      auVar426._8_4_ = 0xff800000;
      auVar426._0_8_ = 0xff800000ff800000;
      auVar426._12_4_ = 0xff800000;
      auVar426._16_4_ = 0xff800000;
      auVar426._20_4_ = 0xff800000;
      auVar426._24_4_ = 0xff800000;
      auVar426._28_4_ = 0xff800000;
    }
    else {
      auVar160 = vcmpps_avx(auVar119,ZEXT832(0) << 0x20,5);
      auVar161 = vsqrtps_avx(auVar119);
      auVar289._0_4_ = fVar134 + fVar134;
      auVar289._4_4_ = fVar136 + fVar136;
      auVar289._8_4_ = fVar138 + fVar138;
      auVar289._12_4_ = fVar139 + fVar139;
      auVar289._16_4_ = fVar140 + fVar140;
      auVar289._20_4_ = fVar141 + fVar141;
      auVar289._24_4_ = fVar362 + fVar362;
      auVar289._28_4_ = fVar280 + fVar280;
      auVar119 = vrcpps_avx(auVar289);
      fVar283 = auVar119._0_4_;
      fVar298 = auVar119._4_4_;
      auVar66._4_4_ = auVar289._4_4_ * fVar298;
      auVar66._0_4_ = auVar289._0_4_ * fVar283;
      fVar301 = auVar119._8_4_;
      auVar66._8_4_ = auVar289._8_4_ * fVar301;
      fVar304 = auVar119._12_4_;
      auVar66._12_4_ = auVar289._12_4_ * fVar304;
      fVar307 = auVar119._16_4_;
      auVar66._16_4_ = auVar289._16_4_ * fVar307;
      fVar310 = auVar119._20_4_;
      auVar66._20_4_ = auVar289._20_4_ * fVar310;
      fVar313 = auVar119._24_4_;
      auVar66._24_4_ = auVar289._24_4_ * fVar313;
      auVar66._28_4_ = auVar289._28_4_;
      auVar352._8_4_ = 0x3f800000;
      auVar352._0_8_ = 0x3f8000003f800000;
      auVar352._12_4_ = 0x3f800000;
      auVar352._16_4_ = 0x3f800000;
      auVar352._20_4_ = 0x3f800000;
      auVar352._24_4_ = 0x3f800000;
      auVar352._28_4_ = 0x3f800000;
      auVar119 = vsubps_avx(auVar352,auVar66);
      fVar283 = fVar283 + fVar283 * auVar119._0_4_;
      fVar298 = fVar298 + fVar298 * auVar119._4_4_;
      fVar301 = fVar301 + fVar301 * auVar119._8_4_;
      fVar304 = fVar304 + fVar304 * auVar119._12_4_;
      fVar307 = fVar307 + fVar307 * auVar119._16_4_;
      fVar310 = fVar310 + fVar310 * auVar119._20_4_;
      fVar313 = fVar313 + fVar313 * auVar119._24_4_;
      auVar323._0_8_ = CONCAT44(fVar375,fVar363) ^ 0x8000000080000000;
      auVar323._8_4_ = -local_900._8_4_;
      auVar323._12_4_ = -local_900._12_4_;
      auVar323._16_4_ = -local_900._16_4_;
      auVar323._20_4_ = -local_900._20_4_;
      auVar323._24_4_ = -local_900._24_4_;
      auVar323._28_4_ = -local_900._28_4_;
      auVar119 = vsubps_avx(auVar323,auVar161);
      fVar363 = auVar119._0_4_ * fVar283;
      fVar375 = auVar119._4_4_ * fVar298;
      auVar67._4_4_ = fVar375;
      auVar67._0_4_ = fVar363;
      fVar329 = auVar119._8_4_ * fVar301;
      auVar67._8_4_ = fVar329;
      fVar333 = auVar119._12_4_ * fVar304;
      auVar67._12_4_ = fVar333;
      fVar336 = auVar119._16_4_ * fVar307;
      auVar67._16_4_ = fVar336;
      fVar339 = auVar119._20_4_ * fVar310;
      auVar67._20_4_ = fVar339;
      fVar342 = auVar119._24_4_ * fVar313;
      auVar67._24_4_ = fVar342;
      auVar67._28_4_ = auVar119._28_4_;
      auVar119 = vsubps_avx(auVar161,local_900);
      fVar283 = auVar119._0_4_ * fVar283;
      fVar298 = auVar119._4_4_ * fVar298;
      auVar68._4_4_ = fVar298;
      auVar68._0_4_ = fVar283;
      fVar301 = auVar119._8_4_ * fVar301;
      auVar68._8_4_ = fVar301;
      fVar304 = auVar119._12_4_ * fVar304;
      auVar68._12_4_ = fVar304;
      fVar307 = auVar119._16_4_ * fVar307;
      auVar68._16_4_ = fVar307;
      fVar310 = auVar119._20_4_ * fVar310;
      auVar68._20_4_ = fVar310;
      fVar313 = auVar119._24_4_ * fVar313;
      auVar68._24_4_ = fVar313;
      auVar68._28_4_ = auVar119._28_4_;
      local_600._4_4_ = fStack_37c * (fVar326 + fStack_49c * fVar375);
      local_600._0_4_ = local_380 * (fVar315 + local_4a0 * fVar363);
      fStack_5f8 = fStack_378 * (fVar328 + fStack_498 * fVar329);
      fStack_5f4 = fStack_374 * (fVar332 + fStack_494 * fVar333);
      fStack_5f0 = fStack_370 * (fVar335 + fStack_490 * fVar336);
      fStack_5ec = fStack_36c * (fVar338 + fStack_48c * fVar339);
      fStack_5e8 = fStack_368 * (fVar341 + fStack_488 * fVar342);
      fStack_5e4 = local_900._28_4_;
      auVar370._8_4_ = 0x7fffffff;
      auVar370._0_8_ = 0x7fffffff7fffffff;
      auVar370._12_4_ = 0x7fffffff;
      auVar370._16_4_ = 0x7fffffff;
      auVar370._20_4_ = 0x7fffffff;
      auVar370._24_4_ = 0x7fffffff;
      auVar370._28_4_ = 0x7fffffff;
      auVar119 = vandps_avx(local_3a0,auVar370);
      auVar119 = vmaxps_avx(local_480,auVar119);
      auVar69._4_4_ = auVar119._4_4_ * 1.9073486e-06;
      auVar69._0_4_ = auVar119._0_4_ * 1.9073486e-06;
      auVar69._8_4_ = auVar119._8_4_ * 1.9073486e-06;
      auVar69._12_4_ = auVar119._12_4_ * 1.9073486e-06;
      auVar69._16_4_ = auVar119._16_4_ * 1.9073486e-06;
      auVar69._20_4_ = auVar119._20_4_ * 1.9073486e-06;
      auVar69._24_4_ = auVar119._24_4_ * 1.9073486e-06;
      auVar69._28_4_ = auVar119._28_4_;
      auVar119 = vandps_avx(auVar43,auVar370);
      auVar119 = vcmpps_avx(auVar119,auVar69,1);
      auVar371._8_4_ = 0x7f800000;
      auVar371._0_8_ = 0x7f8000007f800000;
      auVar371._12_4_ = 0x7f800000;
      auVar371._16_4_ = 0x7f800000;
      auVar371._20_4_ = 0x7f800000;
      auVar371._24_4_ = 0x7f800000;
      auVar371._28_4_ = 0x7f800000;
      auVar123 = vblendvps_avx(auVar371,auVar67,auVar160);
      local_5e0 = auVar123;
      local_360 = local_380 * (fVar315 + local_4a0 * fVar283);
      fStack_35c = fStack_37c * (fVar326 + fStack_49c * fVar298);
      fStack_358 = fStack_378 * (fVar328 + fStack_498 * fVar301);
      fStack_354 = fStack_374 * (fVar332 + fStack_494 * fVar304);
      fStack_350 = fStack_370 * (fVar335 + fStack_490 * fVar307);
      fStack_34c = fStack_36c * (fVar338 + fStack_48c * fVar310);
      fStack_348 = fStack_368 * (fVar341 + fStack_488 * fVar313);
      uStack_344 = auVar123._28_4_;
      auVar290._8_4_ = 0xff800000;
      auVar290._0_8_ = 0xff800000ff800000;
      auVar290._12_4_ = 0xff800000;
      auVar290._16_4_ = 0xff800000;
      auVar290._20_4_ = 0xff800000;
      auVar290._24_4_ = 0xff800000;
      auVar290._28_4_ = 0xff800000;
      auVar426 = vblendvps_avx(auVar290,auVar68,auVar160);
      auVar161 = auVar160 & auVar119;
      if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar161 >> 0x7f,0) == '\0') &&
            (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar161 >> 0xbf,0) == '\0') &&
          (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar161[0x1f]) {
        auVar295 = ZEXT3264(auVar117);
      }
      else {
        auVar117 = vandps_avx(auVar119,auVar160);
        auVar254 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar119 = vcmpps_avx(auVar171,ZEXT832(0) << 0x20,2);
        auVar431._8_4_ = 0xff800000;
        auVar431._0_8_ = 0xff800000ff800000;
        auVar431._12_4_ = 0xff800000;
        auVar431._16_4_ = 0xff800000;
        auVar431._20_4_ = 0xff800000;
        auVar431._24_4_ = 0xff800000;
        auVar431._28_4_ = 0xff800000;
        auVar414._8_4_ = 0x7f800000;
        auVar414._0_8_ = 0x7f8000007f800000;
        auVar414._12_4_ = 0x7f800000;
        auVar414._16_4_ = 0x7f800000;
        auVar414._20_4_ = 0x7f800000;
        auVar414._24_4_ = 0x7f800000;
        auVar414._28_4_ = 0x7f800000;
        auVar171 = vblendvps_avx(auVar414,auVar431,auVar119);
        auVar147 = vpmovsxwd_avx(auVar254);
        auVar254 = vpunpckhwd_avx(auVar254,auVar254);
        auVar267._16_16_ = auVar254;
        auVar267._0_16_ = auVar147;
        auVar123 = vblendvps_avx(auVar123,auVar171,auVar267);
        auVar171 = vblendvps_avx(auVar431,auVar414,auVar119);
        auVar426 = vblendvps_avx(auVar426,auVar171,auVar267);
        auVar171 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar130._0_4_ = auVar117._0_4_ ^ auVar171._0_4_;
        auVar130._4_4_ = auVar117._4_4_ ^ auVar171._4_4_;
        auVar130._8_4_ = auVar117._8_4_ ^ auVar171._8_4_;
        auVar130._12_4_ = auVar117._12_4_ ^ auVar171._12_4_;
        auVar130._16_4_ = auVar117._16_4_ ^ auVar171._16_4_;
        auVar130._20_4_ = auVar117._20_4_ ^ auVar171._20_4_;
        auVar130._24_4_ = auVar117._24_4_ ^ auVar171._24_4_;
        auVar130._28_4_ = auVar117._28_4_ ^ auVar171._28_4_;
        auVar117 = vorps_avx(auVar119,auVar130);
        auVar117 = vandps_avx(auVar160,auVar117);
        auVar295 = ZEXT3264(auVar117);
      }
    }
    auVar117 = local_440 & auVar295._0_32_;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0x7f,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0xbf,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
    {
LAB_0110fa35:
      auVar433 = ZEXT3264(local_9c0);
      auVar398 = ZEXT3264(local_9a0);
      auVar385 = ZEXT3264(local_980);
      auVar295 = ZEXT3264(local_a00);
      auVar353 = ZEXT3264(local_a20);
    }
    else {
      fStack_484 = fStack_764 + fStack_8c4 + 0.0;
      fStack_364 = auVar383._28_4_ + auVar186._28_4_;
      auVar147 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      local_5e0._0_16_ = auVar147;
      auVar254 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_810._0_4_));
      auVar254 = vshufps_avx(auVar254,auVar254,0);
      auVar262._16_16_ = auVar254;
      auVar262._0_16_ = auVar254;
      auVar119 = vminps_avx(auVar262,auVar426);
      fVar310 = auVar32._28_4_;
      auVar164._0_4_ =
           (float)local_780._0_4_ * fVar282 +
           fVar314 * (float)local_8e0._0_4_ + (float)local_740._0_4_ * fVar393;
      auVar164._4_4_ =
           (float)local_780._4_4_ * fVar297 +
           fVar325 * (float)local_8e0._4_4_ + (float)local_740._4_4_ * fVar399;
      auVar164._8_4_ = fStack_778 * fVar300 + fVar327 * fStack_8d8 + fStack_738 * fVar400;
      auVar164._12_4_ = fStack_774 * fVar303 + fVar331 * fStack_8d4 + fStack_734 * fVar401;
      auVar164._16_4_ = fStack_770 * fVar306 + fVar334 * fStack_8d0 + fStack_730 * fVar402;
      auVar164._20_4_ = fStack_76c * fVar309 + fVar337 * fStack_8cc + fStack_72c * fVar403;
      auVar164._24_4_ = fStack_768 * fVar312 + fVar340 * fStack_8c8 + fStack_728 * fVar404;
      auVar164._28_4_ = fVar310 + auVar322._28_4_ + fVar310;
      auVar117 = vrcpps_avx(auVar164);
      fVar363 = auVar117._0_4_;
      fVar375 = auVar117._4_4_;
      auVar70._4_4_ = auVar164._4_4_ * fVar375;
      auVar70._0_4_ = auVar164._0_4_ * fVar363;
      fVar283 = auVar117._8_4_;
      auVar70._8_4_ = auVar164._8_4_ * fVar283;
      fVar298 = auVar117._12_4_;
      auVar70._12_4_ = auVar164._12_4_ * fVar298;
      fVar301 = auVar117._16_4_;
      auVar70._16_4_ = auVar164._16_4_ * fVar301;
      fVar304 = auVar117._20_4_;
      auVar70._20_4_ = auVar164._20_4_ * fVar304;
      fVar307 = auVar117._24_4_;
      auVar70._24_4_ = auVar164._24_4_ * fVar307;
      auVar70._28_4_ = auVar384._28_4_;
      auVar372._8_4_ = 0x3f800000;
      auVar372._0_8_ = 0x3f8000003f800000;
      auVar372._12_4_ = 0x3f800000;
      auVar372._16_4_ = 0x3f800000;
      auVar372._20_4_ = 0x3f800000;
      auVar372._24_4_ = 0x3f800000;
      auVar372._28_4_ = 0x3f800000;
      auVar383 = vsubps_avx(auVar372,auVar70);
      auVar324._8_4_ = 0x7fffffff;
      auVar324._0_8_ = 0x7fffffff7fffffff;
      auVar324._12_4_ = 0x7fffffff;
      auVar324._16_4_ = 0x7fffffff;
      auVar324._20_4_ = 0x7fffffff;
      auVar324._24_4_ = 0x7fffffff;
      auVar324._28_4_ = 0x7fffffff;
      auVar117 = vandps_avx(auVar164,auVar324);
      auVar361._8_4_ = 0x219392ef;
      auVar361._0_8_ = 0x219392ef219392ef;
      auVar361._12_4_ = 0x219392ef;
      auVar361._16_4_ = 0x219392ef;
      auVar361._20_4_ = 0x219392ef;
      auVar361._24_4_ = 0x219392ef;
      auVar361._28_4_ = 0x219392ef;
      auVar171 = vcmpps_avx(auVar117,auVar361,1);
      auVar71._4_4_ =
           (fVar375 + fVar375 * auVar383._4_4_) *
           -(fVar248 * fVar297 + fVar247 * fVar325 + fVar246 * fVar399);
      auVar71._0_4_ =
           (fVar363 + fVar363 * auVar383._0_4_) *
           -(fVar225 * fVar282 + fVar104 * fVar314 + fVar224 * fVar393);
      auVar71._8_4_ =
           (fVar283 + fVar283 * auVar383._8_4_) *
           -(fVar274 * fVar300 + fVar272 * fVar327 + fVar270 * fVar400);
      auVar71._12_4_ =
           (fVar298 + fVar298 * auVar383._12_4_) *
           -(fVar277 * fVar303 + fVar275 * fVar331 + fVar273 * fVar401);
      auVar71._16_4_ =
           (fVar301 + fVar301 * auVar383._16_4_) *
           -(fVar308 * fVar306 + fVar305 * fVar334 + fVar302 * fVar402);
      auVar71._20_4_ =
           (fVar304 + fVar304 * auVar383._20_4_) *
           -(fVar33 * fVar309 + fVar422 * fVar337 + fVar405 * fVar403);
      auVar71._24_4_ =
           (fVar307 + fVar307 * auVar383._24_4_) *
           -(fVar40 * fVar312 + fVar39 * fVar340 + fVar38 * fVar404);
      auVar71._28_4_ = -(fVar310 + auVar31._28_4_ + fVar310);
      auVar383 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar117 = vcmpps_avx(auVar164,auVar383,1);
      auVar117 = vorps_avx(auVar171,auVar117);
      auVar427._8_4_ = 0xff800000;
      auVar427._0_8_ = 0xff800000ff800000;
      auVar427._12_4_ = 0xff800000;
      auVar427._16_4_ = 0xff800000;
      auVar427._20_4_ = 0xff800000;
      auVar427._24_4_ = 0xff800000;
      auVar427._28_4_ = 0xff800000;
      auVar117 = vblendvps_avx(auVar71,auVar427,auVar117);
      auVar383 = vcmpps_avx(auVar164,auVar383,6);
      auVar171 = vorps_avx(auVar171,auVar383);
      auVar430._8_4_ = 0x7f800000;
      auVar430._0_8_ = 0x7f8000007f800000;
      auVar430._12_4_ = 0x7f800000;
      auVar430._16_4_ = 0x7f800000;
      auVar430._20_4_ = 0x7f800000;
      auVar430._24_4_ = 0x7f800000;
      auVar430._28_4_ = 0x7f800000;
      auVar171 = vblendvps_avx(auVar71,auVar430,auVar171);
      auVar383 = vmaxps_avx(local_320,auVar123);
      auVar383 = vmaxps_avx(auVar383,auVar117);
      auVar31 = vminps_avx(auVar119,auVar171);
      auVar384 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar117 = vsubps_avx(auVar384,auVar29);
      auVar171 = vsubps_avx(auVar384,local_a40);
      auVar72._4_4_ = auVar171._4_4_ * -fVar416;
      auVar72._0_4_ = auVar171._0_4_ * -fVar406;
      auVar72._8_4_ = auVar171._8_4_ * -fVar417;
      auVar72._12_4_ = auVar171._12_4_ * -fVar418;
      auVar72._16_4_ = auVar171._16_4_ * -fVar419;
      auVar72._20_4_ = auVar171._20_4_ * -fVar420;
      auVar72._24_4_ = auVar171._24_4_ * -fVar421;
      auVar72._28_4_ = auVar171._28_4_;
      auVar73._4_4_ = fVar228 * auVar117._4_4_;
      auVar73._0_4_ = fVar195 * auVar117._0_4_;
      auVar73._8_4_ = fVar251 * auVar117._8_4_;
      auVar73._12_4_ = fVar269 * auVar117._12_4_;
      auVar73._16_4_ = fVar296 * auVar117._16_4_;
      auVar73._20_4_ = fVar354 * auVar117._20_4_;
      auVar73._24_4_ = fVar36 * auVar117._24_4_;
      auVar73._28_4_ = auVar117._28_4_;
      auVar117 = vsubps_avx(auVar72,auVar73);
      auVar171 = vsubps_avx(auVar384,auVar30);
      auVar74._4_4_ = fVar245 * auVar171._4_4_;
      auVar74._0_4_ = fVar223 * auVar171._0_4_;
      auVar74._8_4_ = fVar268 * auVar171._8_4_;
      auVar74._12_4_ = fVar271 * auVar171._12_4_;
      auVar74._16_4_ = fVar299 * auVar171._16_4_;
      auVar74._20_4_ = fVar392 * auVar171._20_4_;
      uVar8 = auVar171._28_4_;
      auVar74._24_4_ = fVar37 * auVar171._24_4_;
      auVar74._28_4_ = uVar8;
      auVar29 = vsubps_avx(auVar117,auVar74);
      auVar75._4_4_ = (float)local_740._4_4_ * -fVar416;
      auVar75._0_4_ = (float)local_740._0_4_ * -fVar406;
      auVar75._8_4_ = fStack_738 * -fVar417;
      auVar75._12_4_ = fStack_734 * -fVar418;
      auVar75._16_4_ = fStack_730 * -fVar419;
      auVar75._20_4_ = fStack_72c * -fVar420;
      auVar75._24_4_ = fStack_728 * -fVar421;
      auVar75._28_4_ = uVar96 ^ 0x80000000;
      auVar413._8_4_ = 0x3f800000;
      auVar413._0_8_ = 0x3f8000003f800000;
      auVar413._12_4_ = 0x3f800000;
      auVar413._16_4_ = 0x3f800000;
      auVar413._20_4_ = 0x3f800000;
      auVar413._24_4_ = 0x3f800000;
      auVar413._28_4_ = 0x3f800000;
      auVar76._4_4_ = fVar228 * (float)local_8e0._4_4_;
      auVar76._0_4_ = fVar195 * (float)local_8e0._0_4_;
      auVar76._8_4_ = fVar251 * fStack_8d8;
      auVar76._12_4_ = fVar269 * fStack_8d4;
      auVar76._16_4_ = fVar296 * fStack_8d0;
      auVar76._20_4_ = fVar354 * fStack_8cc;
      auVar76._24_4_ = fVar36 * fStack_8c8;
      auVar76._28_4_ = uVar8;
      auVar117 = vsubps_avx(auVar75,auVar76);
      auVar77._4_4_ = (float)local_780._4_4_ * fVar245;
      auVar77._0_4_ = (float)local_780._0_4_ * fVar223;
      auVar77._8_4_ = fStack_778 * fVar268;
      auVar77._12_4_ = fStack_774 * fVar271;
      auVar77._16_4_ = fStack_770 * fVar299;
      auVar77._20_4_ = fStack_76c * fVar392;
      auVar77._24_4_ = fStack_768 * fVar37;
      auVar77._28_4_ = uVar8;
      auVar30 = vsubps_avx(auVar117,auVar77);
      auVar117 = vrcpps_avx(auVar30);
      fVar195 = auVar117._0_4_;
      fVar223 = auVar117._4_4_;
      auVar78._4_4_ = auVar30._4_4_ * fVar223;
      auVar78._0_4_ = auVar30._0_4_ * fVar195;
      fVar224 = auVar117._8_4_;
      auVar78._8_4_ = auVar30._8_4_ * fVar224;
      fVar104 = auVar117._12_4_;
      auVar78._12_4_ = auVar30._12_4_ * fVar104;
      fVar225 = auVar117._16_4_;
      auVar78._16_4_ = auVar30._16_4_ * fVar225;
      fVar228 = auVar117._20_4_;
      auVar78._20_4_ = auVar30._20_4_ * fVar228;
      fVar245 = auVar117._24_4_;
      auVar78._24_4_ = auVar30._24_4_ * fVar245;
      auVar78._28_4_ = fStack_764;
      auVar32 = vsubps_avx(auVar413,auVar78);
      auVar117 = vandps_avx(auVar30,auVar324);
      auVar171 = vcmpps_avx(auVar117,auVar361,1);
      auVar79._4_4_ = (fVar223 + fVar223 * auVar32._4_4_) * -auVar29._4_4_;
      auVar79._0_4_ = (fVar195 + fVar195 * auVar32._0_4_) * -auVar29._0_4_;
      auVar79._8_4_ = (fVar224 + fVar224 * auVar32._8_4_) * -auVar29._8_4_;
      auVar79._12_4_ = (fVar104 + fVar104 * auVar32._12_4_) * -auVar29._12_4_;
      auVar79._16_4_ = (fVar225 + fVar225 * auVar32._16_4_) * -auVar29._16_4_;
      auVar79._20_4_ = (fVar228 + fVar228 * auVar32._20_4_) * -auVar29._20_4_;
      auVar79._24_4_ = (fVar245 + fVar245 * auVar32._24_4_) * -auVar29._24_4_;
      auVar79._28_4_ = auVar29._28_4_ ^ 0x80000000;
      auVar117 = vcmpps_avx(auVar30,auVar384,1);
      auVar117 = vorps_avx(auVar171,auVar117);
      auVar117 = vblendvps_avx(auVar79,auVar427,auVar117);
      _local_9e0 = vmaxps_avx(auVar383,auVar117);
      auVar117 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,6);
      auVar117 = vorps_avx(auVar171,auVar117);
      auVar171 = vblendvps_avx(auVar79,auVar430,auVar117);
      auVar117 = vandps_avx(auVar295._0_32_,local_440);
      local_3c0 = vminps_avx(auVar31,auVar171);
      auVar171 = vcmpps_avx(_local_9e0,local_3c0,2);
      auVar383 = auVar117 & auVar171;
      if ((((((((auVar383 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar383 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar383 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar383 >> 0x7f,0) == '\0') &&
            (auVar383 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar383 >> 0xbf,0) == '\0') &&
          (auVar383 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar383[0x1f]) goto LAB_0110fa35;
      auVar383 = vminps_avx(local_720,auVar122);
      auVar29 = vminps_avx(auVar187,auVar415);
      auVar383 = vminps_avx(auVar383,auVar29);
      auVar383 = vsubps_avx(auVar383,local_520);
      auVar117 = vandps_avx(auVar171,auVar117);
      auVar171 = vminps_avx(_local_600,auVar413);
      auVar171 = vmaxps_avx(auVar171,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar103 + fVar142 * (auVar171._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar133 + fVar173 * (auVar171._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar135 + fVar174 * (auVar171._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar137 + fVar175 * (auVar171._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar103 + fVar142 * (auVar171._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar133 + fVar173 * (auVar171._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar135 + fVar174 * (auVar171._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar137 + auVar171._28_4_ + 7.0;
      auVar91._4_4_ = fStack_35c;
      auVar91._0_4_ = local_360;
      auVar91._8_4_ = fStack_358;
      auVar91._12_4_ = fStack_354;
      auVar91._16_4_ = fStack_350;
      auVar91._20_4_ = fStack_34c;
      auVar91._24_4_ = fStack_348;
      auVar91._28_4_ = uStack_344;
      auVar171 = vminps_avx(auVar91,auVar413);
      auVar171 = vmaxps_avx(auVar171,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar103 + fVar142 * (auVar171._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar133 + fVar173 * (auVar171._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar135 + fVar174 * (auVar171._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar137 + fVar175 * (auVar171._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar103 + fVar142 * (auVar171._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar133 + fVar173 * (auVar171._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar135 + fVar174 * (auVar171._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar137 + auVar171._28_4_ + 7.0;
      auVar80._4_4_ = auVar383._4_4_ * 0.99999976;
      auVar80._0_4_ = auVar383._0_4_ * 0.99999976;
      auVar80._8_4_ = auVar383._8_4_ * 0.99999976;
      auVar80._12_4_ = auVar383._12_4_ * 0.99999976;
      auVar80._16_4_ = auVar383._16_4_ * 0.99999976;
      auVar80._20_4_ = auVar383._20_4_ * 0.99999976;
      auVar80._24_4_ = auVar383._24_4_ * 0.99999976;
      auVar80._28_4_ = 0x3f7ffffc;
      auVar171 = vmaxps_avx(ZEXT832(0) << 0x20,auVar80);
      auVar81._4_4_ = auVar171._4_4_ * auVar171._4_4_;
      auVar81._0_4_ = auVar171._0_4_ * auVar171._0_4_;
      auVar81._8_4_ = auVar171._8_4_ * auVar171._8_4_;
      auVar81._12_4_ = auVar171._12_4_ * auVar171._12_4_;
      auVar81._16_4_ = auVar171._16_4_ * auVar171._16_4_;
      auVar81._20_4_ = auVar171._20_4_ * auVar171._20_4_;
      auVar81._24_4_ = auVar171._24_4_ * auVar171._24_4_;
      auVar81._28_4_ = auVar171._28_4_;
      local_860 = vsubps_avx(auVar118,auVar81);
      auVar82._4_4_ = local_860._4_4_ * (float)local_500._4_4_;
      auVar82._0_4_ = local_860._0_4_ * (float)local_500._0_4_;
      auVar82._8_4_ = local_860._8_4_ * fStack_4f8;
      auVar82._12_4_ = local_860._12_4_ * fStack_4f4;
      auVar82._16_4_ = local_860._16_4_ * fStack_4f0;
      auVar82._20_4_ = local_860._20_4_ * fStack_4ec;
      auVar82._24_4_ = local_860._24_4_ * fStack_4e8;
      auVar82._28_4_ = auVar171._28_4_;
      auVar383 = vsubps_avx(_local_5a0,auVar82);
      auVar171 = vcmpps_avx(auVar383,ZEXT832(0) << 0x20,5);
      if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar171 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar171 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar171 >> 0x7f,0) == '\0') &&
            (auVar171 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar171 >> 0xbf,0) == '\0') &&
          (auVar171 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar171[0x1f]) {
        auVar187 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_7c0 = ZEXT832(0) << 0x20;
        _local_5a0 = ZEXT832(0) << 0x20;
        auVar213 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar239 = ZEXT828(0) << 0x20;
        auVar263._8_4_ = 0x7f800000;
        auVar263._0_8_ = 0x7f8000007f800000;
        auVar263._12_4_ = 0x7f800000;
        auVar263._16_4_ = 0x7f800000;
        auVar263._20_4_ = 0x7f800000;
        auVar263._24_4_ = 0x7f800000;
        auVar263._28_4_ = 0x7f800000;
        auVar291._8_4_ = 0xff800000;
        auVar291._0_8_ = 0xff800000ff800000;
        auVar291._12_4_ = 0xff800000;
        auVar291._16_4_ = 0xff800000;
        auVar291._20_4_ = 0xff800000;
        auVar291._24_4_ = 0xff800000;
        auVar291._28_4_ = 0xff800000;
        local_860 = auVar45;
        _local_7a0 = _local_7c0;
      }
      else {
        auVar187 = vsqrtps_avx(auVar383);
        auVar219._0_4_ = fVar134 + fVar134;
        auVar219._4_4_ = fVar136 + fVar136;
        auVar219._8_4_ = fVar138 + fVar138;
        auVar219._12_4_ = fVar139 + fVar139;
        auVar219._16_4_ = fVar140 + fVar140;
        auVar219._20_4_ = fVar141 + fVar141;
        auVar219._24_4_ = fVar362 + fVar362;
        auVar219._28_4_ = fVar280 + fVar280;
        auVar29 = vrcpps_avx(auVar219);
        fVar280 = auVar29._0_4_;
        fVar195 = auVar29._4_4_;
        auVar83._4_4_ = auVar219._4_4_ * fVar195;
        auVar83._0_4_ = auVar219._0_4_ * fVar280;
        fVar223 = auVar29._8_4_;
        auVar83._8_4_ = auVar219._8_4_ * fVar223;
        fVar224 = auVar29._12_4_;
        auVar83._12_4_ = auVar219._12_4_ * fVar224;
        fVar104 = auVar29._16_4_;
        auVar83._16_4_ = auVar219._16_4_ * fVar104;
        fVar225 = auVar29._20_4_;
        auVar83._20_4_ = auVar219._20_4_ * fVar225;
        fVar228 = auVar29._24_4_;
        auVar83._24_4_ = auVar219._24_4_ * fVar228;
        auVar83._28_4_ = auVar219._28_4_;
        auVar30 = vsubps_avx(auVar413,auVar83);
        fVar280 = fVar280 + fVar280 * auVar30._0_4_;
        fVar195 = fVar195 + fVar195 * auVar30._4_4_;
        fVar223 = fVar223 + fVar223 * auVar30._8_4_;
        fVar224 = fVar224 + fVar224 * auVar30._12_4_;
        fVar104 = fVar104 + fVar104 * auVar30._16_4_;
        fVar225 = fVar225 + fVar225 * auVar30._20_4_;
        fVar228 = fVar228 + fVar228 * auVar30._24_4_;
        fVar245 = auVar29._28_4_ + auVar30._28_4_;
        auVar241._0_8_ = local_900._0_8_ ^ 0x8000000080000000;
        auVar241._8_4_ = -local_900._8_4_;
        auVar241._12_4_ = -local_900._12_4_;
        auVar241._16_4_ = -local_900._16_4_;
        auVar241._20_4_ = -local_900._20_4_;
        auVar241._24_4_ = -local_900._24_4_;
        auVar241._28_4_ = -local_900._28_4_;
        auVar29 = vsubps_avx(auVar241,auVar187);
        fVar246 = auVar29._0_4_ * fVar280;
        fVar247 = auVar29._4_4_ * fVar195;
        auVar84._4_4_ = fVar247;
        auVar84._0_4_ = fVar246;
        fVar248 = auVar29._8_4_ * fVar223;
        auVar84._8_4_ = fVar248;
        fVar251 = auVar29._12_4_ * fVar224;
        auVar84._12_4_ = fVar251;
        fVar268 = auVar29._16_4_ * fVar104;
        auVar84._16_4_ = fVar268;
        fVar270 = auVar29._20_4_ * fVar225;
        auVar84._20_4_ = fVar270;
        fVar272 = auVar29._24_4_ * fVar228;
        auVar84._24_4_ = fVar272;
        auVar84._28_4_ = 0x3f800000;
        auVar187 = vsubps_avx(auVar187,local_900);
        auVar353._0_4_ = auVar187._0_4_ * fVar280;
        auVar353._4_4_ = auVar187._4_4_ * fVar195;
        auVar353._8_4_ = auVar187._8_4_ * fVar223;
        auVar353._12_4_ = auVar187._12_4_ * fVar224;
        auVar353._16_4_ = auVar187._16_4_ * fVar104;
        auVar353._20_4_ = auVar187._20_4_ * fVar225;
        auVar353._28_36_ = auVar295._28_36_;
        auVar353._24_4_ = auVar187._24_4_ * fVar228;
        fVar280 = local_380 * (fVar246 * local_4a0 + fVar315);
        fVar195 = fStack_37c * (fVar247 * fStack_49c + fVar326);
        fVar223 = fStack_378 * (fVar248 * fStack_498 + fVar328);
        fVar224 = fStack_374 * (fVar251 * fStack_494 + fVar332);
        fVar104 = fStack_370 * (fVar268 * fStack_490 + fVar335);
        fVar225 = fStack_36c * (fVar270 * fStack_48c + fVar338);
        fVar228 = fStack_368 * (fVar272 * fStack_488 + fVar341);
        auVar188._0_4_ = auVar410._0_4_ + fVar105 * fVar280;
        auVar188._4_4_ = auVar410._4_4_ + fVar227 * fVar195;
        auVar188._8_4_ = auVar410._8_4_ + fVar250 * fVar223;
        auVar188._12_4_ = auVar410._12_4_ + fVar278 * fVar224;
        auVar188._16_4_ = auVar410._16_4_ + fVar281 * fVar104;
        auVar188._20_4_ = auVar410._20_4_ + fVar330 * fVar225;
        auVar188._24_4_ = auVar410._24_4_ + fVar35 * fVar228;
        auVar188._28_4_ = auVar410._28_4_ + auVar187._28_4_ + fVar343;
        auVar85._4_4_ = fVar247 * (float)local_780._4_4_;
        auVar85._0_4_ = fVar246 * (float)local_780._0_4_;
        auVar85._8_4_ = fVar248 * fStack_778;
        auVar85._12_4_ = fVar251 * fStack_774;
        auVar85._16_4_ = fVar268 * fStack_770;
        auVar85._20_4_ = fVar270 * fStack_76c;
        auVar85._24_4_ = fVar272 * fStack_768;
        auVar85._28_4_ = fVar245;
        auVar187 = vsubps_avx(auVar85,auVar188);
        auVar220._0_4_ = auVar424._0_4_ + fVar222 * fVar280;
        auVar220._4_4_ = auVar424._4_4_ + fVar226 * fVar195;
        auVar220._8_4_ = auVar424._8_4_ + fVar249 * fVar223;
        auVar220._12_4_ = auVar424._12_4_ + fVar276 * fVar224;
        auVar220._16_4_ = auVar424._16_4_ + fVar279 * fVar104;
        auVar220._20_4_ = auVar424._20_4_ + fVar311 * fVar225;
        auVar220._24_4_ = auVar424._24_4_ + fVar34 * fVar228;
        auVar220._28_4_ = auVar424._28_4_ + fVar245;
        auVar264._0_4_ = (float)local_8e0._0_4_ * fVar246;
        auVar264._4_4_ = (float)local_8e0._4_4_ * fVar247;
        auVar264._8_4_ = fStack_8d8 * fVar248;
        auVar264._12_4_ = fStack_8d4 * fVar251;
        auVar264._16_4_ = fStack_8d0 * fVar268;
        auVar264._20_4_ = fStack_8cc * fVar270;
        auVar264._24_4_ = fStack_8c8 * fVar272;
        auVar264._28_4_ = 0;
        _local_940 = vsubps_avx(auVar264,auVar220);
        auVar242._0_4_ = (float)local_5c0._0_4_ + fVar376 * fVar280;
        auVar242._4_4_ = (float)local_5c0._4_4_ + fVar386 * fVar195;
        auVar242._8_4_ = fStack_5b8 + fVar387 * fVar223;
        auVar242._12_4_ = fStack_5b4 + fVar388 * fVar224;
        auVar242._16_4_ = fStack_5b0 + fVar389 * fVar104;
        auVar242._20_4_ = fStack_5ac + fVar390 * fVar225;
        auVar242._24_4_ = fStack_5a8 + fVar391 * fVar228;
        auVar242._28_4_ = fStack_5a4 + auVar29._28_4_;
        auVar86._4_4_ = (float)local_740._4_4_ * fVar247;
        auVar86._0_4_ = (float)local_740._0_4_ * fVar246;
        auVar86._8_4_ = fStack_738 * fVar248;
        auVar86._12_4_ = fStack_734 * fVar251;
        auVar86._16_4_ = fStack_730 * fVar268;
        auVar86._20_4_ = fStack_72c * fVar270;
        auVar86._24_4_ = fStack_728 * fVar272;
        auVar86._28_4_ = 0;
        auVar29 = vsubps_avx(auVar86,auVar242);
        auVar239 = auVar29._0_28_;
        fVar280 = local_380 * (auVar353._0_4_ * local_4a0 + fVar315);
        fVar195 = fStack_37c * (auVar353._4_4_ * fStack_49c + fVar326);
        fVar223 = fStack_378 * (auVar353._8_4_ * fStack_498 + fVar328);
        fVar224 = fStack_374 * (auVar353._12_4_ * fStack_494 + fVar332);
        fVar104 = fStack_370 * (auVar353._16_4_ * fStack_490 + fVar335);
        fVar225 = fStack_36c * (auVar353._20_4_ * fStack_48c + fVar338);
        fVar228 = fStack_368 * (auVar353._24_4_ * fStack_488 + fVar341);
        auVar292._0_4_ = auVar410._0_4_ + fVar105 * fVar280;
        auVar292._4_4_ = auVar410._4_4_ + fVar227 * fVar195;
        auVar292._8_4_ = auVar410._8_4_ + fVar250 * fVar223;
        auVar292._12_4_ = auVar410._12_4_ + fVar278 * fVar224;
        auVar292._16_4_ = auVar410._16_4_ + fVar281 * fVar104;
        auVar292._20_4_ = auVar410._20_4_ + fVar330 * fVar225;
        auVar292._24_4_ = auVar410._24_4_ + fVar35 * fVar228;
        auVar292._28_4_ = auVar410._28_4_ + (float)local_580._28_4_;
        auVar87._4_4_ = auVar353._4_4_ * (float)local_780._4_4_;
        auVar87._0_4_ = auVar353._0_4_ * (float)local_780._0_4_;
        auVar87._8_4_ = auVar353._8_4_ * fStack_778;
        auVar87._12_4_ = auVar353._12_4_ * fStack_774;
        auVar87._16_4_ = auVar353._16_4_ * fStack_770;
        auVar87._20_4_ = auVar353._20_4_ * fStack_76c;
        auVar87._24_4_ = auVar353._24_4_ * fStack_768;
        auVar87._28_4_ = fStack_764;
        _local_7a0 = vsubps_avx(auVar87,auVar292);
        auVar293._0_4_ = auVar424._0_4_ + fVar222 * fVar280;
        auVar293._4_4_ = auVar424._4_4_ + fVar226 * fVar195;
        auVar293._8_4_ = auVar424._8_4_ + fVar249 * fVar223;
        auVar293._12_4_ = auVar424._12_4_ + fVar276 * fVar224;
        auVar293._16_4_ = auVar424._16_4_ + fVar279 * fVar104;
        auVar293._20_4_ = auVar424._20_4_ + fVar311 * fVar225;
        auVar293._24_4_ = auVar424._24_4_ + fVar34 * fVar228;
        auVar293._28_4_ = auVar424._28_4_ + local_7a0._28_4_;
        auVar88._4_4_ = (float)local_8e0._4_4_ * auVar353._4_4_;
        auVar88._0_4_ = (float)local_8e0._0_4_ * auVar353._0_4_;
        auVar88._8_4_ = fStack_8d8 * auVar353._8_4_;
        auVar88._12_4_ = fStack_8d4 * auVar353._12_4_;
        auVar88._16_4_ = fStack_8d0 * auVar353._16_4_;
        auVar88._20_4_ = fStack_8cc * auVar353._20_4_;
        auVar88._24_4_ = fStack_8c8 * auVar353._24_4_;
        auVar88._28_4_ = fStack_764;
        _local_7c0 = vsubps_avx(auVar88,auVar293);
        auVar265._0_4_ = (float)local_5c0._0_4_ + fVar376 * fVar280;
        auVar265._4_4_ = (float)local_5c0._4_4_ + fVar386 * fVar195;
        auVar265._8_4_ = fStack_5b8 + fVar387 * fVar223;
        auVar265._12_4_ = fStack_5b4 + fVar388 * fVar224;
        auVar265._16_4_ = fStack_5b0 + fVar389 * fVar104;
        auVar265._20_4_ = fStack_5ac + fVar390 * fVar225;
        auVar265._24_4_ = fStack_5a8 + fVar391 * fVar228;
        auVar265._28_4_ = fStack_5a4 + fVar343 + 0.0;
        auVar89._4_4_ = (float)local_740._4_4_ * auVar353._4_4_;
        auVar89._0_4_ = (float)local_740._0_4_ * auVar353._0_4_;
        auVar89._8_4_ = fStack_738 * auVar353._8_4_;
        auVar89._12_4_ = fStack_734 * auVar353._12_4_;
        auVar89._16_4_ = fStack_730 * auVar353._16_4_;
        auVar89._20_4_ = fStack_72c * auVar353._20_4_;
        auVar89._24_4_ = fStack_728 * auVar353._24_4_;
        auVar89._28_4_ = local_7c0._28_4_;
        _local_5a0 = vsubps_avx(auVar89,auVar265);
        auVar29 = vcmpps_avx(auVar383,_DAT_01faff00,5);
        auVar266._8_4_ = 0x7f800000;
        auVar266._0_8_ = 0x7f8000007f800000;
        auVar266._12_4_ = 0x7f800000;
        auVar266._16_4_ = 0x7f800000;
        auVar266._20_4_ = 0x7f800000;
        auVar266._24_4_ = 0x7f800000;
        auVar266._28_4_ = 0x7f800000;
        auVar263 = vblendvps_avx(auVar266,auVar84,auVar29);
        auVar373._8_4_ = 0x7fffffff;
        auVar373._0_8_ = 0x7fffffff7fffffff;
        auVar373._12_4_ = 0x7fffffff;
        auVar373._16_4_ = 0x7fffffff;
        auVar373._20_4_ = 0x7fffffff;
        auVar373._24_4_ = 0x7fffffff;
        auVar373._28_4_ = 0x7fffffff;
        auVar383 = vandps_avx(auVar373,local_3a0);
        auVar383 = vmaxps_avx(local_480,auVar383);
        auVar90._4_4_ = auVar383._4_4_ * 1.9073486e-06;
        auVar90._0_4_ = auVar383._0_4_ * 1.9073486e-06;
        auVar90._8_4_ = auVar383._8_4_ * 1.9073486e-06;
        auVar90._12_4_ = auVar383._12_4_ * 1.9073486e-06;
        auVar90._16_4_ = auVar383._16_4_ * 1.9073486e-06;
        auVar90._20_4_ = auVar383._20_4_ * 1.9073486e-06;
        auVar90._24_4_ = auVar383._24_4_ * 1.9073486e-06;
        auVar90._28_4_ = auVar383._28_4_;
        auVar383 = vandps_avx(auVar373,auVar43);
        auVar383 = vcmpps_avx(auVar383,auVar90,1);
        auVar294._8_4_ = 0xff800000;
        auVar294._0_8_ = 0xff800000ff800000;
        auVar294._12_4_ = 0xff800000;
        auVar294._16_4_ = 0xff800000;
        auVar294._20_4_ = 0xff800000;
        auVar294._24_4_ = 0xff800000;
        auVar294._28_4_ = 0xff800000;
        auVar291 = vblendvps_avx(auVar294,auVar353._0_32_,auVar29);
        auVar30 = auVar29 & auVar383;
        if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0x7f,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0xbf,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar30[0x1f] < '\0') {
          auVar171 = vandps_avx(auVar383,auVar29);
          auVar254 = vpackssdw_avx(auVar171._0_16_,auVar171._16_16_);
          auVar415 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar30 = vcmpps_avx(local_860,auVar415,2);
          auVar428._8_4_ = 0xff800000;
          auVar428._0_8_ = 0xff800000ff800000;
          auVar428._12_4_ = 0xff800000;
          auVar428._16_4_ = 0xff800000;
          auVar428._20_4_ = 0xff800000;
          auVar428._24_4_ = 0xff800000;
          auVar428._28_4_ = 0xff800000;
          auVar432._8_4_ = 0x7f800000;
          auVar432._0_8_ = 0x7f8000007f800000;
          auVar432._12_4_ = 0x7f800000;
          auVar432._16_4_ = 0x7f800000;
          auVar432._20_4_ = 0x7f800000;
          auVar432._24_4_ = 0x7f800000;
          auVar432._28_4_ = 0x7f800000;
          auVar383 = vblendvps_avx(auVar432,auVar428,auVar30);
          auVar205 = vpmovsxwd_avx(auVar254);
          auVar254 = vpunpckhwd_avx(auVar254,auVar254);
          auVar374._16_16_ = auVar254;
          auVar374._0_16_ = auVar205;
          auVar263 = vblendvps_avx(auVar263,auVar383,auVar374);
          auVar383 = vblendvps_avx(auVar428,auVar432,auVar30);
          auVar291 = vblendvps_avx(auVar291,auVar383,auVar374);
          auVar383 = vcmpps_avx(auVar415,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
          auVar131._0_4_ = auVar383._0_4_ ^ auVar171._0_4_;
          auVar131._4_4_ = auVar383._4_4_ ^ auVar171._4_4_;
          auVar131._8_4_ = auVar383._8_4_ ^ auVar171._8_4_;
          auVar131._12_4_ = auVar383._12_4_ ^ auVar171._12_4_;
          auVar131._16_4_ = auVar383._16_4_ ^ auVar171._16_4_;
          auVar131._20_4_ = auVar383._20_4_ ^ auVar171._20_4_;
          auVar131._24_4_ = auVar383._24_4_ ^ auVar171._24_4_;
          auVar131._28_4_ = auVar383._28_4_ ^ auVar171._28_4_;
          auVar171 = vorps_avx(auVar30,auVar131);
          auVar171 = vandps_avx(auVar29,auVar171);
        }
        auVar213 = local_940._0_28_;
        local_a40 = auVar187;
      }
      _local_420 = _local_9e0;
      local_400 = vminps_avx(local_3c0,auVar263);
      local_3e0 = vmaxps_avx(_local_9e0,auVar291);
      auVar383 = vcmpps_avx(_local_9e0,local_400,2);
      _local_500 = vandps_avx(auVar117,auVar383);
      auVar383 = vcmpps_avx(local_3e0,local_3c0,2);
      local_540 = vandps_avx(auVar117,auVar383);
      auVar117 = vorps_avx(local_540,_local_500);
      auVar433 = ZEXT3264(local_9c0);
      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0x7f,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0xbf,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar117[0x1f]) goto LAB_0110fa35;
      _local_5c0 = local_3e0;
      auVar383 = _local_5c0;
      _local_600 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_560._0_4_ = auVar171._0_4_ ^ local_600._0_4_;
      local_560._4_4_ = auVar171._4_4_ ^ local_600._4_4_;
      local_560._8_4_ = auVar171._8_4_ ^ local_600._8_4_;
      local_560._12_4_ = auVar171._12_4_ ^ local_600._12_4_;
      local_560._16_4_ = auVar171._16_4_ ^ local_600._16_4_;
      local_560._20_4_ = auVar171._20_4_ ^ local_600._20_4_;
      local_560._24_4_ = auVar171._24_4_ ^ local_600._24_4_;
      local_560._28_4_ = (uint)auVar171._28_4_ ^ (uint)local_600._28_4_;
      auVar126._0_4_ =
           auVar187._0_4_ * (float)local_780._0_4_ +
           auVar213._0_4_ * (float)local_8e0._0_4_ + (float)local_740._0_4_ * auVar239._0_4_;
      auVar126._4_4_ =
           auVar187._4_4_ * (float)local_780._4_4_ +
           auVar213._4_4_ * (float)local_8e0._4_4_ + (float)local_740._4_4_ * auVar239._4_4_;
      auVar126._8_4_ =
           auVar187._8_4_ * fStack_778 + auVar213._8_4_ * fStack_8d8 + fStack_738 * auVar239._8_4_;
      auVar126._12_4_ =
           auVar187._12_4_ * fStack_774 +
           auVar213._12_4_ * fStack_8d4 + fStack_734 * auVar239._12_4_;
      auVar126._16_4_ =
           auVar187._16_4_ * fStack_770 +
           auVar213._16_4_ * fStack_8d0 + fStack_730 * auVar239._16_4_;
      auVar126._20_4_ =
           auVar187._20_4_ * fStack_76c +
           auVar213._20_4_ * fStack_8cc + fStack_72c * auVar239._20_4_;
      auVar126._24_4_ =
           auVar187._24_4_ * fStack_768 +
           auVar213._24_4_ * fStack_8c8 + fStack_728 * auVar239._24_4_;
      auVar126._28_4_ = auVar171._28_4_ + local_600._28_4_ + auVar187._28_4_;
      auVar166._8_4_ = 0x7fffffff;
      auVar166._0_8_ = 0x7fffffff7fffffff;
      auVar166._12_4_ = 0x7fffffff;
      auVar166._16_4_ = 0x7fffffff;
      auVar166._20_4_ = 0x7fffffff;
      auVar166._24_4_ = 0x7fffffff;
      auVar166._28_4_ = 0x7fffffff;
      auVar117 = vandps_avx(auVar126,auVar166);
      auVar167._8_4_ = 0x3e99999a;
      auVar167._0_8_ = 0x3e99999a3e99999a;
      auVar167._12_4_ = 0x3e99999a;
      auVar167._16_4_ = 0x3e99999a;
      auVar167._20_4_ = 0x3e99999a;
      auVar167._24_4_ = 0x3e99999a;
      auVar167._28_4_ = 0x3e99999a;
      auVar117 = vcmpps_avx(auVar117,auVar167,1);
      auVar117 = vorps_avx(auVar117,local_560);
      auVar168._8_4_ = 3;
      auVar168._0_8_ = 0x300000003;
      auVar168._12_4_ = 3;
      auVar168._16_4_ = 3;
      auVar168._20_4_ = 3;
      auVar168._24_4_ = 3;
      auVar168._28_4_ = 3;
      auVar189._8_4_ = 2;
      auVar189._0_8_ = 0x200000002;
      auVar189._12_4_ = 2;
      auVar189._16_4_ = 2;
      auVar189._20_4_ = 2;
      auVar189._24_4_ = 2;
      auVar189._28_4_ = 2;
      auVar117 = vblendvps_avx(auVar189,auVar168,auVar117);
      local_580 = ZEXT432(uVar101);
      local_7e0 = vpshufd_avx(ZEXT416(uVar101),0);
      auVar254 = vpcmpgtd_avx(auVar117._16_16_,local_7e0);
      auStack_7d0 = auVar43._16_16_;
      auVar205 = vpcmpgtd_avx(auVar117._0_16_,local_7e0);
      auVar169._16_16_ = auVar254;
      auVar169._0_16_ = auVar205;
      local_520 = vblendps_avx(ZEXT1632(auVar205),auVar169,0xf0);
      local_4e0 = vandnps_avx(local_520,_local_500);
      auVar172 = ZEXT3264(local_4e0);
      auVar117 = _local_500 & ~local_520;
      auVar295 = ZEXT3264(local_a00);
      auVar353 = ZEXT3264(local_a20);
      local_aa0 = auVar11._0_4_;
      fStack_a9c = auVar11._4_4_;
      fStack_a98 = auVar11._8_4_;
      fStack_a94 = auVar11._12_4_;
      local_a80 = auVar10._0_4_;
      fStack_a7c = auVar10._4_4_;
      fStack_a78 = auVar10._8_4_;
      fStack_a74 = auVar10._12_4_;
      local_a90 = auVar42._0_4_;
      fStack_a8c = auVar42._4_4_;
      fStack_a88 = auVar42._8_4_;
      fStack_a84 = auVar42._12_4_;
      local_ab0 = auVar12._0_4_;
      fStack_aac = auVar12._4_4_;
      fStack_aa8 = auVar12._8_4_;
      fStack_aa4 = auVar12._12_4_;
      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0x7f,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0xbf,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar117[0x1f]) {
        auVar254 = vshufps_avx(auVar147,auVar147,0);
        auVar127._16_16_ = auVar254;
        auVar127._0_16_ = auVar254;
        local_5c0._0_4_ = local_3e0._0_4_;
        local_5c0._4_4_ = local_3e0._4_4_;
        fStack_5b8 = local_3e0._8_4_;
        fStack_5b4 = local_3e0._12_4_;
        fStack_5b0 = local_3e0._16_4_;
        fStack_5ac = local_3e0._20_4_;
        fStack_5a8 = local_3e0._24_4_;
        fStack_5a4 = local_3e0._28_4_;
        auVar239 = local_780._0_28_;
        fVar280 = (float)local_5c0._0_4_;
        fVar222 = (float)local_5c0._4_4_;
        fVar105 = fStack_5b8;
        fVar195 = fStack_5b4;
        fVar223 = fStack_5b0;
        fVar224 = fStack_5ac;
        fVar104 = fStack_5a8;
        fVar225 = fStack_5a4;
        _local_5c0 = auVar383;
      }
      else {
        local_760._4_4_ = (float)local_9e0._4_4_ + local_8a0._4_4_;
        local_760._0_4_ = (float)local_9e0._0_4_ + (float)local_8a0;
        fStack_758 = fStack_9d8 + (float)uStack_898;
        fStack_754 = fStack_9d4 + uStack_898._4_4_;
        fStack_750 = fStack_9d0 + (float)uStack_890;
        fStack_74c = fStack_9cc + uStack_890._4_4_;
        fStack_748 = fStack_9c8 + (float)uStack_888;
        fStack_744 = fStack_9c4 + uStack_888._4_4_;
        do {
          auVar128._8_4_ = 0x7f800000;
          auVar128._0_8_ = 0x7f8000007f800000;
          auVar128._12_4_ = 0x7f800000;
          auVar128._16_4_ = 0x7f800000;
          auVar128._20_4_ = 0x7f800000;
          auVar128._24_4_ = 0x7f800000;
          auVar128._28_4_ = 0x7f800000;
          auVar117 = auVar172._0_32_;
          auVar171 = vblendvps_avx(auVar128,_local_9e0,auVar117);
          auVar383 = vshufps_avx(auVar171,auVar171,0xb1);
          auVar383 = vminps_avx(auVar171,auVar383);
          auVar29 = vshufpd_avx(auVar383,auVar383,5);
          auVar383 = vminps_avx(auVar383,auVar29);
          auVar29 = vperm2f128_avx(auVar383,auVar383,1);
          auVar383 = vminps_avx(auVar383,auVar29);
          auVar171 = vcmpps_avx(auVar171,auVar383,0);
          auVar383 = auVar117 & auVar171;
          if ((((((((auVar383 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar383 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar383 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar383 >> 0x7f,0) != '\0') ||
                (auVar383 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar383 >> 0xbf,0) != '\0') ||
              (auVar383 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar383[0x1f] < '\0') {
            auVar117 = vandps_avx(auVar171,auVar117);
          }
          uVar93 = vmovmskps_avx(auVar117);
          uVar96 = 0;
          if (uVar93 != 0) {
            for (; (uVar93 >> uVar96 & 1) == 0; uVar96 = uVar96 + 1) {
            }
          }
          uVar94 = (ulong)uVar96;
          *(undefined4 *)(local_4e0 + uVar94 * 4) = 0;
          fVar280 = local_1a0[uVar94];
          uVar96 = *(uint *)(local_420 + uVar94 * 4);
          fVar222 = auVar146._0_4_;
          if ((float)local_920._0_4_ < 0.0) {
            fVar222 = sqrtf((float)local_920._0_4_);
          }
          auVar147 = vminps_avx(auVar10,auVar11);
          auVar254 = vmaxps_avx(auVar10,auVar11);
          auVar205 = vminps_avx(auVar42,auVar12);
          auVar113 = vminps_avx(auVar147,auVar205);
          auVar147 = vmaxps_avx(auVar42,auVar12);
          auVar205 = vmaxps_avx(auVar254,auVar147);
          auVar199._8_4_ = 0x7fffffff;
          auVar199._0_8_ = 0x7fffffff7fffffff;
          auVar199._12_4_ = 0x7fffffff;
          auVar254 = vandps_avx(auVar113,auVar199);
          auVar147 = vandps_avx(auVar205,auVar199);
          auVar254 = vmaxps_avx(auVar254,auVar147);
          auVar147 = vmovshdup_avx(auVar254);
          auVar147 = vmaxss_avx(auVar147,auVar254);
          auVar254 = vshufpd_avx(auVar254,auVar254,1);
          auVar254 = vmaxss_avx(auVar254,auVar147);
          local_a40._0_4_ = auVar254._0_4_ * 1.9073486e-06;
          local_8c0._0_4_ = fVar222 * 1.9073486e-06;
          local_720._0_16_ = vshufps_avx(auVar205,auVar205,0xff);
          auVar254 = vinsertps_avx(ZEXT416(uVar96),ZEXT416((uint)fVar280),0x10);
          lVar98 = 5;
          do {
            auVar147 = vmovshdup_avx(auVar254);
            fVar247 = auVar147._0_4_;
            fVar223 = 1.0 - fVar247;
            auVar147 = vshufps_avx(auVar254,auVar254,0x55);
            fVar280 = auVar147._0_4_;
            fVar222 = auVar147._4_4_;
            fVar105 = auVar147._8_4_;
            fVar195 = auVar147._12_4_;
            auVar147 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
            fVar224 = auVar147._0_4_;
            fVar104 = auVar147._4_4_;
            fVar225 = auVar147._8_4_;
            fVar226 = auVar147._12_4_;
            fVar227 = local_a90 * fVar280 + local_aa0 * fVar224;
            fVar228 = fStack_a8c * fVar222 + fStack_a9c * fVar104;
            fVar245 = fStack_a88 * fVar105 + fStack_a98 * fVar225;
            fVar246 = fStack_a84 * fVar195 + fStack_a94 * fVar226;
            auVar255._0_4_ =
                 fVar224 * (local_aa0 * fVar280 + fVar224 * local_a80) + fVar280 * fVar227;
            auVar255._4_4_ =
                 fVar104 * (fStack_a9c * fVar222 + fVar104 * fStack_a7c) + fVar222 * fVar228;
            auVar255._8_4_ =
                 fVar225 * (fStack_a98 * fVar105 + fVar225 * fStack_a78) + fVar105 * fVar245;
            auVar255._12_4_ =
                 fVar226 * (fStack_a94 * fVar195 + fVar226 * fStack_a74) + fVar195 * fVar246;
            auVar200._0_4_ =
                 fVar224 * fVar227 + fVar280 * (fVar280 * local_ab0 + local_a90 * fVar224);
            auVar200._4_4_ =
                 fVar104 * fVar228 + fVar222 * (fVar222 * fStack_aac + fStack_a8c * fVar104);
            auVar200._8_4_ =
                 fVar225 * fVar245 + fVar105 * (fVar105 * fStack_aa8 + fStack_a88 * fVar225);
            auVar200._12_4_ =
                 fVar226 * fVar246 + fVar195 * (fVar195 * fStack_aa4 + fStack_a84 * fVar226);
            auVar147 = vshufps_avx(auVar254,auVar254,0);
            auVar148._0_4_ = auVar147._0_4_ * (float)local_910._0_4_ + 0.0;
            auVar148._4_4_ = auVar147._4_4_ * (float)local_910._4_4_ + 0.0;
            auVar148._8_4_ = auVar147._8_4_ * fStack_908 + 0.0;
            auVar148._12_4_ = auVar147._12_4_ * fStack_904 + 0.0;
            auVar109._0_4_ = fVar224 * auVar255._0_4_ + fVar280 * auVar200._0_4_;
            auVar109._4_4_ = fVar104 * auVar255._4_4_ + fVar222 * auVar200._4_4_;
            auVar109._8_4_ = fVar225 * auVar255._8_4_ + fVar105 * auVar200._8_4_;
            auVar109._12_4_ = fVar226 * auVar255._12_4_ + fVar195 * auVar200._12_4_;
            local_860._0_16_ = auVar109;
            auVar147 = vsubps_avx(auVar148,auVar109);
            _local_940 = auVar147;
            auVar147 = vdpps_avx(auVar147,auVar147,0x7f);
            fVar280 = auVar147._0_4_;
            if (fVar280 < 0.0) {
              fVar222 = sqrtf(fVar280);
            }
            else {
              auVar205 = vsqrtss_avx(auVar147,auVar147);
              fVar222 = auVar205._0_4_;
            }
            auVar205 = vsubps_avx(auVar200,auVar255);
            auVar285._0_4_ = auVar205._0_4_ * 3.0;
            auVar285._4_4_ = auVar205._4_4_ * 3.0;
            auVar285._8_4_ = auVar205._8_4_ * 3.0;
            auVar285._12_4_ = auVar205._12_4_ * 3.0;
            auVar205 = vshufps_avx(ZEXT416((uint)(fVar247 * 6.0)),ZEXT416((uint)(fVar247 * 6.0)),0);
            auVar113 = ZEXT416((uint)((fVar223 - (fVar247 + fVar247)) * 6.0));
            auVar180 = vshufps_avx(auVar113,auVar113,0);
            auVar113 = ZEXT416((uint)((fVar247 - (fVar223 + fVar223)) * 6.0));
            auVar208 = vshufps_avx(auVar113,auVar113,0);
            auVar13 = vshufps_avx(ZEXT416((uint)(fVar223 * 6.0)),ZEXT416((uint)(fVar223 * 6.0)),0);
            auVar113 = vdpps_avx(auVar285,auVar285,0x7f);
            auVar149._0_4_ =
                 auVar13._0_4_ * local_a80 +
                 auVar208._0_4_ * local_aa0 +
                 auVar205._0_4_ * local_ab0 + auVar180._0_4_ * local_a90;
            auVar149._4_4_ =
                 auVar13._4_4_ * fStack_a7c +
                 auVar208._4_4_ * fStack_a9c +
                 auVar205._4_4_ * fStack_aac + auVar180._4_4_ * fStack_a8c;
            auVar149._8_4_ =
                 auVar13._8_4_ * fStack_a78 +
                 auVar208._8_4_ * fStack_a98 +
                 auVar205._8_4_ * fStack_aa8 + auVar180._8_4_ * fStack_a88;
            auVar149._12_4_ =
                 auVar13._12_4_ * fStack_a74 +
                 auVar208._12_4_ * fStack_a94 +
                 auVar205._12_4_ * fStack_aa4 + auVar180._12_4_ * fStack_a84;
            auVar205 = vblendps_avx(auVar113,_DAT_01f7aa10,0xe);
            auVar180 = vrsqrtss_avx(auVar205,auVar205);
            fVar195 = auVar180._0_4_;
            fVar105 = auVar113._0_4_;
            auVar180 = vdpps_avx(auVar285,auVar149,0x7f);
            auVar208 = vshufps_avx(auVar113,auVar113,0);
            auVar150._0_4_ = auVar149._0_4_ * auVar208._0_4_;
            auVar150._4_4_ = auVar149._4_4_ * auVar208._4_4_;
            auVar150._8_4_ = auVar149._8_4_ * auVar208._8_4_;
            auVar150._12_4_ = auVar149._12_4_ * auVar208._12_4_;
            auVar180 = vshufps_avx(auVar180,auVar180,0);
            auVar231._0_4_ = auVar285._0_4_ * auVar180._0_4_;
            auVar231._4_4_ = auVar285._4_4_ * auVar180._4_4_;
            auVar231._8_4_ = auVar285._8_4_ * auVar180._8_4_;
            auVar231._12_4_ = auVar285._12_4_ * auVar180._12_4_;
            auVar13 = vsubps_avx(auVar150,auVar231);
            auVar180 = vrcpss_avx(auVar205,auVar205);
            auVar205 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                  ZEXT416((uint)(auVar254._0_4_ * (float)local_8c0._0_4_)));
            auVar180 = ZEXT416((uint)(auVar180._0_4_ * (2.0 - fVar105 * auVar180._0_4_)));
            auVar180 = vshufps_avx(auVar180,auVar180,0);
            uVar94 = CONCAT44(auVar285._4_4_,auVar285._0_4_);
            auVar344._0_8_ = uVar94 ^ 0x8000000080000000;
            auVar344._8_4_ = -auVar285._8_4_;
            auVar344._12_4_ = -auVar285._12_4_;
            auVar208 = ZEXT416((uint)(fVar195 * 1.5 + fVar105 * -0.5 * fVar195 * fVar195 * fVar195))
            ;
            auVar208 = vshufps_avx(auVar208,auVar208,0);
            auVar201._0_4_ = auVar208._0_4_ * auVar13._0_4_ * auVar180._0_4_;
            auVar201._4_4_ = auVar208._4_4_ * auVar13._4_4_ * auVar180._4_4_;
            auVar201._8_4_ = auVar208._8_4_ * auVar13._8_4_ * auVar180._8_4_;
            auVar201._12_4_ = auVar208._12_4_ * auVar13._12_4_ * auVar180._12_4_;
            local_880._0_4_ = auVar285._0_4_ * auVar208._0_4_;
            local_880._4_4_ = auVar285._4_4_ * auVar208._4_4_;
            local_880._8_4_ = auVar285._8_4_ * auVar208._8_4_;
            local_880._12_4_ = auVar285._12_4_ * auVar208._12_4_;
            if (fVar105 < 0.0) {
              fVar105 = sqrtf(fVar105);
            }
            else {
              auVar113 = vsqrtss_avx(auVar113,auVar113);
              fVar105 = auVar113._0_4_;
            }
            auVar113 = vdpps_avx(_local_940,local_880._0_16_,0x7f);
            fVar222 = ((float)local_a40._0_4_ / fVar105) * (fVar222 + 1.0) +
                      fVar222 * (float)local_a40._0_4_ + auVar205._0_4_;
            auVar180 = vdpps_avx(auVar344,local_880._0_16_,0x7f);
            auVar208 = vdpps_avx(_local_940,auVar201,0x7f);
            auVar13 = vdpps_avx(_local_910,local_880._0_16_,0x7f);
            auVar14 = vdpps_avx(_local_940,auVar344,0x7f);
            fVar105 = auVar180._0_4_ + auVar208._0_4_;
            fVar195 = auVar113._0_4_;
            auVar110._0_4_ = fVar195 * fVar195;
            auVar110._4_4_ = auVar113._4_4_ * auVar113._4_4_;
            auVar110._8_4_ = auVar113._8_4_ * auVar113._8_4_;
            auVar110._12_4_ = auVar113._12_4_ * auVar113._12_4_;
            auVar208 = vsubps_avx(auVar147,auVar110);
            local_880._0_16_ = ZEXT416((uint)fVar105);
            auVar180 = vdpps_avx(_local_940,_local_910,0x7f);
            fVar223 = auVar14._0_4_ - fVar195 * fVar105;
            fVar195 = auVar180._0_4_ - fVar195 * auVar13._0_4_;
            auVar180 = vrsqrtss_avx(auVar208,auVar208);
            fVar224 = auVar208._0_4_;
            fVar105 = auVar180._0_4_;
            fVar105 = fVar105 * 1.5 + fVar224 * -0.5 * fVar105 * fVar105 * fVar105;
            if (fVar224 < 0.0) {
              local_900._0_4_ = fVar223;
              local_6e0._0_4_ = fVar195;
              local_700._0_4_ = fVar105;
              fVar224 = sqrtf(fVar224);
              fVar105 = (float)local_700._0_4_;
              fVar223 = (float)local_900._0_4_;
              fVar195 = (float)local_6e0._0_4_;
            }
            else {
              auVar180 = vsqrtss_avx(auVar208,auVar208);
              fVar224 = auVar180._0_4_;
            }
            auVar433 = ZEXT3264(local_9c0);
            auVar353 = ZEXT3264(local_a20);
            auVar14 = vpermilps_avx(local_860._0_16_,0xff);
            auVar15 = vshufps_avx(auVar285,auVar285,0xff);
            fVar223 = fVar223 * fVar105 - auVar15._0_4_;
            auVar232._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
            auVar232._8_4_ = auVar13._8_4_ ^ 0x80000000;
            auVar232._12_4_ = auVar13._12_4_ ^ 0x80000000;
            auVar256._0_4_ = -fVar223;
            auVar256._4_4_ = 0x80000000;
            auVar256._8_4_ = 0x80000000;
            auVar256._12_4_ = 0x80000000;
            auVar180 = vinsertps_avx(auVar256,ZEXT416((uint)(fVar195 * fVar105)),0x1c);
            auVar13 = vmovsldup_avx(ZEXT416((uint)(local_880._0_4_ * fVar195 * fVar105 -
                                                  auVar13._0_4_ * fVar223)));
            auVar180 = vdivps_avx(auVar180,auVar13);
            auVar208 = vinsertps_avx(local_880._0_16_,auVar232,0x10);
            auVar208 = vdivps_avx(auVar208,auVar13);
            auVar13 = vmovsldup_avx(auVar113);
            auVar115 = ZEXT416((uint)(fVar224 - auVar14._0_4_));
            auVar14 = vmovsldup_avx(auVar115);
            auVar178._0_4_ = auVar13._0_4_ * auVar180._0_4_ + auVar14._0_4_ * auVar208._0_4_;
            auVar178._4_4_ = auVar13._4_4_ * auVar180._4_4_ + auVar14._4_4_ * auVar208._4_4_;
            auVar178._8_4_ = auVar13._8_4_ * auVar180._8_4_ + auVar14._8_4_ * auVar208._8_4_;
            auVar178._12_4_ = auVar13._12_4_ * auVar180._12_4_ + auVar14._12_4_ * auVar208._12_4_;
            auVar254 = vsubps_avx(auVar254,auVar178);
            auVar179._8_4_ = 0x7fffffff;
            auVar179._0_8_ = 0x7fffffff7fffffff;
            auVar179._12_4_ = 0x7fffffff;
            auVar113 = vandps_avx(auVar113,auVar179);
            if (auVar113._0_4_ < fVar222) {
              auVar202._8_4_ = 0x7fffffff;
              auVar202._0_8_ = 0x7fffffff7fffffff;
              auVar202._12_4_ = 0x7fffffff;
              auVar113 = vandps_avx(auVar115,auVar202);
              if (auVar113._0_4_ < (float)local_720._0_4_ * 1.9073486e-06 + fVar222 + auVar205._0_4_
                 ) {
                fVar222 = auVar254._0_4_ + (float)local_810._0_4_;
                auVar295 = ZEXT3264(local_a00);
                if ((fVar196 <= fVar222) &&
                   (fVar105 = *(float *)(ray + k * 4 + 0x80), fVar222 <= fVar105)) {
                  auVar205 = vmovshdup_avx(auVar254);
                  fVar195 = auVar205._0_4_;
                  if ((0.0 <= fVar195) && (fVar195 <= 1.0)) {
                    auVar147 = vrsqrtss_avx(auVar147,auVar147);
                    fVar223 = auVar147._0_4_;
                    pGVar24 = (context->scene->geometries).items[uVar92].ptr;
                    if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar147 = ZEXT416((uint)(fVar223 * 1.5 +
                                               fVar280 * -0.5 * fVar223 * fVar223 * fVar223));
                      auVar147 = vshufps_avx(auVar147,auVar147,0);
                      auVar203._0_4_ = auVar147._0_4_ * (float)local_940._0_4_;
                      auVar203._4_4_ = auVar147._4_4_ * (float)local_940._4_4_;
                      auVar203._8_4_ = auVar147._8_4_ * fStack_938;
                      auVar203._12_4_ = auVar147._12_4_ * fStack_934;
                      auVar151._0_4_ = auVar285._0_4_ + auVar15._0_4_ * auVar203._0_4_;
                      auVar151._4_4_ = auVar285._4_4_ + auVar15._4_4_ * auVar203._4_4_;
                      auVar151._8_4_ = auVar285._8_4_ + auVar15._8_4_ * auVar203._8_4_;
                      auVar151._12_4_ = auVar285._12_4_ + auVar15._12_4_ * auVar203._12_4_;
                      auVar147 = vshufps_avx(auVar203,auVar203,0xc9);
                      auVar205 = vshufps_avx(auVar285,auVar285,0xc9);
                      auVar204._0_4_ = auVar205._0_4_ * auVar203._0_4_;
                      auVar204._4_4_ = auVar205._4_4_ * auVar203._4_4_;
                      auVar204._8_4_ = auVar205._8_4_ * auVar203._8_4_;
                      auVar204._12_4_ = auVar205._12_4_ * auVar203._12_4_;
                      auVar233._0_4_ = auVar285._0_4_ * auVar147._0_4_;
                      auVar233._4_4_ = auVar285._4_4_ * auVar147._4_4_;
                      auVar233._8_4_ = auVar285._8_4_ * auVar147._8_4_;
                      auVar233._12_4_ = auVar285._12_4_ * auVar147._12_4_;
                      auVar113 = vsubps_avx(auVar233,auVar204);
                      auVar147 = vshufps_avx(auVar113,auVar113,0xc9);
                      auVar205 = vshufps_avx(auVar151,auVar151,0xc9);
                      auVar234._0_4_ = auVar205._0_4_ * auVar147._0_4_;
                      auVar234._4_4_ = auVar205._4_4_ * auVar147._4_4_;
                      auVar234._8_4_ = auVar205._8_4_ * auVar147._8_4_;
                      auVar234._12_4_ = auVar205._12_4_ * auVar147._12_4_;
                      auVar147 = vshufps_avx(auVar113,auVar113,0xd2);
                      auVar152._0_4_ = auVar151._0_4_ * auVar147._0_4_;
                      auVar152._4_4_ = auVar151._4_4_ * auVar147._4_4_;
                      auVar152._8_4_ = auVar151._8_4_ * auVar147._8_4_;
                      auVar152._12_4_ = auVar151._12_4_ * auVar147._12_4_;
                      auVar147 = vsubps_avx(auVar234,auVar152);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar222;
                        uVar8 = vextractps_avx(auVar147,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar147,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(int *)(ray + k * 4 + 0xe0) = auVar147._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar195;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_948;
                        *(uint *)(ray + k * 4 + 0x120) = uVar92;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_670 = vshufps_avx(auVar254,auVar254,0x55);
                        auVar254 = vshufps_avx(auVar147,auVar147,0x55);
                        auStack_690 = vshufps_avx(auVar147,auVar147,0xaa);
                        local_680 = vshufps_avx(auVar147,auVar147,0);
                        local_6a0 = (RTCHitN  [16])auVar254;
                        local_660 = ZEXT816(0) << 0x20;
                        local_650 = local_6c0._0_8_;
                        uStack_648 = local_6c0._8_8_;
                        local_640 = local_6b0._0_8_;
                        uStack_638 = local_6b0._8_8_;
                        uVar96 = context->user->instID[0];
                        _local_630 = CONCAT44(uVar96,uVar96);
                        _uStack_628 = CONCAT44(uVar96,uVar96);
                        uVar96 = context->user->instPrimID[0];
                        auVar153._4_4_ = uVar96;
                        auVar153._0_4_ = uVar96;
                        auVar153._8_4_ = uVar96;
                        auVar153._12_4_ = uVar96;
                        auStack_620 = auVar153;
                        *(float *)(ray + k * 4 + 0x80) = fVar222;
                        local_840._0_16_ = *local_950;
                        local_a70.valid = (int *)local_840;
                        local_a70.geometryUserPtr = pGVar24->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_6a0;
                        local_a70.N = 4;
                        auVar147 = *local_950;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar24->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar24->intersectionFilterN)(&local_a70);
                          auVar295._8_56_ = extraout_var;
                          auVar295._0_8_ = extraout_XMM1_Qa;
                          auVar153 = auVar295._0_16_;
                          auVar353 = ZEXT3264(local_a20);
                          auVar295 = ZEXT3264(local_a00);
                          auVar433 = ZEXT3264(local_9c0);
                          auVar147 = local_840._0_16_;
                        }
                        if (auVar147 == (undefined1  [16])0x0) {
                          auVar254 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar147 = vpcmpeqd_avx(auVar153,auVar153);
                          auVar254 = auVar254 ^ auVar147;
                        }
                        else {
                          p_Var28 = context->args->filter;
                          auVar205 = vpcmpeqd_avx(auVar254,auVar254);
                          if ((p_Var28 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var28)(&local_a70);
                            auVar353 = ZEXT3264(local_a20);
                            auVar295 = ZEXT3264(local_a00);
                            auVar433 = ZEXT3264(local_9c0);
                            auVar205 = vpcmpeqd_avx(auVar205,auVar205);
                            auVar147 = local_840._0_16_;
                          }
                          auVar113 = vpcmpeqd_avx(auVar147,_DAT_01f7aa10);
                          auVar254 = auVar113 ^ auVar205;
                          if (auVar147 != (undefined1  [16])0x0) {
                            auVar113 = auVar113 ^ auVar205;
                            auVar147 = vmaskmovps_avx(auVar113,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar113,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar113,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar113,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar113,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar113,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar113,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar113,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar113,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar147;
                          }
                        }
                        auVar111._8_8_ = 0x100000001;
                        auVar111._0_8_ = 0x100000001;
                        if ((auVar111 & auVar254) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar105;
                        }
                      }
                    }
                  }
                }
                break;
              }
            }
            lVar98 = lVar98 + -1;
            auVar295 = ZEXT3264(local_a00);
          } while (lVar98 != 0);
          auVar171 = local_4e0;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar127._4_4_ = uVar8;
          auVar127._0_4_ = uVar8;
          auVar127._8_4_ = uVar8;
          auVar127._12_4_ = uVar8;
          auVar127._16_4_ = uVar8;
          auVar127._20_4_ = uVar8;
          auVar127._24_4_ = uVar8;
          auVar127._28_4_ = uVar8;
          auVar117 = vcmpps_avx(_local_760,auVar127,2);
          local_4e0 = vandps_avx(auVar117,local_4e0);
          auVar172 = ZEXT3264(local_4e0);
          auVar171 = auVar171 & auVar117;
          auVar239 = local_780._0_28_;
        } while ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar171 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar171 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar171 >> 0x7f,0) != '\0') ||
                   (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar171 >> 0xbf,0) != '\0') ||
                 (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar171[0x1f] < '\0');
        auVar172 = ZEXT3264(local_3e0);
        fVar280 = (float)local_5c0._0_4_;
        fVar222 = (float)local_5c0._4_4_;
        fVar105 = fStack_5b8;
        fVar195 = fStack_5b4;
        fVar223 = fStack_5b0;
        fVar224 = fStack_5ac;
        fVar104 = fStack_5a8;
        fVar225 = fStack_5a4;
      }
      auVar398 = ZEXT3264(local_9a0);
      auVar385 = ZEXT3264(local_980);
      auVar170._0_4_ =
           auVar239._0_4_ * (float)local_7a0._0_4_ +
           (float)local_8e0._0_4_ * (float)local_7c0._0_4_ +
           (float)local_740._0_4_ * (float)local_5a0._0_4_;
      auVar170._4_4_ =
           auVar239._4_4_ * (float)local_7a0._4_4_ +
           (float)local_8e0._4_4_ * (float)local_7c0._4_4_ +
           (float)local_740._4_4_ * (float)local_5a0._4_4_;
      auVar170._8_4_ =
           auVar239._8_4_ * fStack_798 + fStack_8d8 * fStack_7b8 + fStack_738 * fStack_598;
      auVar170._12_4_ =
           auVar239._12_4_ * fStack_794 + fStack_8d4 * fStack_7b4 + fStack_734 * fStack_594;
      auVar170._16_4_ =
           auVar239._16_4_ * fStack_790 + fStack_8d0 * fStack_7b0 + fStack_730 * fStack_590;
      auVar170._20_4_ =
           auVar239._20_4_ * fStack_78c + fStack_8cc * fStack_7ac + fStack_72c * fStack_58c;
      auVar170._24_4_ =
           auVar239._24_4_ * fStack_788 + fStack_8c8 * fStack_7a8 + fStack_728 * fStack_588;
      auVar170._28_4_ = fStack_8c4 + fStack_8c4 + auVar172._28_4_;
      auVar190._8_4_ = 0x7fffffff;
      auVar190._0_8_ = 0x7fffffff7fffffff;
      auVar190._12_4_ = 0x7fffffff;
      auVar190._16_4_ = 0x7fffffff;
      auVar190._20_4_ = 0x7fffffff;
      auVar190._24_4_ = 0x7fffffff;
      auVar190._28_4_ = 0x7fffffff;
      auVar117 = vandps_avx(auVar170,auVar190);
      auVar191._8_4_ = 0x3e99999a;
      auVar191._0_8_ = 0x3e99999a3e99999a;
      auVar191._12_4_ = 0x3e99999a;
      auVar191._16_4_ = 0x3e99999a;
      auVar191._20_4_ = 0x3e99999a;
      auVar191._24_4_ = 0x3e99999a;
      auVar191._28_4_ = 0x3e99999a;
      auVar117 = vcmpps_avx(auVar117,auVar191,1);
      auVar171 = vorps_avx(auVar117,local_560);
      auVar192._0_4_ = fVar280 + (float)local_8a0;
      auVar192._4_4_ = fVar222 + local_8a0._4_4_;
      auVar192._8_4_ = fVar105 + (float)uStack_898;
      auVar192._12_4_ = fVar195 + uStack_898._4_4_;
      auVar192._16_4_ = fVar223 + (float)uStack_890;
      auVar192._20_4_ = fVar224 + uStack_890._4_4_;
      auVar192._24_4_ = fVar104 + (float)uStack_888;
      auVar192._28_4_ = fVar225 + uStack_888._4_4_;
      auVar117 = vcmpps_avx(auVar192,auVar127,2);
      _local_7c0 = vandps_avx(auVar117,local_540);
      auVar193._8_4_ = 3;
      auVar193._0_8_ = 0x300000003;
      auVar193._12_4_ = 3;
      auVar193._16_4_ = 3;
      auVar193._20_4_ = 3;
      auVar193._24_4_ = 3;
      auVar193._28_4_ = 3;
      auVar221._8_4_ = 2;
      auVar221._0_8_ = 0x200000002;
      auVar221._12_4_ = 2;
      auVar221._16_4_ = 2;
      auVar221._20_4_ = 2;
      auVar221._24_4_ = 2;
      auVar221._28_4_ = 2;
      auVar117 = vblendvps_avx(auVar221,auVar193,auVar171);
      auVar254 = vpcmpgtd_avx(auVar117._16_16_,local_7e0);
      auVar147 = vpshufd_avx(local_580._0_16_,0);
      auVar147 = vpcmpgtd_avx(auVar117._0_16_,auVar147);
      auVar194._16_16_ = auVar254;
      auVar194._0_16_ = auVar127._0_16_;
      _local_7a0 = vblendps_avx(ZEXT1632(auVar147),auVar194,0xf0);
      auVar117 = vandnps_avx(_local_7a0,_local_7c0);
      auVar171 = _local_7c0 & ~_local_7a0;
      local_840 = auVar117;
      if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar171 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar171 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar171 >> 0x7f,0) != '\0') ||
            (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar171 >> 0xbf,0) != '\0') ||
          (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar171[0x1f] < '\0') {
        local_760._4_4_ = local_8a0._4_4_ + local_3e0._4_4_;
        local_760._0_4_ = (float)local_8a0 + local_3e0._0_4_;
        fStack_758 = (float)uStack_898 + local_3e0._8_4_;
        fStack_754 = uStack_898._4_4_ + local_3e0._12_4_;
        fStack_750 = (float)uStack_890 + local_3e0._16_4_;
        fStack_74c = uStack_890._4_4_ + local_3e0._20_4_;
        fStack_748 = (float)uStack_888 + local_3e0._24_4_;
        fStack_744 = uStack_888._4_4_ + local_3e0._28_4_;
        _local_9e0 = local_3e0;
        do {
          auVar129._8_4_ = 0x7f800000;
          auVar129._0_8_ = 0x7f8000007f800000;
          auVar129._12_4_ = 0x7f800000;
          auVar129._16_4_ = 0x7f800000;
          auVar129._20_4_ = 0x7f800000;
          auVar129._24_4_ = 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar171 = vblendvps_avx(auVar129,_local_9e0,auVar117);
          auVar383 = vshufps_avx(auVar171,auVar171,0xb1);
          auVar383 = vminps_avx(auVar171,auVar383);
          auVar29 = vshufpd_avx(auVar383,auVar383,5);
          auVar383 = vminps_avx(auVar383,auVar29);
          auVar29 = vperm2f128_avx(auVar383,auVar383,1);
          auVar383 = vminps_avx(auVar383,auVar29);
          auVar383 = vcmpps_avx(auVar171,auVar383,0);
          auVar29 = auVar117 & auVar383;
          auVar171 = auVar117;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0x7f,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0xbf,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar29[0x1f] < '\0') {
            auVar171 = vandps_avx(auVar383,auVar117);
          }
          uVar93 = vmovmskps_avx(auVar171);
          uVar96 = 0;
          if (uVar93 != 0) {
            for (; (uVar93 >> uVar96 & 1) == 0; uVar96 = uVar96 + 1) {
            }
          }
          uVar94 = (ulong)uVar96;
          local_840 = auVar117;
          *(undefined4 *)(local_840 + uVar94 * 4) = 0;
          fVar280 = local_1c0[uVar94];
          uVar96 = *(uint *)(local_3c0 + uVar94 * 4);
          fVar222 = auVar41._0_4_;
          if ((float)local_920._0_4_ < 0.0) {
            fVar222 = sqrtf((float)local_920._0_4_);
          }
          auVar147 = vminps_avx(auVar10,auVar11);
          auVar254 = vmaxps_avx(auVar10,auVar11);
          auVar205 = vminps_avx(auVar42,auVar12);
          auVar113 = vminps_avx(auVar147,auVar205);
          auVar147 = vmaxps_avx(auVar42,auVar12);
          auVar205 = vmaxps_avx(auVar254,auVar147);
          auVar206._8_4_ = 0x7fffffff;
          auVar206._0_8_ = 0x7fffffff7fffffff;
          auVar206._12_4_ = 0x7fffffff;
          auVar254 = vandps_avx(auVar113,auVar206);
          auVar147 = vandps_avx(auVar205,auVar206);
          auVar254 = vmaxps_avx(auVar254,auVar147);
          auVar147 = vmovshdup_avx(auVar254);
          auVar147 = vmaxss_avx(auVar147,auVar254);
          auVar254 = vshufpd_avx(auVar254,auVar254,1);
          auVar254 = vmaxss_avx(auVar254,auVar147);
          local_a40._0_4_ = auVar254._0_4_ * 1.9073486e-06;
          local_880._0_4_ = fVar222 * 1.9073486e-06;
          local_720._0_16_ = vshufps_avx(auVar205,auVar205,0xff);
          auVar254 = vinsertps_avx(ZEXT416(uVar96),ZEXT416((uint)fVar280),0x10);
          lVar98 = 5;
          do {
            auVar147 = vmovshdup_avx(auVar254);
            fVar247 = auVar147._0_4_;
            fVar223 = 1.0 - fVar247;
            auVar147 = vshufps_avx(auVar254,auVar254,0x55);
            fVar280 = auVar147._0_4_;
            fVar222 = auVar147._4_4_;
            fVar105 = auVar147._8_4_;
            fVar195 = auVar147._12_4_;
            auVar147 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
            fVar224 = auVar147._0_4_;
            fVar104 = auVar147._4_4_;
            fVar225 = auVar147._8_4_;
            fVar226 = auVar147._12_4_;
            fVar227 = local_a90 * fVar280 + local_aa0 * fVar224;
            fVar228 = fStack_a8c * fVar222 + fStack_a9c * fVar104;
            fVar245 = fStack_a88 * fVar105 + fStack_a98 * fVar225;
            fVar246 = fStack_a84 * fVar195 + fStack_a94 * fVar226;
            auVar257._0_4_ =
                 fVar224 * (local_aa0 * fVar280 + fVar224 * local_a80) + fVar280 * fVar227;
            auVar257._4_4_ =
                 fVar104 * (fStack_a9c * fVar222 + fVar104 * fStack_a7c) + fVar222 * fVar228;
            auVar257._8_4_ =
                 fVar225 * (fStack_a98 * fVar105 + fVar225 * fStack_a78) + fVar105 * fVar245;
            auVar257._12_4_ =
                 fVar226 * (fStack_a94 * fVar195 + fVar226 * fStack_a74) + fVar195 * fVar246;
            auVar207._0_4_ =
                 fVar224 * fVar227 + fVar280 * (fVar280 * local_ab0 + local_a90 * fVar224);
            auVar207._4_4_ =
                 fVar104 * fVar228 + fVar222 * (fVar222 * fStack_aac + fStack_a8c * fVar104);
            auVar207._8_4_ =
                 fVar225 * fVar245 + fVar105 * (fVar105 * fStack_aa8 + fStack_a88 * fVar225);
            auVar207._12_4_ =
                 fVar226 * fVar246 + fVar195 * (fVar195 * fStack_aa4 + fStack_a84 * fVar226);
            auVar147 = vshufps_avx(auVar254,auVar254,0);
            auVar154._0_4_ = auVar147._0_4_ * (float)local_910._0_4_ + 0.0;
            auVar154._4_4_ = auVar147._4_4_ * (float)local_910._4_4_ + 0.0;
            auVar154._8_4_ = auVar147._8_4_ * fStack_908 + 0.0;
            auVar154._12_4_ = auVar147._12_4_ * fStack_904 + 0.0;
            auVar112._0_4_ = fVar224 * auVar257._0_4_ + fVar280 * auVar207._0_4_;
            auVar112._4_4_ = fVar104 * auVar257._4_4_ + fVar222 * auVar207._4_4_;
            auVar112._8_4_ = fVar225 * auVar257._8_4_ + fVar105 * auVar207._8_4_;
            auVar112._12_4_ = fVar226 * auVar257._12_4_ + fVar195 * auVar207._12_4_;
            local_860._0_16_ = auVar112;
            auVar147 = vsubps_avx(auVar154,auVar112);
            _local_940 = auVar147;
            auVar147 = vdpps_avx(auVar147,auVar147,0x7f);
            fVar280 = auVar147._0_4_;
            if (fVar280 < 0.0) {
              fVar222 = sqrtf(fVar280);
            }
            else {
              auVar205 = vsqrtss_avx(auVar147,auVar147);
              fVar222 = auVar205._0_4_;
            }
            auVar205 = vsubps_avx(auVar207,auVar257);
            auVar286._0_4_ = auVar205._0_4_ * 3.0;
            auVar286._4_4_ = auVar205._4_4_ * 3.0;
            auVar286._8_4_ = auVar205._8_4_ * 3.0;
            auVar286._12_4_ = auVar205._12_4_ * 3.0;
            auVar205 = vshufps_avx(ZEXT416((uint)(fVar247 * 6.0)),ZEXT416((uint)(fVar247 * 6.0)),0);
            auVar113 = ZEXT416((uint)((fVar223 - (fVar247 + fVar247)) * 6.0));
            auVar180 = vshufps_avx(auVar113,auVar113,0);
            auVar113 = ZEXT416((uint)((fVar247 - (fVar223 + fVar223)) * 6.0));
            auVar208 = vshufps_avx(auVar113,auVar113,0);
            auVar13 = vshufps_avx(ZEXT416((uint)(fVar223 * 6.0)),ZEXT416((uint)(fVar223 * 6.0)),0);
            auVar113 = vdpps_avx(auVar286,auVar286,0x7f);
            auVar155._0_4_ =
                 auVar13._0_4_ * local_a80 +
                 auVar208._0_4_ * local_aa0 +
                 auVar205._0_4_ * local_ab0 + auVar180._0_4_ * local_a90;
            auVar155._4_4_ =
                 auVar13._4_4_ * fStack_a7c +
                 auVar208._4_4_ * fStack_a9c +
                 auVar205._4_4_ * fStack_aac + auVar180._4_4_ * fStack_a8c;
            auVar155._8_4_ =
                 auVar13._8_4_ * fStack_a78 +
                 auVar208._8_4_ * fStack_a98 +
                 auVar205._8_4_ * fStack_aa8 + auVar180._8_4_ * fStack_a88;
            auVar155._12_4_ =
                 auVar13._12_4_ * fStack_a74 +
                 auVar208._12_4_ * fStack_a94 +
                 auVar205._12_4_ * fStack_aa4 + auVar180._12_4_ * fStack_a84;
            auVar205 = vblendps_avx(auVar113,_DAT_01f7aa10,0xe);
            auVar180 = vrsqrtss_avx(auVar205,auVar205);
            fVar195 = auVar180._0_4_;
            fVar105 = auVar113._0_4_;
            auVar180 = vdpps_avx(auVar286,auVar155,0x7f);
            auVar208 = vshufps_avx(auVar113,auVar113,0);
            auVar156._0_4_ = auVar155._0_4_ * auVar208._0_4_;
            auVar156._4_4_ = auVar155._4_4_ * auVar208._4_4_;
            auVar156._8_4_ = auVar155._8_4_ * auVar208._8_4_;
            auVar156._12_4_ = auVar155._12_4_ * auVar208._12_4_;
            auVar180 = vshufps_avx(auVar180,auVar180,0);
            auVar235._0_4_ = auVar286._0_4_ * auVar180._0_4_;
            auVar235._4_4_ = auVar286._4_4_ * auVar180._4_4_;
            auVar235._8_4_ = auVar286._8_4_ * auVar180._8_4_;
            auVar235._12_4_ = auVar286._12_4_ * auVar180._12_4_;
            auVar13 = vsubps_avx(auVar156,auVar235);
            auVar180 = vrcpss_avx(auVar205,auVar205);
            auVar205 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                  ZEXT416((uint)(auVar254._0_4_ * (float)local_880._0_4_)));
            auVar180 = ZEXT416((uint)(auVar180._0_4_ * (2.0 - fVar105 * auVar180._0_4_)));
            auVar180 = vshufps_avx(auVar180,auVar180,0);
            uVar94 = CONCAT44(auVar286._4_4_,auVar286._0_4_);
            auVar345._0_8_ = uVar94 ^ 0x8000000080000000;
            auVar345._8_4_ = -auVar286._8_4_;
            auVar345._12_4_ = -auVar286._12_4_;
            auVar208 = ZEXT416((uint)(fVar195 * 1.5 + fVar105 * -0.5 * fVar195 * fVar195 * fVar195))
            ;
            auVar208 = vshufps_avx(auVar208,auVar208,0);
            auVar209._0_4_ = auVar208._0_4_ * auVar13._0_4_ * auVar180._0_4_;
            auVar209._4_4_ = auVar208._4_4_ * auVar13._4_4_ * auVar180._4_4_;
            auVar209._8_4_ = auVar208._8_4_ * auVar13._8_4_ * auVar180._8_4_;
            auVar209._12_4_ = auVar208._12_4_ * auVar13._12_4_ * auVar180._12_4_;
            auVar355._0_4_ = auVar286._0_4_ * auVar208._0_4_;
            auVar355._4_4_ = auVar286._4_4_ * auVar208._4_4_;
            auVar355._8_4_ = auVar286._8_4_ * auVar208._8_4_;
            auVar355._12_4_ = auVar286._12_4_ * auVar208._12_4_;
            if (fVar105 < 0.0) {
              local_8c0._0_16_ = auVar355;
              fVar105 = sqrtf(fVar105);
              auVar355 = local_8c0._0_16_;
            }
            else {
              auVar113 = vsqrtss_avx(auVar113,auVar113);
              fVar105 = auVar113._0_4_;
            }
            auVar113 = vdpps_avx(_local_940,auVar355,0x7f);
            fVar222 = ((float)local_a40._0_4_ / fVar105) * (fVar222 + 1.0) +
                      fVar222 * (float)local_a40._0_4_ + auVar205._0_4_;
            auVar180 = vdpps_avx(auVar345,auVar355,0x7f);
            auVar208 = vdpps_avx(_local_940,auVar209,0x7f);
            auVar13 = vdpps_avx(_local_910,auVar355,0x7f);
            auVar14 = vdpps_avx(_local_940,auVar345,0x7f);
            fVar105 = auVar180._0_4_ + auVar208._0_4_;
            fVar195 = auVar113._0_4_;
            auVar114._0_4_ = fVar195 * fVar195;
            auVar114._4_4_ = auVar113._4_4_ * auVar113._4_4_;
            auVar114._8_4_ = auVar113._8_4_ * auVar113._8_4_;
            auVar114._12_4_ = auVar113._12_4_ * auVar113._12_4_;
            auVar208 = vsubps_avx(auVar147,auVar114);
            auVar180 = vdpps_avx(_local_940,_local_910,0x7f);
            fVar223 = auVar14._0_4_ - fVar105 * fVar195;
            fVar224 = auVar180._0_4_ - fVar195 * auVar13._0_4_;
            auVar180 = vrsqrtss_avx(auVar208,auVar208);
            fVar104 = auVar208._0_4_;
            fVar195 = auVar180._0_4_;
            fVar195 = fVar195 * 1.5 + fVar104 * -0.5 * fVar195 * fVar195 * fVar195;
            if (fVar104 < 0.0) {
              local_8c0._0_16_ = auVar13;
              local_900._0_4_ = fVar223;
              local_6e0._0_4_ = fVar224;
              local_700._0_4_ = fVar195;
              fVar104 = sqrtf(fVar104);
              fVar195 = (float)local_700._0_4_;
              fVar223 = (float)local_900._0_4_;
              fVar224 = (float)local_6e0._0_4_;
              auVar13 = local_8c0._0_16_;
            }
            else {
              auVar180 = vsqrtss_avx(auVar208,auVar208);
              fVar104 = auVar180._0_4_;
            }
            auVar385 = ZEXT3264(local_980);
            auVar398 = ZEXT3264(local_9a0);
            auVar433 = ZEXT3264(local_9c0);
            auVar353 = ZEXT3264(local_a20);
            auVar14 = vpermilps_avx(local_860._0_16_,0xff);
            auVar15 = vshufps_avx(auVar286,auVar286,0xff);
            fVar223 = fVar223 * fVar195 - auVar15._0_4_;
            auVar236._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
            auVar236._8_4_ = auVar13._8_4_ ^ 0x80000000;
            auVar236._12_4_ = auVar13._12_4_ ^ 0x80000000;
            auVar258._0_4_ = -fVar223;
            auVar258._4_4_ = 0x80000000;
            auVar258._8_4_ = 0x80000000;
            auVar258._12_4_ = 0x80000000;
            auVar180 = vinsertps_avx(auVar258,ZEXT416((uint)(fVar224 * fVar195)),0x1c);
            auVar13 = vmovsldup_avx(ZEXT416((uint)(fVar105 * fVar224 * fVar195 -
                                                  auVar13._0_4_ * fVar223)));
            auVar180 = vdivps_avx(auVar180,auVar13);
            auVar208 = vinsertps_avx(ZEXT416((uint)fVar105),auVar236,0x10);
            auVar208 = vdivps_avx(auVar208,auVar13);
            auVar13 = vmovsldup_avx(auVar113);
            auVar115 = ZEXT416((uint)(fVar104 - auVar14._0_4_));
            auVar14 = vmovsldup_avx(auVar115);
            auVar181._0_4_ = auVar13._0_4_ * auVar180._0_4_ + auVar14._0_4_ * auVar208._0_4_;
            auVar181._4_4_ = auVar13._4_4_ * auVar180._4_4_ + auVar14._4_4_ * auVar208._4_4_;
            auVar181._8_4_ = auVar13._8_4_ * auVar180._8_4_ + auVar14._8_4_ * auVar208._8_4_;
            auVar181._12_4_ = auVar13._12_4_ * auVar180._12_4_ + auVar14._12_4_ * auVar208._12_4_;
            auVar254 = vsubps_avx(auVar254,auVar181);
            auVar182._8_4_ = 0x7fffffff;
            auVar182._0_8_ = 0x7fffffff7fffffff;
            auVar182._12_4_ = 0x7fffffff;
            auVar113 = vandps_avx(auVar113,auVar182);
            if (auVar113._0_4_ < fVar222) {
              auVar210._8_4_ = 0x7fffffff;
              auVar210._0_8_ = 0x7fffffff7fffffff;
              auVar210._12_4_ = 0x7fffffff;
              auVar113 = vandps_avx(auVar115,auVar210);
              if (auVar113._0_4_ < (float)local_720._0_4_ * 1.9073486e-06 + fVar222 + auVar205._0_4_
                 ) {
                fVar222 = auVar254._0_4_ + (float)local_810._0_4_;
                auVar295 = ZEXT3264(local_a00);
                if ((fVar196 <= fVar222) &&
                   (fVar105 = *(float *)(ray + k * 4 + 0x80), fVar222 <= fVar105)) {
                  auVar205 = vmovshdup_avx(auVar254);
                  fVar195 = auVar205._0_4_;
                  if ((0.0 <= fVar195) && (fVar195 <= 1.0)) {
                    auVar147 = vrsqrtss_avx(auVar147,auVar147);
                    fVar223 = auVar147._0_4_;
                    pGVar24 = (context->scene->geometries).items[uVar92].ptr;
                    if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar147 = ZEXT416((uint)(fVar223 * 1.5 +
                                               fVar280 * -0.5 * fVar223 * fVar223 * fVar223));
                      auVar147 = vshufps_avx(auVar147,auVar147,0);
                      auVar211._0_4_ = auVar147._0_4_ * (float)local_940._0_4_;
                      auVar211._4_4_ = auVar147._4_4_ * (float)local_940._4_4_;
                      auVar211._8_4_ = auVar147._8_4_ * fStack_938;
                      auVar211._12_4_ = auVar147._12_4_ * fStack_934;
                      auVar157._0_4_ = auVar286._0_4_ + auVar15._0_4_ * auVar211._0_4_;
                      auVar157._4_4_ = auVar286._4_4_ + auVar15._4_4_ * auVar211._4_4_;
                      auVar157._8_4_ = auVar286._8_4_ + auVar15._8_4_ * auVar211._8_4_;
                      auVar157._12_4_ = auVar286._12_4_ + auVar15._12_4_ * auVar211._12_4_;
                      auVar147 = vshufps_avx(auVar211,auVar211,0xc9);
                      auVar205 = vshufps_avx(auVar286,auVar286,0xc9);
                      auVar212._0_4_ = auVar205._0_4_ * auVar211._0_4_;
                      auVar212._4_4_ = auVar205._4_4_ * auVar211._4_4_;
                      auVar212._8_4_ = auVar205._8_4_ * auVar211._8_4_;
                      auVar212._12_4_ = auVar205._12_4_ * auVar211._12_4_;
                      auVar237._0_4_ = auVar286._0_4_ * auVar147._0_4_;
                      auVar237._4_4_ = auVar286._4_4_ * auVar147._4_4_;
                      auVar237._8_4_ = auVar286._8_4_ * auVar147._8_4_;
                      auVar237._12_4_ = auVar286._12_4_ * auVar147._12_4_;
                      auVar113 = vsubps_avx(auVar237,auVar212);
                      auVar147 = vshufps_avx(auVar113,auVar113,0xc9);
                      auVar205 = vshufps_avx(auVar157,auVar157,0xc9);
                      auVar238._0_4_ = auVar205._0_4_ * auVar147._0_4_;
                      auVar238._4_4_ = auVar205._4_4_ * auVar147._4_4_;
                      auVar238._8_4_ = auVar205._8_4_ * auVar147._8_4_;
                      auVar238._12_4_ = auVar205._12_4_ * auVar147._12_4_;
                      auVar147 = vshufps_avx(auVar113,auVar113,0xd2);
                      auVar158._0_4_ = auVar157._0_4_ * auVar147._0_4_;
                      auVar158._4_4_ = auVar157._4_4_ * auVar147._4_4_;
                      auVar158._8_4_ = auVar157._8_4_ * auVar147._8_4_;
                      auVar158._12_4_ = auVar157._12_4_ * auVar147._12_4_;
                      auVar147 = vsubps_avx(auVar238,auVar158);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar222;
                        uVar8 = vextractps_avx(auVar147,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar147,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(int *)(ray + k * 4 + 0xe0) = auVar147._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar195;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_948;
                        *(uint *)(ray + k * 4 + 0x120) = uVar92;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_670 = vshufps_avx(auVar254,auVar254,0x55);
                        auVar254 = vshufps_avx(auVar147,auVar147,0x55);
                        auStack_690 = vshufps_avx(auVar147,auVar147,0xaa);
                        local_680 = vshufps_avx(auVar147,auVar147,0);
                        local_6a0 = (RTCHitN  [16])auVar254;
                        local_660 = ZEXT816(0) << 0x20;
                        local_650 = local_6c0._0_8_;
                        uStack_648 = local_6c0._8_8_;
                        local_640 = local_6b0._0_8_;
                        uStack_638 = local_6b0._8_8_;
                        uVar96 = context->user->instID[0];
                        _local_630 = CONCAT44(uVar96,uVar96);
                        _uStack_628 = CONCAT44(uVar96,uVar96);
                        uVar96 = context->user->instPrimID[0];
                        auVar159._4_4_ = uVar96;
                        auVar159._0_4_ = uVar96;
                        auVar159._8_4_ = uVar96;
                        auVar159._12_4_ = uVar96;
                        auStack_620 = auVar159;
                        *(float *)(ray + k * 4 + 0x80) = fVar222;
                        local_800 = *local_950;
                        local_a70.valid = (int *)local_800;
                        local_a70.geometryUserPtr = pGVar24->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_6a0;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar24->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar24->intersectionFilterN)(&local_a70);
                          auVar385._8_56_ = extraout_var_00;
                          auVar385._0_8_ = extraout_XMM1_Qa_00;
                          auVar159 = auVar385._0_16_;
                          auVar353 = ZEXT3264(local_a20);
                          auVar295 = ZEXT3264(local_a00);
                          auVar433 = ZEXT3264(local_9c0);
                          auVar398 = ZEXT3264(local_9a0);
                          auVar385 = ZEXT3264(local_980);
                        }
                        if (local_800 == (undefined1  [16])0x0) {
                          auVar254 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar147 = vpcmpeqd_avx(auVar159,auVar159);
                          auVar254 = auVar254 ^ auVar147;
                        }
                        else {
                          p_Var28 = context->args->filter;
                          auVar147 = vpcmpeqd_avx(auVar254,auVar254);
                          if ((p_Var28 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var28)(&local_a70);
                            auVar353 = ZEXT3264(local_a20);
                            auVar295 = ZEXT3264(local_a00);
                            auVar433 = ZEXT3264(local_9c0);
                            auVar398 = ZEXT3264(local_9a0);
                            auVar385 = ZEXT3264(local_980);
                            auVar147 = vpcmpeqd_avx(auVar147,auVar147);
                          }
                          auVar205 = vpcmpeqd_avx(local_800,_DAT_01f7aa10);
                          auVar254 = auVar205 ^ auVar147;
                          if (local_800 != (undefined1  [16])0x0) {
                            auVar205 = auVar205 ^ auVar147;
                            auVar147 = vmaskmovps_avx(auVar205,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar205,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar205,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar205,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar205,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar205,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar205,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar205,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar147;
                            auVar147 = vmaskmovps_avx(auVar205,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar147;
                          }
                        }
                        auVar116._8_8_ = 0x100000001;
                        auVar116._0_8_ = 0x100000001;
                        if ((auVar116 & auVar254) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar105;
                        }
                      }
                    }
                  }
                }
                break;
              }
            }
            lVar98 = lVar98 + -1;
            auVar295 = ZEXT3264(local_a00);
          } while (lVar98 != 0);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar127._4_4_ = uVar8;
          auVar127._0_4_ = uVar8;
          auVar127._8_4_ = uVar8;
          auVar127._12_4_ = uVar8;
          auVar127._16_4_ = uVar8;
          auVar127._20_4_ = uVar8;
          auVar127._24_4_ = uVar8;
          auVar127._28_4_ = uVar8;
          auVar171 = vcmpps_avx(_local_760,auVar127,2);
          auVar117 = vandps_avx(auVar171,local_840);
          auVar171 = local_840 & auVar171;
          local_840 = auVar117;
        } while ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar171 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar171 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar171 >> 0x7f,0) != '\0') ||
                   (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar171 >> 0xbf,0) != '\0') ||
                 (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar171[0x1f] < '\0');
      }
      auVar117 = vandps_avx(local_520,_local_500);
      auVar171 = vandps_avx(_local_7c0,_local_7a0);
      auVar243._0_4_ = (float)local_8a0 + local_420._0_4_;
      auVar243._4_4_ = local_8a0._4_4_ + local_420._4_4_;
      auVar243._8_4_ = (float)uStack_898 + local_420._8_4_;
      auVar243._12_4_ = uStack_898._4_4_ + local_420._12_4_;
      auVar243._16_4_ = (float)uStack_890 + local_420._16_4_;
      auVar243._20_4_ = uStack_890._4_4_ + local_420._20_4_;
      auVar243._24_4_ = (float)uStack_888 + local_420._24_4_;
      auVar243._28_4_ = uStack_888._4_4_ + local_420._28_4_;
      auVar383 = vcmpps_avx(auVar243,auVar127,2);
      auVar117 = vandps_avx(auVar383,auVar117);
      auVar244._0_4_ = (float)local_8a0 + local_3e0._0_4_;
      auVar244._4_4_ = local_8a0._4_4_ + local_3e0._4_4_;
      auVar244._8_4_ = (float)uStack_898 + local_3e0._8_4_;
      auVar244._12_4_ = uStack_898._4_4_ + local_3e0._12_4_;
      auVar244._16_4_ = (float)uStack_890 + local_3e0._16_4_;
      auVar244._20_4_ = uStack_890._4_4_ + local_3e0._20_4_;
      auVar244._24_4_ = (float)uStack_888 + local_3e0._24_4_;
      auVar244._28_4_ = uStack_888._4_4_ + local_3e0._28_4_;
      auVar383 = vcmpps_avx(auVar244,auVar127,2);
      auVar171 = vandps_avx(auVar383,auVar171);
      auVar171 = vorps_avx(auVar117,auVar171);
      if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar171 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar171 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar171 >> 0x7f,0) != '\0') ||
            (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar171 >> 0xbf,0) != '\0') ||
          (auVar171 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar171[0x1f] < '\0') {
        uVar94 = (ulong)uVar102;
        *(undefined1 (*) [32])(auStack_180 + uVar94 * 0x60) = auVar171;
        auVar117 = vblendvps_avx(local_3e0,_local_420,auVar117);
        *(undefined1 (*) [32])(auStack_160 + uVar94 * 0x60) = auVar117;
        uVar9 = vmovlps_avx(local_4b0);
        (&uStack_140)[uVar94 * 0xc] = uVar9;
        aiStack_138[uVar94 * 0x18] = uVar101 + 1;
        uVar102 = uVar102 + 1;
      }
    }
    auVar260 = local_460;
    if (uVar102 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar124._4_4_ = uVar8;
    auVar124._0_4_ = uVar8;
    auVar124._8_4_ = uVar8;
    auVar124._12_4_ = uVar8;
    auVar124._16_4_ = uVar8;
    auVar124._20_4_ = uVar8;
    auVar124._24_4_ = uVar8;
    auVar124._28_4_ = uVar8;
    uVar96 = -uVar102;
    pauVar95 = (undefined1 (*) [32])(auStack_180 + (ulong)(uVar102 - 1) * 0x60);
    while( true ) {
      auVar117 = pauVar95[1];
      auVar165._0_4_ = (float)local_8a0 + auVar117._0_4_;
      auVar165._4_4_ = local_8a0._4_4_ + auVar117._4_4_;
      auVar165._8_4_ = (float)uStack_898 + auVar117._8_4_;
      auVar165._12_4_ = uStack_898._4_4_ + auVar117._12_4_;
      auVar165._16_4_ = (float)uStack_890 + auVar117._16_4_;
      auVar165._20_4_ = uStack_890._4_4_ + auVar117._20_4_;
      auVar165._24_4_ = (float)uStack_888 + auVar117._24_4_;
      auVar165._28_4_ = uStack_888._4_4_ + auVar117._28_4_;
      auVar383 = vcmpps_avx(auVar165,auVar124,2);
      auVar171 = vandps_avx(auVar383,*pauVar95);
      _local_6a0 = auVar171;
      auVar383 = *pauVar95 & auVar383;
      if ((((((((auVar383 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar383 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar383 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar383 >> 0x7f,0) != '\0') ||
            (auVar383 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar383 >> 0xbf,0) != '\0') ||
          (auVar383 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar383[0x1f] < '\0') break;
      pauVar95 = pauVar95 + -3;
      uVar96 = uVar96 + 1;
      if (uVar96 == 0) goto LAB_011115a3;
    }
    auVar125._8_4_ = 0x7f800000;
    auVar125._0_8_ = 0x7f8000007f800000;
    auVar125._12_4_ = 0x7f800000;
    auVar125._16_4_ = 0x7f800000;
    auVar125._20_4_ = 0x7f800000;
    auVar125._24_4_ = 0x7f800000;
    auVar125._28_4_ = 0x7f800000;
    auVar117 = vblendvps_avx(auVar125,auVar117,auVar171);
    auVar383 = vshufps_avx(auVar117,auVar117,0xb1);
    auVar383 = vminps_avx(auVar117,auVar383);
    auVar29 = vshufpd_avx(auVar383,auVar383,5);
    auVar383 = vminps_avx(auVar383,auVar29);
    auVar29 = vperm2f128_avx(auVar383,auVar383,1);
    auVar383 = vminps_avx(auVar383,auVar29);
    auVar117 = vcmpps_avx(auVar117,auVar383,0);
    auVar383 = auVar171 & auVar117;
    if ((((((((auVar383 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar383 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar383 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar383 >> 0x7f,0) != '\0') ||
          (auVar383 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar383 >> 0xbf,0) != '\0') ||
        (auVar383 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar383[0x1f] < '\0') {
      auVar171 = vandps_avx(auVar117,auVar171);
    }
    auVar108._8_8_ = 0;
    auVar108._0_8_ = *(ulong *)pauVar95[2];
    uVar101 = *(uint *)(pauVar95[2] + 8);
    uVar102 = vmovmskps_avx(auVar171);
    uVar93 = 0;
    if (uVar102 != 0) {
      for (; (uVar102 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
      }
    }
    *(undefined4 *)(local_6a0 + (ulong)uVar93 * 4) = 0;
    *pauVar95 = _local_6a0;
    uVar102 = ~uVar96;
    if ((((((((_local_6a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_6a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_6a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_6a0 >> 0x7f,0) != '\0') ||
          (_local_6a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_6a0 >> 0xbf,0) != '\0') ||
        (_local_6a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_6a0[0x1f] < '\0') {
      uVar102 = -uVar96;
    }
    auVar254 = vshufps_avx(auVar108,auVar108,0);
    auVar147 = vshufps_avx(auVar108,auVar108,0x55);
    auVar147 = vsubps_avx(auVar147,auVar254);
    local_420._4_4_ = auVar254._4_4_ + auVar147._4_4_ * 0.14285715;
    local_420._0_4_ = auVar254._0_4_ + auVar147._0_4_ * 0.0;
    fStack_418 = auVar254._8_4_ + auVar147._8_4_ * 0.2857143;
    fStack_414 = auVar254._12_4_ + auVar147._12_4_ * 0.42857146;
    fStack_410 = auVar254._0_4_ + auVar147._0_4_ * 0.5714286;
    fStack_40c = auVar254._4_4_ + auVar147._4_4_ * 0.71428573;
    fStack_408 = auVar254._8_4_ + auVar147._8_4_ * 0.8571429;
    fStack_404 = auVar254._12_4_ + auVar147._12_4_;
    local_4b0._8_8_ = 0;
    local_4b0._0_8_ = *(ulong *)(local_420 + (ulong)uVar93 * 4);
  } while( true );
LAB_011115a3:
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar132._4_4_ = uVar8;
  auVar132._0_4_ = uVar8;
  auVar132._8_4_ = uVar8;
  auVar132._12_4_ = uVar8;
  auVar132._16_4_ = uVar8;
  auVar132._20_4_ = uVar8;
  auVar132._24_4_ = uVar8;
  auVar132._28_4_ = uVar8;
  auVar117 = vcmpps_avx(local_340,auVar132,2);
  uVar92 = vmovmskps_avx(auVar117);
  uVar92 = (uint)local_7e8 - 1 & (uint)local_7e8 & uVar92;
  if (uVar92 == 0) {
    return;
  }
  goto LAB_0110e895;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }